

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [28];
  undefined1 (*pauVar3) [28];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Primitive PVar17;
  uint uVar18;
  uint uVar19;
  undefined4 uVar20;
  Geometry *pGVar21;
  RTCFilterFunctionN p_Var22;
  uint uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  bool bVar116;
  bool bVar117;
  bool bVar118;
  bool bVar119;
  bool bVar120;
  bool bVar121;
  bool bVar122;
  bool bVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [28];
  undefined1 auVar135 [28];
  undefined1 auVar136 [28];
  undefined1 auVar137 [28];
  undefined1 auVar138 [28];
  undefined1 auVar139 [24];
  uint uVar140;
  uint uVar141;
  uint uVar142;
  long lVar143;
  ulong uVar144;
  long lVar145;
  ulong uVar146;
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar163;
  float fVar164;
  float fVar168;
  float fVar170;
  float fVar171;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar169 [16];
  undefined1 auVar152 [32];
  float fVar166;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar165;
  float fVar167;
  float fVar172;
  float fVar173;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  float fVar174;
  undefined8 extraout_XMM1_Qa;
  float fVar196;
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar197;
  float fVar198;
  undefined1 auVar181 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar199;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar195;
  float fVar200;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 extraout_var [56];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar213;
  undefined1 auVar212 [32];
  float fVar214;
  float fVar227;
  undefined1 auVar215 [16];
  float fVar225;
  float fVar226;
  float fVar230;
  float fVar233;
  float fVar235;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar228;
  float fVar229;
  float fVar231;
  float fVar232;
  float fVar234;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar236;
  undefined1 auVar224 [64];
  float fVar237;
  float fVar238;
  undefined1 auVar240 [16];
  float fVar246;
  float fVar248;
  float fVar250;
  undefined1 auVar239 [16];
  float fVar247;
  float fVar249;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar255;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar256;
  float fVar257;
  float fVar268;
  float fVar270;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar261 [32];
  float fVar272;
  undefined1 auVar262 [32];
  float fVar269;
  float fVar271;
  float fVar273;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar278 [16];
  float fVar277;
  float fVar288;
  float fVar289;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  float fVar290;
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float fVar291;
  undefined1 auVar286 [32];
  float fVar292;
  undefined1 auVar287 [32];
  float fVar293;
  float fVar308;
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar302 [64];
  undefined1 auVar309 [16];
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [64];
  float fVar321;
  float fVar322;
  float fVar328;
  float fVar330;
  float fVar332;
  undefined1 auVar323 [32];
  float fVar329;
  float fVar331;
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  float fVar333;
  float fVar334;
  float fVar339;
  float fVar341;
  float fVar343;
  undefined1 auVar335 [32];
  float fVar340;
  float fVar342;
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [64];
  float in_register_0000151c;
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  float fVar353;
  undefined1 auVar354 [16];
  float fVar358;
  float fVar359;
  undefined1 auVar355 [32];
  float fVar360;
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  float fVar361;
  float fVar365;
  float fVar366;
  float fVar367;
  float in_register_0000159c;
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  float fVar368;
  float fVar372;
  float fVar373;
  float fVar374;
  float in_register_000015dc;
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  undefined8 local_880;
  undefined8 uStack_878;
  uint local_860;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  RTCFilterFunctionNArguments local_7f0;
  undefined1 local_7c0 [8];
  undefined8 uStack_7b8;
  undefined1 auStack_7b0 [8];
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 auStack_790 [16];
  undefined1 (*local_768) [16];
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined1 auStack_750 [16];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 auStack_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 auStack_6b0 [16];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  undefined8 uStack_638;
  undefined1 local_630 [8];
  undefined8 uStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 auStack_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  LinearSpace3fa *local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  RTCHitN local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [16];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  uint local_360;
  uint local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 local_300 [32];
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  PVar17 = prim[1];
  uVar146 = (ulong)(byte)PVar17;
  lVar143 = uVar146 * 5;
  auVar240 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar240 = vinsertps_avx(auVar240,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar204 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar204 = vinsertps_avx(auVar204,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar214 = *(float *)(prim + uVar146 * 0x19 + 0x12);
  auVar240 = vsubps_avx(auVar240,*(undefined1 (*) [16])(prim + uVar146 * 0x19 + 6));
  auVar175._0_4_ = fVar214 * auVar240._0_4_;
  auVar175._4_4_ = fVar214 * auVar240._4_4_;
  auVar175._8_4_ = fVar214 * auVar240._8_4_;
  auVar175._12_4_ = fVar214 * auVar240._12_4_;
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 4 + 6)));
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 4 + 10)));
  auVar258._0_4_ = fVar214 * auVar204._0_4_;
  auVar258._4_4_ = fVar214 * auVar204._4_4_;
  auVar258._8_4_ = fVar214 * auVar204._8_4_;
  auVar258._12_4_ = fVar214 * auVar204._12_4_;
  auVar150._16_16_ = auVar169;
  auVar150._0_16_ = auVar240;
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar143 + 6)));
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar143 + 10)));
  auVar209._16_16_ = auVar204;
  auVar209._0_16_ = auVar240;
  auVar312 = vcvtdq2ps_avx(auVar209);
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 6 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 6 + 10)));
  auVar216._16_16_ = auVar204;
  auVar216._0_16_ = auVar240;
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 0xb + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 0xb + 10)));
  auVar25 = vcvtdq2ps_avx(auVar216);
  auVar217._16_16_ = auVar204;
  auVar217._0_16_ = auVar240;
  auVar26 = vcvtdq2ps_avx(auVar217);
  uVar144 = (ulong)((uint)(byte)PVar17 * 0xc);
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 10)));
  auVar279._16_16_ = auVar204;
  auVar279._0_16_ = auVar240;
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + uVar146 + 6)));
  auVar27 = vcvtdq2ps_avx(auVar279);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + uVar146 + 10)));
  auVar294._16_16_ = auVar204;
  auVar294._0_16_ = auVar240;
  lVar145 = uVar146 * 9;
  uVar144 = (ulong)(uint)((int)lVar145 * 2);
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar294);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 10)));
  auVar295._16_16_ = auVar204;
  auVar295._0_16_ = auVar240;
  auVar29 = vcvtdq2ps_avx(auVar295);
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + uVar146 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + uVar146 + 10)));
  auVar323._16_16_ = auVar204;
  auVar323._0_16_ = auVar240;
  uVar144 = (ulong)(uint)((int)lVar143 << 2);
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 10)));
  auVar30 = vcvtdq2ps_avx(auVar323);
  auVar335._16_16_ = auVar204;
  auVar335._0_16_ = auVar240;
  auVar31 = vcvtdq2ps_avx(auVar335);
  auVar240 = vshufps_avx(auVar258,auVar258,0);
  auVar204 = vshufps_avx(auVar258,auVar258,0x55);
  auVar169 = vshufps_avx(auVar258,auVar258,0xaa);
  fVar214 = auVar169._0_4_;
  fVar225 = auVar169._4_4_;
  fVar226 = auVar169._8_4_;
  fVar227 = auVar169._12_4_;
  fVar230 = auVar204._0_4_;
  fVar233 = auVar204._4_4_;
  fVar235 = auVar204._8_4_;
  fVar237 = auVar204._12_4_;
  fVar246 = auVar240._0_4_;
  fVar248 = auVar240._4_4_;
  fVar250 = auVar240._8_4_;
  fVar252 = auVar240._12_4_;
  auVar347._0_4_ = fVar246 * auVar150._0_4_ + fVar230 * auVar312._0_4_ + fVar214 * auVar25._0_4_;
  auVar347._4_4_ = fVar248 * auVar150._4_4_ + fVar233 * auVar312._4_4_ + fVar225 * auVar25._4_4_;
  auVar347._8_4_ = fVar250 * auVar150._8_4_ + fVar235 * auVar312._8_4_ + fVar226 * auVar25._8_4_;
  auVar347._12_4_ = fVar252 * auVar150._12_4_ + fVar237 * auVar312._12_4_ + fVar227 * auVar25._12_4_
  ;
  auVar347._16_4_ = fVar246 * auVar150._16_4_ + fVar230 * auVar312._16_4_ + fVar214 * auVar25._16_4_
  ;
  auVar347._20_4_ = fVar248 * auVar150._20_4_ + fVar233 * auVar312._20_4_ + fVar225 * auVar25._20_4_
  ;
  auVar347._24_4_ = fVar250 * auVar150._24_4_ + fVar235 * auVar312._24_4_ + fVar226 * auVar25._24_4_
  ;
  auVar347._28_4_ = fVar237 + in_register_000015dc + in_register_0000151c;
  auVar344._0_4_ = fVar246 * auVar26._0_4_ + fVar230 * auVar27._0_4_ + auVar28._0_4_ * fVar214;
  auVar344._4_4_ = fVar248 * auVar26._4_4_ + fVar233 * auVar27._4_4_ + auVar28._4_4_ * fVar225;
  auVar344._8_4_ = fVar250 * auVar26._8_4_ + fVar235 * auVar27._8_4_ + auVar28._8_4_ * fVar226;
  auVar344._12_4_ = fVar252 * auVar26._12_4_ + fVar237 * auVar27._12_4_ + auVar28._12_4_ * fVar227;
  auVar344._16_4_ = fVar246 * auVar26._16_4_ + fVar230 * auVar27._16_4_ + auVar28._16_4_ * fVar214;
  auVar344._20_4_ = fVar248 * auVar26._20_4_ + fVar233 * auVar27._20_4_ + auVar28._20_4_ * fVar225;
  auVar344._24_4_ = fVar250 * auVar26._24_4_ + fVar235 * auVar27._24_4_ + auVar28._24_4_ * fVar226;
  auVar344._28_4_ = fVar237 + in_register_000015dc + in_register_0000159c;
  auVar261._0_4_ = fVar246 * auVar29._0_4_ + fVar230 * auVar30._0_4_ + auVar31._0_4_ * fVar214;
  auVar261._4_4_ = fVar248 * auVar29._4_4_ + fVar233 * auVar30._4_4_ + auVar31._4_4_ * fVar225;
  auVar261._8_4_ = fVar250 * auVar29._8_4_ + fVar235 * auVar30._8_4_ + auVar31._8_4_ * fVar226;
  auVar261._12_4_ = fVar252 * auVar29._12_4_ + fVar237 * auVar30._12_4_ + auVar31._12_4_ * fVar227;
  auVar261._16_4_ = fVar246 * auVar29._16_4_ + fVar230 * auVar30._16_4_ + auVar31._16_4_ * fVar214;
  auVar261._20_4_ = fVar248 * auVar29._20_4_ + fVar233 * auVar30._20_4_ + auVar31._20_4_ * fVar225;
  auVar261._24_4_ = fVar250 * auVar29._24_4_ + fVar235 * auVar30._24_4_ + auVar31._24_4_ * fVar226;
  auVar261._28_4_ = fVar252 + fVar237 + fVar227;
  auVar240 = vshufps_avx(auVar175,auVar175,0);
  auVar204 = vshufps_avx(auVar175,auVar175,0x55);
  auVar169 = vshufps_avx(auVar175,auVar175,0xaa);
  fVar225 = auVar169._0_4_;
  fVar226 = auVar169._4_4_;
  fVar227 = auVar169._8_4_;
  fVar230 = auVar169._12_4_;
  fVar248 = auVar204._0_4_;
  fVar250 = auVar204._4_4_;
  fVar252 = auVar204._8_4_;
  fVar253 = auVar204._12_4_;
  fVar233 = auVar240._0_4_;
  fVar235 = auVar240._4_4_;
  fVar237 = auVar240._8_4_;
  fVar246 = auVar240._12_4_;
  fVar214 = auVar150._28_4_;
  auVar280._0_4_ = fVar233 * auVar150._0_4_ + fVar248 * auVar312._0_4_ + fVar225 * auVar25._0_4_;
  auVar280._4_4_ = fVar235 * auVar150._4_4_ + fVar250 * auVar312._4_4_ + fVar226 * auVar25._4_4_;
  auVar280._8_4_ = fVar237 * auVar150._8_4_ + fVar252 * auVar312._8_4_ + fVar227 * auVar25._8_4_;
  auVar280._12_4_ = fVar246 * auVar150._12_4_ + fVar253 * auVar312._12_4_ + fVar230 * auVar25._12_4_
  ;
  auVar280._16_4_ = fVar233 * auVar150._16_4_ + fVar248 * auVar312._16_4_ + fVar225 * auVar25._16_4_
  ;
  auVar280._20_4_ = fVar235 * auVar150._20_4_ + fVar250 * auVar312._20_4_ + fVar226 * auVar25._20_4_
  ;
  auVar280._24_4_ = fVar237 * auVar150._24_4_ + fVar252 * auVar312._24_4_ + fVar227 * auVar25._24_4_
  ;
  auVar280._28_4_ = fVar214 + auVar312._28_4_ + auVar25._28_4_;
  auVar181._0_4_ = fVar233 * auVar26._0_4_ + auVar28._0_4_ * fVar225 + fVar248 * auVar27._0_4_;
  auVar181._4_4_ = fVar235 * auVar26._4_4_ + auVar28._4_4_ * fVar226 + fVar250 * auVar27._4_4_;
  auVar181._8_4_ = fVar237 * auVar26._8_4_ + auVar28._8_4_ * fVar227 + fVar252 * auVar27._8_4_;
  auVar181._12_4_ = fVar246 * auVar26._12_4_ + auVar28._12_4_ * fVar230 + fVar253 * auVar27._12_4_;
  auVar181._16_4_ = fVar233 * auVar26._16_4_ + auVar28._16_4_ * fVar225 + fVar248 * auVar27._16_4_;
  auVar181._20_4_ = fVar235 * auVar26._20_4_ + auVar28._20_4_ * fVar226 + fVar250 * auVar27._20_4_;
  auVar181._24_4_ = fVar237 * auVar26._24_4_ + auVar28._24_4_ * fVar227 + fVar252 * auVar27._24_4_;
  auVar181._28_4_ = fVar214 + auVar28._28_4_ + auVar25._28_4_;
  auVar296._8_4_ = 0x7fffffff;
  auVar296._0_8_ = 0x7fffffff7fffffff;
  auVar296._12_4_ = 0x7fffffff;
  auVar296._16_4_ = 0x7fffffff;
  auVar296._20_4_ = 0x7fffffff;
  auVar296._24_4_ = 0x7fffffff;
  auVar296._28_4_ = 0x7fffffff;
  auVar210._8_4_ = 0x219392ef;
  auVar210._0_8_ = 0x219392ef219392ef;
  auVar210._12_4_ = 0x219392ef;
  auVar210._16_4_ = 0x219392ef;
  auVar210._20_4_ = 0x219392ef;
  auVar210._24_4_ = 0x219392ef;
  auVar210._28_4_ = 0x219392ef;
  auVar150 = vandps_avx(auVar347,auVar296);
  auVar150 = vcmpps_avx(auVar150,auVar210,1);
  auVar312 = vblendvps_avx(auVar347,auVar210,auVar150);
  auVar150 = vandps_avx(auVar344,auVar296);
  auVar150 = vcmpps_avx(auVar150,auVar210,1);
  auVar25 = vblendvps_avx(auVar344,auVar210,auVar150);
  auVar150 = vandps_avx(auVar261,auVar296);
  auVar150 = vcmpps_avx(auVar150,auVar210,1);
  auVar150 = vblendvps_avx(auVar261,auVar210,auVar150);
  auVar211._0_4_ = fVar248 * auVar30._0_4_ + auVar31._0_4_ * fVar225 + fVar233 * auVar29._0_4_;
  auVar211._4_4_ = fVar250 * auVar30._4_4_ + auVar31._4_4_ * fVar226 + fVar235 * auVar29._4_4_;
  auVar211._8_4_ = fVar252 * auVar30._8_4_ + auVar31._8_4_ * fVar227 + fVar237 * auVar29._8_4_;
  auVar211._12_4_ = fVar253 * auVar30._12_4_ + auVar31._12_4_ * fVar230 + fVar246 * auVar29._12_4_;
  auVar211._16_4_ = fVar248 * auVar30._16_4_ + auVar31._16_4_ * fVar225 + fVar233 * auVar29._16_4_;
  auVar211._20_4_ = fVar250 * auVar30._20_4_ + auVar31._20_4_ * fVar226 + fVar235 * auVar29._20_4_;
  auVar211._24_4_ = fVar252 * auVar30._24_4_ + auVar31._24_4_ * fVar227 + fVar237 * auVar29._24_4_;
  auVar211._28_4_ = auVar27._28_4_ + fVar230 + fVar214;
  auVar26 = vrcpps_avx(auVar312);
  fVar214 = auVar26._0_4_;
  fVar225 = auVar26._4_4_;
  auVar27._4_4_ = auVar312._4_4_ * fVar225;
  auVar27._0_4_ = auVar312._0_4_ * fVar214;
  fVar226 = auVar26._8_4_;
  auVar27._8_4_ = auVar312._8_4_ * fVar226;
  fVar227 = auVar26._12_4_;
  auVar27._12_4_ = auVar312._12_4_ * fVar227;
  fVar230 = auVar26._16_4_;
  auVar27._16_4_ = auVar312._16_4_ * fVar230;
  fVar233 = auVar26._20_4_;
  auVar27._20_4_ = auVar312._20_4_ * fVar233;
  fVar235 = auVar26._24_4_;
  auVar27._24_4_ = auVar312._24_4_ * fVar235;
  auVar27._28_4_ = auVar312._28_4_;
  auVar310._8_4_ = 0x3f800000;
  auVar310._0_8_ = &DAT_3f8000003f800000;
  auVar310._12_4_ = 0x3f800000;
  auVar310._16_4_ = 0x3f800000;
  auVar310._20_4_ = 0x3f800000;
  auVar310._24_4_ = 0x3f800000;
  auVar310._28_4_ = 0x3f800000;
  auVar27 = vsubps_avx(auVar310,auVar27);
  auVar312 = vrcpps_avx(auVar25);
  fVar214 = fVar214 + fVar214 * auVar27._0_4_;
  fVar225 = fVar225 + fVar225 * auVar27._4_4_;
  fVar226 = fVar226 + fVar226 * auVar27._8_4_;
  fVar227 = fVar227 + fVar227 * auVar27._12_4_;
  fVar230 = fVar230 + fVar230 * auVar27._16_4_;
  fVar233 = fVar233 + fVar233 * auVar27._20_4_;
  fVar235 = fVar235 + fVar235 * auVar27._24_4_;
  fVar256 = auVar312._0_4_;
  fVar268 = auVar312._4_4_;
  auVar28._4_4_ = fVar268 * auVar25._4_4_;
  auVar28._0_4_ = fVar256 * auVar25._0_4_;
  fVar270 = auVar312._8_4_;
  auVar28._8_4_ = fVar270 * auVar25._8_4_;
  fVar272 = auVar312._12_4_;
  auVar28._12_4_ = fVar272 * auVar25._12_4_;
  fVar274 = auVar312._16_4_;
  auVar28._16_4_ = fVar274 * auVar25._16_4_;
  fVar275 = auVar312._20_4_;
  auVar28._20_4_ = fVar275 * auVar25._20_4_;
  fVar276 = auVar312._24_4_;
  auVar28._24_4_ = fVar276 * auVar25._24_4_;
  auVar28._28_4_ = auVar26._28_4_;
  auVar312 = vsubps_avx(auVar310,auVar28);
  fVar256 = fVar256 + fVar256 * auVar312._0_4_;
  fVar268 = fVar268 + fVar268 * auVar312._4_4_;
  fVar270 = fVar270 + fVar270 * auVar312._8_4_;
  fVar272 = fVar272 + fVar272 * auVar312._12_4_;
  fVar274 = fVar274 + fVar274 * auVar312._16_4_;
  fVar275 = fVar275 + fVar275 * auVar312._20_4_;
  fVar276 = fVar276 + fVar276 * auVar312._24_4_;
  auVar312 = vrcpps_avx(auVar150);
  fVar237 = auVar312._0_4_;
  fVar246 = auVar312._4_4_;
  auVar29._4_4_ = fVar246 * auVar150._4_4_;
  auVar29._0_4_ = fVar237 * auVar150._0_4_;
  fVar248 = auVar312._8_4_;
  auVar29._8_4_ = fVar248 * auVar150._8_4_;
  fVar250 = auVar312._12_4_;
  auVar29._12_4_ = fVar250 * auVar150._12_4_;
  fVar252 = auVar312._16_4_;
  auVar29._16_4_ = fVar252 * auVar150._16_4_;
  fVar253 = auVar312._20_4_;
  auVar29._20_4_ = fVar253 * auVar150._20_4_;
  fVar254 = auVar312._24_4_;
  auVar29._24_4_ = fVar254 * auVar150._24_4_;
  auVar29._28_4_ = auVar25._28_4_;
  auVar150 = vsubps_avx(auVar310,auVar29);
  fVar237 = fVar237 + fVar237 * auVar150._0_4_;
  fVar246 = fVar246 + fVar246 * auVar150._4_4_;
  fVar248 = fVar248 + fVar248 * auVar150._8_4_;
  fVar250 = fVar250 + fVar250 * auVar150._12_4_;
  fVar252 = fVar252 + fVar252 * auVar150._16_4_;
  fVar253 = fVar253 + fVar253 * auVar150._20_4_;
  fVar254 = fVar254 + fVar254 * auVar150._24_4_;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = *(ulong *)(prim + uVar146 * 7 + 6);
  auVar240 = vpmovsxwd_avx(auVar240);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *(ulong *)(prim + uVar146 * 7 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar204);
  auVar151._16_16_ = auVar204;
  auVar151._0_16_ = auVar240;
  auVar150 = vcvtdq2ps_avx(auVar151);
  auVar150 = vsubps_avx(auVar150,auVar280);
  auVar148._0_4_ = fVar214 * auVar150._0_4_;
  auVar148._4_4_ = fVar225 * auVar150._4_4_;
  auVar148._8_4_ = fVar226 * auVar150._8_4_;
  auVar148._12_4_ = fVar227 * auVar150._12_4_;
  auVar312._16_4_ = fVar230 * auVar150._16_4_;
  auVar312._0_16_ = auVar148;
  auVar312._20_4_ = fVar233 * auVar150._20_4_;
  auVar312._24_4_ = fVar235 * auVar150._24_4_;
  auVar312._28_4_ = auVar150._28_4_;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + lVar145 + 6);
  auVar240 = vpmovsxwd_avx(auVar169);
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + lVar145 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar206);
  auVar297._16_16_ = auVar204;
  auVar297._0_16_ = auVar240;
  auVar150 = vcvtdq2ps_avx(auVar297);
  auVar150 = vsubps_avx(auVar150,auVar280);
  auVar215._0_4_ = fVar214 * auVar150._0_4_;
  auVar215._4_4_ = fVar225 * auVar150._4_4_;
  auVar215._8_4_ = fVar226 * auVar150._8_4_;
  auVar215._12_4_ = fVar227 * auVar150._12_4_;
  auVar25._16_4_ = fVar230 * auVar150._16_4_;
  auVar25._0_16_ = auVar215;
  auVar25._20_4_ = fVar233 * auVar150._20_4_;
  auVar25._24_4_ = fVar235 * auVar150._24_4_;
  auVar25._28_4_ = auVar26._28_4_ + auVar27._28_4_;
  lVar143 = (ulong)(byte)PVar17 * 0x10;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + lVar143 + 6);
  auVar240 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar143 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar10);
  lVar143 = lVar143 + uVar146 * -2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar143 + 6);
  auVar169 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar143 + 0xe);
  auVar206 = vpmovsxwd_avx(auVar12);
  auVar281._16_16_ = auVar206;
  auVar281._0_16_ = auVar169;
  auVar150 = vcvtdq2ps_avx(auVar281);
  auVar150 = vsubps_avx(auVar150,auVar181);
  auVar278._0_4_ = fVar256 * auVar150._0_4_;
  auVar278._4_4_ = fVar268 * auVar150._4_4_;
  auVar278._8_4_ = fVar270 * auVar150._8_4_;
  auVar278._12_4_ = fVar272 * auVar150._12_4_;
  auVar26._16_4_ = fVar274 * auVar150._16_4_;
  auVar26._0_16_ = auVar278;
  auVar26._20_4_ = fVar275 * auVar150._20_4_;
  auVar26._24_4_ = fVar276 * auVar150._24_4_;
  auVar26._28_4_ = auVar150._28_4_;
  auVar298._16_16_ = auVar204;
  auVar298._0_16_ = auVar240;
  auVar150 = vcvtdq2ps_avx(auVar298);
  auVar150 = vsubps_avx(auVar150,auVar181);
  auVar176._0_4_ = fVar256 * auVar150._0_4_;
  auVar176._4_4_ = fVar268 * auVar150._4_4_;
  auVar176._8_4_ = fVar270 * auVar150._8_4_;
  auVar176._12_4_ = fVar272 * auVar150._12_4_;
  auVar30._16_4_ = fVar274 * auVar150._16_4_;
  auVar30._0_16_ = auVar176;
  auVar30._20_4_ = fVar275 * auVar150._20_4_;
  auVar30._24_4_ = fVar276 * auVar150._24_4_;
  auVar30._28_4_ = auVar150._28_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar144 + uVar146 + 6);
  auVar240 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar144 + uVar146 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar14);
  auVar262._16_16_ = auVar204;
  auVar262._0_16_ = auVar240;
  auVar150 = vcvtdq2ps_avx(auVar262);
  auVar150 = vsubps_avx(auVar150,auVar211);
  auVar259._0_4_ = fVar237 * auVar150._0_4_;
  auVar259._4_4_ = fVar246 * auVar150._4_4_;
  auVar259._8_4_ = fVar248 * auVar150._8_4_;
  auVar259._12_4_ = fVar250 * auVar150._12_4_;
  auVar31._16_4_ = fVar252 * auVar150._16_4_;
  auVar31._0_16_ = auVar259;
  auVar31._20_4_ = fVar253 * auVar150._20_4_;
  auVar31._24_4_ = fVar254 * auVar150._24_4_;
  auVar31._28_4_ = auVar150._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar146 * 0x17 + 6);
  auVar240 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar146 * 0x17 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar16);
  auVar299._16_16_ = auVar204;
  auVar299._0_16_ = auVar240;
  auVar150 = vcvtdq2ps_avx(auVar299);
  auVar150 = vsubps_avx(auVar150,auVar211);
  auVar201._0_4_ = fVar237 * auVar150._0_4_;
  auVar201._4_4_ = fVar246 * auVar150._4_4_;
  auVar201._8_4_ = fVar248 * auVar150._8_4_;
  auVar201._12_4_ = fVar250 * auVar150._12_4_;
  auVar32._16_4_ = fVar252 * auVar150._16_4_;
  auVar32._0_16_ = auVar201;
  auVar32._20_4_ = fVar253 * auVar150._20_4_;
  auVar32._24_4_ = fVar254 * auVar150._24_4_;
  auVar32._28_4_ = auVar150._28_4_;
  auVar169 = auVar312._16_16_;
  auVar302 = ZEXT1664(auVar169);
  auVar240 = vpminsd_avx(auVar169,auVar25._16_16_);
  auVar204 = vpminsd_avx(auVar148,auVar215);
  auVar311._16_16_ = auVar240;
  auVar311._0_16_ = auVar204;
  auVar240 = vpminsd_avx(auVar26._16_16_,auVar30._16_16_);
  auVar204 = vpminsd_avx(auVar278,auVar176);
  auVar345._16_16_ = auVar240;
  auVar345._0_16_ = auVar204;
  auVar150 = vmaxps_avx(auVar311,auVar345);
  auVar240 = vpminsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar204 = vpminsd_avx(auVar259,auVar201);
  auVar355._16_16_ = auVar240;
  auVar355._0_16_ = auVar204;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar362._4_4_ = uVar8;
  auVar362._0_4_ = uVar8;
  auVar362._8_4_ = uVar8;
  auVar362._12_4_ = uVar8;
  auVar362._16_4_ = uVar8;
  auVar362._20_4_ = uVar8;
  auVar362._24_4_ = uVar8;
  auVar362._28_4_ = uVar8;
  auVar312 = vmaxps_avx(auVar355,auVar362);
  auVar150 = vmaxps_avx(auVar150,auVar312);
  local_80._4_4_ = auVar150._4_4_ * 0.99999964;
  local_80._0_4_ = auVar150._0_4_ * 0.99999964;
  local_80._8_4_ = auVar150._8_4_ * 0.99999964;
  local_80._12_4_ = auVar150._12_4_ * 0.99999964;
  local_80._16_4_ = auVar150._16_4_ * 0.99999964;
  local_80._20_4_ = auVar150._20_4_ * 0.99999964;
  local_80._24_4_ = auVar150._24_4_ * 0.99999964;
  local_80._28_4_ = auVar150._28_4_;
  auVar315 = ZEXT3264(local_80);
  auVar240 = vpmaxsd_avx(auVar169,auVar25._16_16_);
  auVar204 = vpmaxsd_avx(auVar148,auVar215);
  auVar152._16_16_ = auVar240;
  auVar152._0_16_ = auVar204;
  auVar240 = vpmaxsd_avx(auVar26._16_16_,auVar30._16_16_);
  auVar204 = vpmaxsd_avx(auVar278,auVar176);
  auVar182._16_16_ = auVar240;
  auVar182._0_16_ = auVar204;
  auVar150 = vminps_avx(auVar152,auVar182);
  auVar240 = vpmaxsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar204 = vpmaxsd_avx(auVar259,auVar201);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar218._4_4_ = uVar8;
  auVar218._0_4_ = uVar8;
  auVar218._8_4_ = uVar8;
  auVar218._12_4_ = uVar8;
  auVar218._16_4_ = uVar8;
  auVar218._20_4_ = uVar8;
  auVar218._24_4_ = uVar8;
  auVar218._28_4_ = uVar8;
  auVar183._16_16_ = auVar240;
  auVar183._0_16_ = auVar204;
  auVar312 = vminps_avx(auVar183,auVar218);
  auVar150 = vminps_avx(auVar150,auVar312);
  auVar24._4_4_ = auVar150._4_4_ * 1.0000004;
  auVar24._0_4_ = auVar150._0_4_ * 1.0000004;
  auVar24._8_4_ = auVar150._8_4_ * 1.0000004;
  auVar24._12_4_ = auVar150._12_4_ * 1.0000004;
  auVar24._16_4_ = auVar150._16_4_ * 1.0000004;
  auVar24._20_4_ = auVar150._20_4_ * 1.0000004;
  auVar24._24_4_ = auVar150._24_4_ * 1.0000004;
  auVar24._28_4_ = auVar150._28_4_;
  auVar150 = vcmpps_avx(local_80,auVar24,2);
  auVar240 = vpshufd_avx(ZEXT116((byte)PVar17),0);
  auVar184._16_16_ = auVar240;
  auVar184._0_16_ = auVar240;
  auVar312 = vcvtdq2ps_avx(auVar184);
  auVar312 = vcmpps_avx(_DAT_02020f40,auVar312,1);
  auVar150 = vandps_avx(auVar150,auVar312);
  uVar140 = vmovmskps_avx(auVar150);
  if (uVar140 != 0) {
    uVar140 = uVar140 & 0xff;
    local_548 = pre->ray_space + k;
    local_540 = mm_lookupmask_ps._16_8_;
    uStack_538 = mm_lookupmask_ps._24_8_;
    uStack_530 = mm_lookupmask_ps._16_8_;
    uStack_528 = mm_lookupmask_ps._24_8_;
    local_768 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    do {
      uVar146 = (ulong)uVar140;
      auVar312 = auVar315._0_32_;
      auVar150 = auVar302._0_32_;
      lVar143 = 0;
      if (uVar146 != 0) {
        for (; (uVar140 >> lVar143 & 1) == 0; lVar143 = lVar143 + 1) {
        }
      }
      uVar146 = uVar146 - 1 & uVar146;
      uVar140 = *(uint *)(prim + 2);
      uVar18 = *(uint *)(prim + lVar143 * 4 + 6);
      pGVar21 = (context->scene->geometries).items[uVar140].ptr;
      uVar144 = (ulong)*(uint *)(*(long *)&pGVar21->field_0x58 +
                                pGVar21[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar18);
      p_Var22 = pGVar21[1].intersectionFilterN;
      lVar143 = *(long *)&pGVar21[1].time_range.upper;
      auVar240 = *(undefined1 (*) [16])(lVar143 + (long)p_Var22 * uVar144);
      _local_800 = *(undefined1 (*) [16])(lVar143 + (uVar144 + 1) * (long)p_Var22);
      _local_630 = *(undefined1 (*) [16])(lVar143 + (uVar144 + 2) * (long)p_Var22);
      lVar145 = 0;
      if (uVar146 != 0) {
        for (; (uVar146 >> lVar145 & 1) == 0; lVar145 = lVar145 + 1) {
        }
      }
      _local_640 = *(undefined1 (*) [16])(lVar143 + (uVar144 + 3) * (long)p_Var22);
      if (((uVar146 != 0) && (uVar144 = uVar146 - 1 & uVar146, uVar144 != 0)) &&
         (lVar143 = 0, uVar144 != 0)) {
        for (; (uVar144 >> lVar143 & 1) == 0; lVar143 = lVar143 + 1) {
        }
      }
      uVar19 = (uint)pGVar21[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar204 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar9 = vinsertps_avx(auVar204,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar206 = vsubps_avx(auVar240,auVar9);
      auVar204 = vshufps_avx(auVar206,auVar206,0);
      auVar169 = vshufps_avx(auVar206,auVar206,0x55);
      auVar206 = vshufps_avx(auVar206,auVar206,0xaa);
      fVar214 = (local_548->vx).field_0.m128[0];
      fVar225 = (local_548->vx).field_0.m128[1];
      fVar226 = (local_548->vx).field_0.m128[2];
      fVar227 = (local_548->vx).field_0.m128[3];
      fVar230 = (local_548->vy).field_0.m128[0];
      fVar233 = (local_548->vy).field_0.m128[1];
      fVar235 = (local_548->vy).field_0.m128[2];
      fVar237 = (local_548->vy).field_0.m128[3];
      fVar246 = (local_548->vz).field_0.m128[0];
      fVar248 = (local_548->vz).field_0.m128[1];
      fVar250 = (local_548->vz).field_0.m128[2];
      fVar252 = (local_548->vz).field_0.m128[3];
      auVar177._0_8_ =
           CONCAT44(auVar204._4_4_ * fVar225 + auVar169._4_4_ * fVar233 + fVar248 * auVar206._4_4_,
                    auVar204._0_4_ * fVar214 + auVar169._0_4_ * fVar230 + fVar246 * auVar206._0_4_);
      auVar177._8_4_ =
           auVar204._8_4_ * fVar226 + auVar169._8_4_ * fVar235 + fVar250 * auVar206._8_4_;
      auVar177._12_4_ =
           auVar204._12_4_ * fVar227 + auVar169._12_4_ * fVar237 + fVar252 * auVar206._12_4_;
      auVar204 = vblendps_avx(auVar177,auVar240,8);
      auVar10 = vsubps_avx(_local_800,auVar9);
      auVar169 = vshufps_avx(auVar10,auVar10,0);
      auVar206 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar354._0_4_ = auVar169._0_4_ * fVar214 + auVar206._0_4_ * fVar230 + fVar246 * auVar10._0_4_
      ;
      auVar354._4_4_ = auVar169._4_4_ * fVar225 + auVar206._4_4_ * fVar233 + fVar248 * auVar10._4_4_
      ;
      auVar354._8_4_ = auVar169._8_4_ * fVar226 + auVar206._8_4_ * fVar235 + fVar250 * auVar10._8_4_
      ;
      auVar354._12_4_ =
           auVar169._12_4_ * fVar227 + auVar206._12_4_ * fVar237 + fVar252 * auVar10._12_4_;
      auVar169 = vblendps_avx(auVar354,_local_800,8);
      auVar11 = vsubps_avx(_local_630,auVar9);
      auVar206 = vshufps_avx(auVar11,auVar11,0);
      auVar10 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar260._0_4_ = auVar206._0_4_ * fVar214 + auVar10._0_4_ * fVar230 + fVar246 * auVar11._0_4_;
      auVar260._4_4_ = auVar206._4_4_ * fVar225 + auVar10._4_4_ * fVar233 + fVar248 * auVar11._4_4_;
      auVar260._8_4_ = auVar206._8_4_ * fVar226 + auVar10._8_4_ * fVar235 + fVar250 * auVar11._8_4_;
      auVar260._12_4_ =
           auVar206._12_4_ * fVar227 + auVar10._12_4_ * fVar237 + fVar252 * auVar11._12_4_;
      auVar11 = vshufps_avx(_local_630,_local_630,0xff);
      auVar206 = vblendps_avx(auVar260,_local_630,8);
      auVar12 = vsubps_avx(_local_640,auVar9);
      auVar9 = vshufps_avx(auVar12,auVar12,0);
      auVar10 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar309._0_4_ = auVar9._0_4_ * fVar214 + auVar10._0_4_ * fVar230 + fVar246 * auVar12._0_4_;
      auVar309._4_4_ = auVar9._4_4_ * fVar225 + auVar10._4_4_ * fVar233 + fVar248 * auVar12._4_4_;
      auVar309._8_4_ = auVar9._8_4_ * fVar226 + auVar10._8_4_ * fVar235 + fVar250 * auVar12._8_4_;
      auVar309._12_4_ =
           auVar9._12_4_ * fVar227 + auVar10._12_4_ * fVar237 + fVar252 * auVar12._12_4_;
      auVar12 = vshufps_avx(_local_640,_local_640,0xff);
      auVar9 = vblendps_avx(auVar309,_local_640,8);
      auVar239._8_4_ = 0x7fffffff;
      auVar239._0_8_ = 0x7fffffff7fffffff;
      auVar239._12_4_ = 0x7fffffff;
      auVar204 = vandps_avx(auVar204,auVar239);
      auVar169 = vandps_avx(auVar169,auVar239);
      auVar10 = vmaxps_avx(auVar204,auVar169);
      auVar204 = vandps_avx(auVar206,auVar239);
      auVar169 = vandps_avx(auVar9,auVar239);
      auVar204 = vmaxps_avx(auVar204,auVar169);
      auVar204 = vmaxps_avx(auVar10,auVar204);
      auVar169 = vmovshdup_avx(auVar204);
      auVar169 = vmaxss_avx(auVar169,auVar204);
      auVar204 = vshufpd_avx(auVar204,auVar204,1);
      auVar204 = vmaxss_avx(auVar204,auVar169);
      lVar143 = (long)(int)uVar19 * 0x44;
      fVar274 = *(float *)(bezier_basis0 + lVar143 + 0x908);
      fVar275 = *(float *)(bezier_basis0 + lVar143 + 0x90c);
      fVar276 = *(float *)(bezier_basis0 + lVar143 + 0x910);
      fVar316 = *(float *)(bezier_basis0 + lVar143 + 0x914);
      fVar317 = *(float *)(bezier_basis0 + lVar143 + 0x918);
      fVar229 = *(float *)(bezier_basis0 + lVar143 + 0x91c);
      fVar306 = *(float *)(bezier_basis0 + lVar143 + 0x920);
      auVar169 = vshufps_avx(auVar260,auVar260,0);
      register0x00001450 = auVar169;
      _local_500 = auVar169;
      auVar206 = vshufps_avx(auVar260,auVar260,0x55);
      local_600._16_16_ = auVar206;
      local_600._0_16_ = auVar206;
      register0x00001490 = auVar11;
      _local_1c0 = auVar11;
      fVar225 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar143 + 0xd8c);
      fVar226 = *(float *)(bezier_basis0 + lVar143 + 0xd90);
      fVar230 = *(float *)(bezier_basis0 + lVar143 + 0xd94);
      fVar233 = *(float *)(bezier_basis0 + lVar143 + 0xd98);
      fVar237 = *(float *)(bezier_basis0 + lVar143 + 0xd9c);
      fVar246 = *(float *)(bezier_basis0 + lVar143 + 0xda0);
      fVar250 = *(float *)(bezier_basis0 + lVar143 + 0xda4);
      auVar134 = *(undefined1 (*) [28])(bezier_basis0 + lVar143 + 0xd8c);
      auVar9 = vshufps_avx(auVar309,auVar309,0);
      register0x00001310 = auVar9;
      _local_4a0 = auVar9;
      auVar10 = vshufps_avx(auVar309,auVar309,0x55);
      register0x000015d0 = auVar10;
      _local_720 = auVar10;
      register0x000013d0 = auVar12;
      _local_140 = auVar12;
      fVar238 = auVar9._0_4_;
      fVar247 = auVar9._4_4_;
      fVar249 = auVar9._8_4_;
      fVar251 = auVar9._12_4_;
      fVar368 = auVar10._0_4_;
      fVar372 = auVar10._4_4_;
      fVar373 = auVar10._8_4_;
      fVar374 = auVar10._12_4_;
      fVar321 = auVar169._0_4_;
      fVar328 = auVar169._4_4_;
      fVar330 = auVar169._8_4_;
      fVar332 = auVar169._12_4_;
      fVar277 = auVar206._0_4_;
      fVar288 = auVar206._4_4_;
      fVar289 = auVar206._8_4_;
      fVar290 = auVar206._12_4_;
      fVar293 = auVar12._0_4_;
      fVar303 = auVar12._4_4_;
      fVar304 = auVar12._8_4_;
      fVar305 = auVar12._12_4_;
      fVar333 = auVar11._0_4_;
      fVar339 = auVar11._4_4_;
      fVar341 = auVar11._8_4_;
      auVar169 = vshufps_avx(auVar354,auVar354,0);
      register0x00001490 = auVar169;
      _local_120 = auVar169;
      fVar318 = *(float *)(bezier_basis0 + lVar143 + 0x484);
      fVar319 = *(float *)(bezier_basis0 + lVar143 + 0x488);
      fVar232 = *(float *)(bezier_basis0 + lVar143 + 0x48c);
      fVar307 = *(float *)(bezier_basis0 + lVar143 + 0x490);
      fStack_510 = *(float *)(bezier_basis0 + lVar143 + 0x494);
      fStack_50c = *(float *)(bezier_basis0 + lVar143 + 0x498);
      fStack_508 = *(float *)(bezier_basis0 + lVar143 + 0x49c);
      fStack_504 = *(float *)(bezier_basis0 + lVar143 + 0x4a0);
      fVar334 = auVar169._0_4_;
      fVar340 = auVar169._4_4_;
      fVar342 = auVar169._8_4_;
      fVar343 = auVar169._12_4_;
      auVar169 = vshufps_avx(auVar354,auVar354,0x55);
      register0x00001350 = auVar169;
      _local_220 = auVar169;
      fVar257 = auVar169._0_4_;
      fVar269 = auVar169._4_4_;
      fVar271 = auVar169._8_4_;
      fVar273 = auVar169._12_4_;
      auVar169 = vshufps_avx(_local_800,_local_800,0xff);
      register0x00001590 = auVar169;
      _local_a0 = auVar169;
      fVar361 = auVar169._0_4_;
      fVar365 = auVar169._4_4_;
      fVar366 = auVar169._8_4_;
      fVar367 = auVar169._12_4_;
      fVar213 = *(float *)(bezier_basis0 + lVar143 + 0x924) + 0.0 + 0.0;
      auVar124._8_4_ = auVar177._8_4_;
      auVar124._0_8_ = auVar177._0_8_;
      auVar124._12_4_ = auVar177._12_4_;
      auVar169 = vshufps_avx(auVar124,auVar124,0);
      register0x00001550 = auVar169;
      _local_c0 = auVar169;
      pauVar1 = (undefined1 (*) [32])(bezier_basis0 + lVar143);
      fVar252 = *(float *)*pauVar1;
      fVar253 = *(float *)(bezier_basis0 + lVar143 + 4);
      fVar254 = *(float *)(bezier_basis0 + lVar143 + 8);
      fVar256 = *(float *)(bezier_basis0 + lVar143 + 0xc);
      fVar268 = *(float *)(bezier_basis0 + lVar143 + 0x10);
      fVar270 = *(float *)(bezier_basis0 + lVar143 + 0x14);
      fVar272 = *(float *)(bezier_basis0 + lVar143 + 0x18);
      auVar135 = *(undefined1 (*) [28])*pauVar1;
      fVar353 = auVar169._0_4_;
      fVar358 = auVar169._4_4_;
      fVar359 = auVar169._8_4_;
      fVar360 = auVar169._12_4_;
      auVar348._0_4_ = fVar353 * fVar252 + fVar334 * fVar318 + fVar321 * fVar274 + fVar238 * fVar225
      ;
      auVar348._4_4_ = fVar358 * fVar253 + fVar340 * fVar319 + fVar328 * fVar275 + fVar247 * fVar226
      ;
      auVar348._8_4_ = fVar359 * fVar254 + fVar342 * fVar232 + fVar330 * fVar276 + fVar249 * fVar230
      ;
      auVar348._12_4_ =
           fVar360 * fVar256 + fVar343 * fVar307 + fVar332 * fVar316 + fVar251 * fVar233;
      auVar348._16_4_ =
           fVar353 * fVar268 + fVar334 * fStack_510 + fVar321 * fVar317 + fVar238 * fVar237;
      auVar348._20_4_ =
           fVar358 * fVar270 + fVar340 * fStack_50c + fVar328 * fVar229 + fVar247 * fVar246;
      auVar348._24_4_ =
           fVar359 * fVar272 + fVar342 * fStack_508 + fVar330 * fVar306 + fVar249 * fVar250;
      auVar348._28_4_ = fStack_504 + 0.0;
      auVar169 = vshufps_avx(auVar124,auVar124,0x55);
      register0x00001210 = auVar169;
      _local_1e0 = auVar169;
      fVar214 = auVar169._0_4_;
      fVar227 = auVar169._4_4_;
      fVar235 = auVar169._8_4_;
      fVar248 = auVar169._12_4_;
      auVar313._0_4_ = fVar252 * fVar214 + fVar257 * fVar318 + fVar277 * fVar274 + fVar368 * fVar225
      ;
      auVar313._4_4_ = fVar253 * fVar227 + fVar269 * fVar319 + fVar288 * fVar275 + fVar372 * fVar226
      ;
      auVar313._8_4_ = fVar254 * fVar235 + fVar271 * fVar232 + fVar289 * fVar276 + fVar373 * fVar230
      ;
      auVar313._12_4_ =
           fVar256 * fVar248 + fVar273 * fVar307 + fVar290 * fVar316 + fVar374 * fVar233;
      auVar313._16_4_ =
           fVar268 * fVar214 + fVar257 * fStack_510 + fVar277 * fVar317 + fVar368 * fVar237;
      auVar313._20_4_ =
           fVar270 * fVar227 + fVar269 * fStack_50c + fVar288 * fVar229 + fVar372 * fVar246;
      auVar313._24_4_ =
           fVar272 * fVar235 + fVar271 * fStack_508 + fVar289 * fVar306 + fVar373 * fVar250;
      auVar313._28_4_ = 0;
      auVar169 = vpermilps_avx(auVar240,0xff);
      register0x00001450 = auVar169;
      _local_160 = auVar169;
      _local_200 = *pauVar1;
      auVar29 = _local_200;
      fVar322 = auVar169._0_4_;
      fVar329 = auVar169._4_4_;
      fVar331 = auVar169._8_4_;
      local_840._0_4_ =
           fVar322 * fVar252 + fVar361 * fVar318 + fVar333 * fVar274 + fVar293 * fVar225;
      local_840._4_4_ =
           fVar329 * fVar253 + fVar365 * fVar319 + fVar339 * fVar275 + fVar303 * fVar226;
      fStack_838 = fVar331 * fVar254 + fVar366 * fVar232 + fVar341 * fVar276 + fVar304 * fVar230;
      fStack_834 = auVar169._12_4_ * fVar256 +
                   fVar367 * fVar307 + auVar11._12_4_ * fVar316 + fVar305 * fVar233;
      fStack_830 = fVar322 * fVar268 + fVar361 * fStack_510 + fVar333 * fVar317 + fVar293 * fVar237;
      fStack_82c = fVar329 * fVar270 + fVar365 * fStack_50c + fVar339 * fVar229 + fVar303 * fVar246;
      fStack_828 = fVar331 * fVar272 + fVar366 * fStack_508 + fVar341 * fVar306 + fVar304 * fVar250;
      fStack_824 = fVar213 + 0.0;
      fVar236 = *(float *)(bezier_basis1 + lVar143 + 0x908);
      fVar320 = *(float *)(bezier_basis1 + lVar143 + 0x90c);
      fVar234 = *(float *)(bezier_basis1 + lVar143 + 0x910);
      fVar173 = *(float *)(bezier_basis1 + lVar143 + 0x914);
      fVar174 = *(float *)(bezier_basis1 + lVar143 + 0x918);
      fVar195 = *(float *)(bezier_basis1 + lVar143 + 0x91c);
      fVar196 = *(float *)(bezier_basis1 + lVar143 + 0x920);
      fVar147 = *(float *)(bezier_basis1 + lVar143 + 0xd8c);
      fVar163 = *(float *)(bezier_basis1 + lVar143 + 0xd90);
      fVar165 = *(float *)(bezier_basis1 + lVar143 + 0xd94);
      fVar167 = *(float *)(bezier_basis1 + lVar143 + 0xd98);
      fVar168 = *(float *)(bezier_basis1 + lVar143 + 0xd9c);
      fVar170 = *(float *)(bezier_basis1 + lVar143 + 0xda0);
      fVar171 = *(float *)(bezier_basis1 + lVar143 + 0xda4);
      fVar172 = *(float *)(bezier_basis1 + lVar143 + 0x484);
      fVar255 = *(float *)(bezier_basis1 + lVar143 + 0x488);
      fVar291 = *(float *)(bezier_basis1 + lVar143 + 0x48c);
      fVar164 = *(float *)(bezier_basis1 + lVar143 + 0x490);
      fVar166 = *(float *)(bezier_basis1 + lVar143 + 0x494);
      fVar199 = *(float *)(bezier_basis1 + lVar143 + 0x498);
      fVar308 = *(float *)(bezier_basis1 + lVar143 + 0x49c);
      fVar226 = fVar360 + fVar213 + 0.0;
      fVar213 = *(float *)(bezier_basis1 + lVar143);
      fVar228 = *(float *)(bezier_basis1 + lVar143 + 4);
      fVar231 = *(float *)(bezier_basis1 + lVar143 + 8);
      fVar197 = *(float *)(bezier_basis1 + lVar143 + 0xc);
      fVar198 = *(float *)(bezier_basis1 + lVar143 + 0x10);
      fVar200 = *(float *)(bezier_basis1 + lVar143 + 0x14);
      fVar292 = *(float *)(bezier_basis1 + lVar143 + 0x18);
      auVar241._0_4_ = fVar353 * fVar213 + fVar334 * fVar172 + fVar236 * fVar321 + fVar147 * fVar238
      ;
      auVar241._4_4_ = fVar358 * fVar228 + fVar340 * fVar255 + fVar320 * fVar328 + fVar163 * fVar247
      ;
      auVar241._8_4_ = fVar359 * fVar231 + fVar342 * fVar291 + fVar234 * fVar330 + fVar165 * fVar249
      ;
      auVar241._12_4_ =
           fVar360 * fVar197 + fVar343 * fVar164 + fVar173 * fVar332 + fVar167 * fVar251;
      auVar241._16_4_ =
           fVar353 * fVar198 + fVar334 * fVar166 + fVar174 * fVar321 + fVar168 * fVar238;
      auVar241._20_4_ =
           fVar358 * fVar200 + fVar340 * fVar199 + fVar195 * fVar328 + fVar170 * fVar247;
      auVar241._24_4_ =
           fVar359 * fVar292 + fVar342 * fVar308 + fVar196 * fVar330 + fVar171 * fVar249;
      auVar241._28_4_ = fVar367 + fVar226;
      auVar219._0_4_ = fVar214 * fVar213 + fVar257 * fVar172 + fVar236 * fVar277 + fVar368 * fVar147
      ;
      auVar219._4_4_ = fVar227 * fVar228 + fVar269 * fVar255 + fVar320 * fVar288 + fVar372 * fVar163
      ;
      auVar219._8_4_ = fVar235 * fVar231 + fVar271 * fVar291 + fVar234 * fVar289 + fVar373 * fVar165
      ;
      auVar219._12_4_ =
           fVar248 * fVar197 + fVar273 * fVar164 + fVar173 * fVar290 + fVar374 * fVar167;
      auVar219._16_4_ =
           fVar214 * fVar198 + fVar257 * fVar166 + fVar174 * fVar277 + fVar368 * fVar168;
      auVar219._20_4_ =
           fVar227 * fVar200 + fVar269 * fVar199 + fVar195 * fVar288 + fVar372 * fVar170;
      auVar219._24_4_ =
           fVar235 * fVar292 + fVar271 * fVar308 + fVar196 * fVar289 + fVar373 * fVar171;
      auVar219._28_4_ = fVar226 + fVar360 + fStack_504 + 0.0;
      auVar263._0_4_ = fVar361 * fVar172 + fVar236 * fVar333 + fVar147 * fVar293 + fVar322 * fVar213
      ;
      auVar263._4_4_ = fVar365 * fVar255 + fVar320 * fVar339 + fVar163 * fVar303 + fVar329 * fVar228
      ;
      auVar263._8_4_ = fVar366 * fVar291 + fVar234 * fVar341 + fVar165 * fVar304 + fVar331 * fVar231
      ;
      auVar263._12_4_ =
           fVar367 * fVar164 + fVar173 * auVar11._12_4_ + fVar167 * fVar305 +
           auVar169._12_4_ * fVar197;
      auVar263._16_4_ =
           fVar361 * fVar166 + fVar174 * fVar333 + fVar168 * fVar293 + fVar322 * fVar198;
      auVar263._20_4_ =
           fVar365 * fVar199 + fVar195 * fVar339 + fVar170 * fVar303 + fVar329 * fVar200;
      auVar263._24_4_ =
           fVar366 * fVar308 + fVar196 * fVar341 + fVar171 * fVar304 + fVar331 * fVar292;
      auVar263._28_4_ = fVar360 + fVar305 + fStack_504 + fVar226;
      local_260 = vsubps_avx(auVar241,auVar348);
      auVar27 = vsubps_avx(auVar219,auVar313);
      fVar225 = local_260._0_4_;
      fVar230 = local_260._4_4_;
      auVar33._4_4_ = auVar313._4_4_ * fVar230;
      auVar33._0_4_ = auVar313._0_4_ * fVar225;
      fVar237 = local_260._8_4_;
      auVar33._8_4_ = auVar313._8_4_ * fVar237;
      fVar250 = local_260._12_4_;
      auVar33._12_4_ = auVar313._12_4_ * fVar250;
      fVar253 = local_260._16_4_;
      auVar33._16_4_ = auVar313._16_4_ * fVar253;
      fVar256 = local_260._20_4_;
      auVar33._20_4_ = auVar313._20_4_ * fVar256;
      fVar270 = local_260._24_4_;
      auVar33._24_4_ = auVar313._24_4_ * fVar270;
      auVar33._28_4_ = fVar226;
      fVar226 = auVar27._0_4_;
      fVar233 = auVar27._4_4_;
      auVar34._4_4_ = auVar348._4_4_ * fVar233;
      auVar34._0_4_ = auVar348._0_4_ * fVar226;
      fVar246 = auVar27._8_4_;
      auVar34._8_4_ = auVar348._8_4_ * fVar246;
      fVar252 = auVar27._12_4_;
      auVar34._12_4_ = auVar348._12_4_ * fVar252;
      fVar254 = auVar27._16_4_;
      auVar34._16_4_ = auVar348._16_4_ * fVar254;
      fVar268 = auVar27._20_4_;
      auVar34._20_4_ = auVar348._20_4_ * fVar268;
      fVar272 = auVar27._24_4_;
      auVar34._24_4_ = auVar348._24_4_ * fVar272;
      auVar34._28_4_ = auVar219._28_4_;
      auVar26 = vsubps_avx(auVar33,auVar34);
      auVar25 = vmaxps_avx(_local_840,auVar263);
      auVar35._4_4_ = auVar25._4_4_ * auVar25._4_4_ * (fVar230 * fVar230 + fVar233 * fVar233);
      auVar35._0_4_ = auVar25._0_4_ * auVar25._0_4_ * (fVar225 * fVar225 + fVar226 * fVar226);
      auVar35._8_4_ = auVar25._8_4_ * auVar25._8_4_ * (fVar237 * fVar237 + fVar246 * fVar246);
      auVar35._12_4_ = auVar25._12_4_ * auVar25._12_4_ * (fVar250 * fVar250 + fVar252 * fVar252);
      auVar35._16_4_ = auVar25._16_4_ * auVar25._16_4_ * (fVar253 * fVar253 + fVar254 * fVar254);
      auVar35._20_4_ = auVar25._20_4_ * auVar25._20_4_ * (fVar256 * fVar256 + fVar268 * fVar268);
      auVar35._24_4_ = auVar25._24_4_ * auVar25._24_4_ * (fVar270 * fVar270 + fVar272 * fVar272);
      auVar35._28_4_ = auVar27._28_4_ + auVar219._28_4_;
      auVar36._4_4_ = auVar26._4_4_ * auVar26._4_4_;
      auVar36._0_4_ = auVar26._0_4_ * auVar26._0_4_;
      auVar36._8_4_ = auVar26._8_4_ * auVar26._8_4_;
      auVar36._12_4_ = auVar26._12_4_ * auVar26._12_4_;
      auVar36._16_4_ = auVar26._16_4_ * auVar26._16_4_;
      auVar36._20_4_ = auVar26._20_4_ * auVar26._20_4_;
      auVar36._24_4_ = auVar26._24_4_ * auVar26._24_4_;
      auVar36._28_4_ = auVar26._28_4_;
      auVar25 = vcmpps_avx(auVar36,auVar35,2);
      auVar169 = ZEXT416((uint)(float)(int)uVar19);
      _local_4c0 = auVar169;
      auVar169 = vshufps_avx(auVar169,auVar169,0);
      auVar220._16_16_ = auVar169;
      auVar220._0_16_ = auVar169;
      auVar26 = vcmpps_avx(_DAT_02020f40,auVar220,1);
      auVar224 = ZEXT3264(auVar26);
      auVar125._8_4_ = auVar177._8_4_;
      auVar125._0_8_ = auVar177._0_8_;
      auVar125._12_4_ = auVar177._12_4_;
      auVar169 = vpermilps_avx(auVar125,0xaa);
      register0x00001450 = auVar169;
      _local_620 = auVar169;
      auVar206 = vpermilps_avx(auVar354,0xaa);
      register0x00001550 = auVar206;
      _local_480 = auVar206;
      auVar9 = vpermilps_avx(auVar260,0xaa);
      register0x00001590 = auVar9;
      _local_e0 = auVar9;
      auVar10 = vpermilps_avx(auVar309,0xaa);
      register0x00001310 = auVar10;
      _local_6a0 = auVar10;
      auVar28 = auVar26 & auVar25;
      uVar142 = *(uint *)(ray + k * 4 + 0x30);
      auVar204 = ZEXT416((uint)(auVar204._0_4_ * 4.7683716e-07));
      local_740._0_16_ = auVar204;
      local_880._0_4_ = auVar240._0_4_;
      fVar225 = (float)local_880;
      local_880._4_4_ = auVar240._4_4_;
      fVar226 = local_880._4_4_;
      uStack_878._0_4_ = auVar240._8_4_;
      fVar230 = (float)uStack_878;
      uStack_878._4_4_ = auVar240._12_4_;
      fVar233 = uStack_878._4_4_;
      local_880 = auVar240._0_8_;
      uStack_878 = auVar240._8_8_;
      fVar237 = fVar368;
      fVar246 = fVar372;
      fVar250 = fVar373;
      fVar252 = fVar374;
      if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar28 >> 0x7f,0) == '\0') &&
            (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar28 >> 0xbf,0) == '\0') &&
          (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar28[0x1f])
      {
        auVar302 = ZEXT3264(auVar150);
        auVar315 = ZEXT3264(auVar312);
      }
      else {
        auVar25 = vandps_avx(auVar25,auVar26);
        fVar293 = auVar169._0_4_;
        fVar303 = auVar169._4_4_;
        fVar304 = auVar169._8_4_;
        fVar305 = auVar169._12_4_;
        fVar322 = auVar206._0_4_;
        fVar329 = auVar206._4_4_;
        fVar331 = auVar206._8_4_;
        fVar333 = auVar206._12_4_;
        fVar339 = auVar9._0_4_;
        fVar341 = auVar9._4_4_;
        fVar361 = auVar9._8_4_;
        fVar365 = auVar9._12_4_;
        fVar253 = auVar10._0_4_;
        fVar254 = auVar10._4_4_;
        fVar256 = auVar10._8_4_;
        fVar268 = auVar10._12_4_;
        fVar270 = auVar26._28_4_ + *(float *)(bezier_basis1 + lVar143 + 0x924) + 0.0;
        local_240._0_4_ =
             fVar293 * fVar213 + fVar322 * fVar172 + fVar339 * fVar236 + fVar147 * fVar253;
        local_240._4_4_ =
             fVar303 * fVar228 + fVar329 * fVar255 + fVar341 * fVar320 + fVar163 * fVar254;
        fStack_238 = fVar304 * fVar231 + fVar331 * fVar291 + fVar361 * fVar234 + fVar165 * fVar256;
        fStack_234 = fVar305 * fVar197 + fVar333 * fVar164 + fVar365 * fVar173 + fVar167 * fVar268;
        fStack_230 = fVar293 * fVar198 + fVar322 * fVar166 + fVar339 * fVar174 + fVar168 * fVar253;
        fStack_22c = fVar303 * fVar200 + fVar329 * fVar199 + fVar341 * fVar195 + fVar170 * fVar254;
        fStack_228 = fVar304 * fVar292 + fVar331 * fVar308 + fVar361 * fVar196 + fVar171 * fVar256;
        fStack_224 = auVar25._28_4_ + fVar270;
        local_200._0_4_ = auVar135._0_4_;
        local_200._4_4_ = auVar135._4_4_;
        fStack_1f8 = auVar135._8_4_;
        fStack_1f4 = auVar135._12_4_;
        fStack_1f0 = auVar135._16_4_;
        fStack_1ec = auVar135._20_4_;
        fStack_1e8 = auVar135._24_4_;
        local_700._0_4_ = auVar134._0_4_;
        local_700._4_4_ = auVar134._4_4_;
        fStack_6f8 = auVar134._8_4_;
        fStack_6f4 = auVar134._12_4_;
        fStack_6f0 = auVar134._16_4_;
        fStack_6ec = auVar134._20_4_;
        fStack_6e8 = auVar134._24_4_;
        fVar255 = fVar293 * (float)local_200._0_4_ +
                  fVar322 * fVar318 + fVar339 * fVar274 + fVar253 * (float)local_700._0_4_;
        fVar291 = fVar303 * (float)local_200._4_4_ +
                  fVar329 * fVar319 + fVar341 * fVar275 + fVar254 * (float)local_700._4_4_;
        fVar164 = fVar304 * fStack_1f8 +
                  fVar331 * fVar232 + fVar361 * fVar276 + fVar256 * fStack_6f8;
        fVar166 = fVar305 * fStack_1f4 +
                  fVar333 * fVar307 + fVar365 * fVar316 + fVar268 * fStack_6f4;
        fStack_5b0 = fVar293 * fStack_1f0 +
                     fVar322 * fStack_510 + fVar339 * fVar317 + fVar253 * fStack_6f0;
        fStack_5ac = fVar303 * fStack_1ec +
                     fVar329 * fStack_50c + fVar341 * fVar229 + fVar254 * fStack_6ec;
        fStack_5a8 = fVar304 * fStack_1e8 +
                     fVar331 * fStack_508 + fVar361 * fVar306 + fVar256 * fStack_6e8;
        fStack_5a4 = fStack_224 + fVar270 + auVar25._28_4_ + auVar26._28_4_;
        fVar270 = *(float *)(bezier_basis0 + lVar143 + 0x1210);
        fVar272 = *(float *)(bezier_basis0 + lVar143 + 0x1214);
        fVar274 = *(float *)(bezier_basis0 + lVar143 + 0x1218);
        fVar275 = *(float *)(bezier_basis0 + lVar143 + 0x121c);
        fVar276 = *(float *)(bezier_basis0 + lVar143 + 0x1220);
        fVar316 = *(float *)(bezier_basis0 + lVar143 + 0x1224);
        fVar317 = *(float *)(bezier_basis0 + lVar143 + 0x1228);
        fVar229 = *(float *)(bezier_basis0 + lVar143 + 0x1694);
        fVar306 = *(float *)(bezier_basis0 + lVar143 + 0x1698);
        fVar318 = *(float *)(bezier_basis0 + lVar143 + 0x169c);
        fVar319 = *(float *)(bezier_basis0 + lVar143 + 0x16a0);
        fVar232 = *(float *)(bezier_basis0 + lVar143 + 0x16a4);
        fVar307 = *(float *)(bezier_basis0 + lVar143 + 0x16a8);
        fVar236 = *(float *)(bezier_basis0 + lVar143 + 0x16ac);
        fVar320 = *(float *)(bezier_basis0 + lVar143 + 0x1b18);
        fVar234 = *(float *)(bezier_basis0 + lVar143 + 0x1b1c);
        fVar173 = *(float *)(bezier_basis0 + lVar143 + 0x1b20);
        fVar174 = *(float *)(bezier_basis0 + lVar143 + 0x1b24);
        fVar195 = *(float *)(bezier_basis0 + lVar143 + 0x1b28);
        fVar196 = *(float *)(bezier_basis0 + lVar143 + 0x1b2c);
        fVar147 = *(float *)(bezier_basis0 + lVar143 + 0x1b30);
        fVar163 = *(float *)(bezier_basis0 + lVar143 + 0x1f9c);
        fVar165 = *(float *)(bezier_basis0 + lVar143 + 0x1fa0);
        fVar167 = *(float *)(bezier_basis0 + lVar143 + 0x1fa4);
        fVar168 = *(float *)(bezier_basis0 + lVar143 + 0x1fa8);
        fVar170 = *(float *)(bezier_basis0 + lVar143 + 0x1fac);
        fVar171 = *(float *)(bezier_basis0 + lVar143 + 0x1fb0);
        fVar172 = *(float *)(bezier_basis0 + lVar143 + 0x1fb4);
        fVar199 = *(float *)(bezier_basis0 + lVar143 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar143 + 0x1fb8);
        fVar308 = *(float *)(bezier_basis0 + lVar143 + 0x16b0) + fVar199;
        local_700._4_4_ =
             fVar358 * fVar272 + fVar340 * fVar306 + fVar328 * fVar234 + fVar247 * fVar165;
        local_700._0_4_ =
             fVar353 * fVar270 + fVar334 * fVar229 + fVar321 * fVar320 + fVar238 * fVar163;
        fStack_6f8 = fVar359 * fVar274 + fVar342 * fVar318 + fVar330 * fVar173 + fVar249 * fVar167;
        fStack_6f4 = fVar360 * fVar275 + fVar343 * fVar319 + fVar332 * fVar174 + fVar251 * fVar168;
        fStack_6f0 = fVar353 * fVar276 + fVar334 * fVar232 + fVar321 * fVar195 + fVar238 * fVar170;
        fStack_6ec = fVar358 * fVar316 + fVar340 * fVar307 + fVar328 * fVar196 + fVar247 * fVar171;
        fStack_6e8 = fVar359 * fVar317 + fVar342 * fVar236 + fVar330 * fVar147 + fVar249 * fVar172;
        fStack_6e4 = *(float *)(bezier_basis0 + lVar143 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar143 + 0x1fb8) +
                     fVar305 + *(float *)(bezier_basis1 + lVar143 + 0x4a0);
        auVar282._0_4_ =
             fVar214 * fVar270 + fVar257 * fVar229 + fVar277 * fVar320 + fVar368 * fVar163;
        auVar282._4_4_ =
             fVar227 * fVar272 + fVar269 * fVar306 + fVar288 * fVar234 + fVar372 * fVar165;
        auVar282._8_4_ =
             fVar235 * fVar274 + fVar271 * fVar318 + fVar289 * fVar173 + fVar373 * fVar167;
        auVar282._12_4_ =
             fVar248 * fVar275 + fVar273 * fVar319 + fVar290 * fVar174 + fVar374 * fVar168;
        auVar282._16_4_ =
             fVar214 * fVar276 + fVar257 * fVar232 + fVar277 * fVar195 + fVar368 * fVar170;
        auVar282._20_4_ =
             fVar227 * fVar316 + fVar269 * fVar307 + fVar288 * fVar196 + fVar372 * fVar171;
        auVar282._24_4_ =
             fVar235 * fVar317 + fVar271 * fVar236 + fVar289 * fVar147 + fVar373 * fVar172;
        auVar282._28_4_ =
             fVar199 + fVar305 + *(float *)(bezier_basis1 + lVar143 + 0x4a0) +
                       fVar305 + *(float *)(bezier_basis1 + lVar143 + 0x1c);
        local_520 = fVar293 * fVar270 + fVar322 * fVar229 + fVar339 * fVar320 + fVar253 * fVar163;
        fStack_51c = fVar303 * fVar272 + fVar329 * fVar306 + fVar341 * fVar234 + fVar254 * fVar165;
        fStack_518 = fVar304 * fVar274 + fVar331 * fVar318 + fVar361 * fVar173 + fVar256 * fVar167;
        fStack_514 = fVar305 * fVar275 + fVar333 * fVar319 + fVar365 * fVar174 + fVar268 * fVar168;
        fStack_510 = fVar293 * fVar276 + fVar322 * fVar232 + fVar339 * fVar195 + fVar253 * fVar170;
        fStack_50c = fVar303 * fVar316 + fVar329 * fVar307 + fVar341 * fVar196 + fVar254 * fVar171;
        fStack_508 = fVar304 * fVar317 + fVar331 * fVar236 + fVar361 * fVar147 + fVar256 * fVar172;
        fStack_504 = *(float *)(bezier_basis0 + lVar143 + 0x122c) + fVar308;
        fVar270 = *(float *)(bezier_basis1 + lVar143 + 0x1b18);
        fVar272 = *(float *)(bezier_basis1 + lVar143 + 0x1b1c);
        fVar274 = *(float *)(bezier_basis1 + lVar143 + 0x1b20);
        fVar275 = *(float *)(bezier_basis1 + lVar143 + 0x1b24);
        fVar276 = *(float *)(bezier_basis1 + lVar143 + 0x1b28);
        fVar316 = *(float *)(bezier_basis1 + lVar143 + 0x1b2c);
        fVar317 = *(float *)(bezier_basis1 + lVar143 + 0x1b30);
        fVar229 = *(float *)(bezier_basis1 + lVar143 + 0x1f9c);
        fVar306 = *(float *)(bezier_basis1 + lVar143 + 0x1fa0);
        fVar318 = *(float *)(bezier_basis1 + lVar143 + 0x1fa4);
        fVar319 = *(float *)(bezier_basis1 + lVar143 + 0x1fa8);
        fVar232 = *(float *)(bezier_basis1 + lVar143 + 0x1fac);
        fVar307 = *(float *)(bezier_basis1 + lVar143 + 0x1fb0);
        fVar236 = *(float *)(bezier_basis1 + lVar143 + 0x1fb4);
        fVar320 = *(float *)(bezier_basis1 + lVar143 + 0x1694);
        fVar234 = *(float *)(bezier_basis1 + lVar143 + 0x1698);
        fVar173 = *(float *)(bezier_basis1 + lVar143 + 0x169c);
        fVar174 = *(float *)(bezier_basis1 + lVar143 + 0x16a0);
        fVar195 = *(float *)(bezier_basis1 + lVar143 + 0x16a4);
        fVar196 = *(float *)(bezier_basis1 + lVar143 + 0x16a8);
        fVar147 = *(float *)(bezier_basis1 + lVar143 + 0x16ac);
        fVar163 = *(float *)(bezier_basis1 + lVar143 + 0x1210);
        fVar165 = *(float *)(bezier_basis1 + lVar143 + 0x1214);
        fVar167 = *(float *)(bezier_basis1 + lVar143 + 0x1218);
        fVar168 = *(float *)(bezier_basis1 + lVar143 + 0x121c);
        fVar170 = *(float *)(bezier_basis1 + lVar143 + 0x1220);
        fVar171 = *(float *)(bezier_basis1 + lVar143 + 0x1224);
        fVar172 = *(float *)(bezier_basis1 + lVar143 + 0x1228);
        auVar300._0_4_ =
             fVar353 * fVar163 + fVar334 * fVar320 + fVar321 * fVar270 + fVar238 * fVar229;
        auVar300._4_4_ =
             fVar358 * fVar165 + fVar340 * fVar234 + fVar328 * fVar272 + fVar247 * fVar306;
        auVar300._8_4_ =
             fVar359 * fVar167 + fVar342 * fVar173 + fVar330 * fVar274 + fVar249 * fVar318;
        auVar300._12_4_ =
             fVar360 * fVar168 + fVar343 * fVar174 + fVar332 * fVar275 + fVar251 * fVar319;
        auVar300._16_4_ =
             fVar353 * fVar170 + fVar334 * fVar195 + fVar321 * fVar276 + fVar238 * fVar232;
        auVar300._20_4_ =
             fVar358 * fVar171 + fVar340 * fVar196 + fVar328 * fVar316 + fVar247 * fVar307;
        auVar300._24_4_ =
             fVar359 * fVar172 + fVar342 * fVar147 + fVar330 * fVar317 + fVar249 * fVar236;
        auVar300._28_4_ = fVar332 + fVar332 + fVar305 + fVar308;
        auVar324._0_4_ =
             fVar214 * fVar163 + fVar257 * fVar320 + fVar277 * fVar270 + fVar368 * fVar229;
        auVar324._4_4_ =
             fVar227 * fVar165 + fVar269 * fVar234 + fVar288 * fVar272 + fVar372 * fVar306;
        auVar324._8_4_ =
             fVar235 * fVar167 + fVar271 * fVar173 + fVar289 * fVar274 + fVar373 * fVar318;
        auVar324._12_4_ =
             fVar248 * fVar168 + fVar273 * fVar174 + fVar290 * fVar275 + fVar374 * fVar319;
        auVar324._16_4_ =
             fVar214 * fVar170 + fVar257 * fVar195 + fVar277 * fVar276 + fVar368 * fVar232;
        auVar324._20_4_ =
             fVar227 * fVar171 + fVar269 * fVar196 + fVar288 * fVar316 + fVar372 * fVar307;
        auVar324._24_4_ =
             fVar235 * fVar172 + fVar271 * fVar147 + fVar289 * fVar317 + fVar373 * fVar236;
        auVar324._28_4_ = fVar332 + fVar332 + fVar332 + fVar305;
        auVar212._0_4_ =
             fVar293 * fVar163 + fVar322 * fVar320 + fVar339 * fVar270 + fVar229 * fVar253;
        auVar212._4_4_ =
             fVar303 * fVar165 + fVar329 * fVar234 + fVar341 * fVar272 + fVar306 * fVar254;
        auVar212._8_4_ =
             fVar304 * fVar167 + fVar331 * fVar173 + fVar361 * fVar274 + fVar318 * fVar256;
        auVar212._12_4_ =
             fVar305 * fVar168 + fVar333 * fVar174 + fVar365 * fVar275 + fVar319 * fVar268;
        auVar212._16_4_ =
             fVar293 * fVar170 + fVar322 * fVar195 + fVar339 * fVar276 + fVar232 * fVar253;
        auVar212._20_4_ =
             fVar303 * fVar171 + fVar329 * fVar196 + fVar341 * fVar316 + fVar307 * fVar254;
        auVar212._24_4_ =
             fVar304 * fVar172 + fVar331 * fVar147 + fVar361 * fVar317 + fVar236 * fVar256;
        auVar212._28_4_ =
             *(float *)(bezier_basis1 + lVar143 + 0x122c) +
             *(float *)(bezier_basis1 + lVar143 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar143 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar143 + 0x1fb8);
        auVar242._8_4_ = 0x7fffffff;
        auVar242._0_8_ = 0x7fffffff7fffffff;
        auVar242._12_4_ = 0x7fffffff;
        auVar242._16_4_ = 0x7fffffff;
        auVar242._20_4_ = 0x7fffffff;
        auVar242._24_4_ = 0x7fffffff;
        auVar242._28_4_ = 0x7fffffff;
        auVar26 = vandps_avx(_local_700,auVar242);
        auVar28 = vandps_avx(auVar282,auVar242);
        auVar28 = vmaxps_avx(auVar26,auVar28);
        auVar133._4_4_ = fStack_51c;
        auVar133._0_4_ = local_520;
        auVar133._8_4_ = fStack_518;
        auVar133._12_4_ = fStack_514;
        auVar133._16_4_ = fStack_510;
        auVar133._20_4_ = fStack_50c;
        auVar133._24_4_ = fStack_508;
        auVar133._28_4_ = fStack_504;
        auVar26 = vandps_avx(auVar242,auVar133);
        auVar26 = vmaxps_avx(auVar28,auVar26);
        auVar240 = vpermilps_avx(auVar204,0);
        auVar283._16_16_ = auVar240;
        auVar283._0_16_ = auVar240;
        auVar26 = vcmpps_avx(auVar26,auVar283,1);
        auVar30 = vblendvps_avx(_local_700,local_260,auVar26);
        auVar31 = vblendvps_avx(auVar282,auVar27,auVar26);
        auVar26 = vandps_avx(auVar300,auVar242);
        auVar28 = vandps_avx(auVar324,auVar242);
        auVar32 = vmaxps_avx(auVar26,auVar28);
        auVar26 = vandps_avx(auVar212,auVar242);
        auVar26 = vmaxps_avx(auVar32,auVar26);
        auVar32 = vcmpps_avx(auVar26,auVar283,1);
        auVar26 = vblendvps_avx(auVar300,local_260,auVar32);
        auVar27 = vblendvps_avx(auVar324,auVar27,auVar32);
        fVar163 = auVar30._0_4_;
        fVar165 = auVar30._4_4_;
        fVar167 = auVar30._8_4_;
        fVar168 = auVar30._12_4_;
        fVar170 = auVar30._16_4_;
        fVar171 = auVar30._20_4_;
        fVar172 = auVar30._24_4_;
        fVar199 = auVar26._0_4_;
        fVar308 = auVar26._4_4_;
        fVar213 = auVar26._8_4_;
        fVar228 = auVar26._12_4_;
        fVar231 = auVar26._16_4_;
        fVar197 = auVar26._20_4_;
        fVar198 = auVar26._24_4_;
        fVar200 = -auVar26._28_4_;
        fVar214 = auVar31._0_4_;
        fVar253 = auVar31._4_4_;
        fVar270 = auVar31._8_4_;
        fVar276 = auVar31._12_4_;
        fVar306 = auVar31._16_4_;
        fVar307 = auVar31._20_4_;
        fVar173 = auVar31._24_4_;
        auVar153._0_4_ = fVar214 * fVar214 + fVar163 * fVar163;
        auVar153._4_4_ = fVar253 * fVar253 + fVar165 * fVar165;
        auVar153._8_4_ = fVar270 * fVar270 + fVar167 * fVar167;
        auVar153._12_4_ = fVar276 * fVar276 + fVar168 * fVar168;
        auVar153._16_4_ = fVar306 * fVar306 + fVar170 * fVar170;
        auVar153._20_4_ = fVar307 * fVar307 + fVar171 * fVar171;
        auVar153._24_4_ = fVar173 * fVar173 + fVar172 * fVar172;
        auVar153._28_4_ = auVar324._28_4_ + auVar30._28_4_;
        auVar30 = vrsqrtps_avx(auVar153);
        fVar227 = auVar30._0_4_;
        fVar235 = auVar30._4_4_;
        auVar37._4_4_ = fVar235 * 1.5;
        auVar37._0_4_ = fVar227 * 1.5;
        fVar248 = auVar30._8_4_;
        auVar37._8_4_ = fVar248 * 1.5;
        fVar254 = auVar30._12_4_;
        auVar37._12_4_ = fVar254 * 1.5;
        fVar256 = auVar30._16_4_;
        auVar37._16_4_ = fVar256 * 1.5;
        fVar268 = auVar30._20_4_;
        auVar37._20_4_ = fVar268 * 1.5;
        fVar272 = auVar30._24_4_;
        fVar147 = auVar28._28_4_;
        auVar37._24_4_ = fVar272 * 1.5;
        auVar37._28_4_ = fVar147;
        auVar38._4_4_ = fVar235 * fVar235 * fVar235 * auVar153._4_4_ * 0.5;
        auVar38._0_4_ = fVar227 * fVar227 * fVar227 * auVar153._0_4_ * 0.5;
        auVar38._8_4_ = fVar248 * fVar248 * fVar248 * auVar153._8_4_ * 0.5;
        auVar38._12_4_ = fVar254 * fVar254 * fVar254 * auVar153._12_4_ * 0.5;
        auVar38._16_4_ = fVar256 * fVar256 * fVar256 * auVar153._16_4_ * 0.5;
        auVar38._20_4_ = fVar268 * fVar268 * fVar268 * auVar153._20_4_ * 0.5;
        auVar38._24_4_ = fVar272 * fVar272 * fVar272 * auVar153._24_4_ * 0.5;
        auVar38._28_4_ = auVar153._28_4_;
        auVar28 = vsubps_avx(auVar37,auVar38);
        fVar227 = auVar28._0_4_;
        fVar254 = auVar28._4_4_;
        fVar272 = auVar28._8_4_;
        fVar316 = auVar28._12_4_;
        fVar318 = auVar28._16_4_;
        fVar236 = auVar28._20_4_;
        fVar174 = auVar28._24_4_;
        fVar235 = auVar27._0_4_;
        fVar256 = auVar27._4_4_;
        fVar274 = auVar27._8_4_;
        fVar317 = auVar27._12_4_;
        fVar319 = auVar27._16_4_;
        fVar320 = auVar27._20_4_;
        fVar195 = auVar27._24_4_;
        auVar154._0_4_ = fVar235 * fVar235 + fVar199 * fVar199;
        auVar154._4_4_ = fVar256 * fVar256 + fVar308 * fVar308;
        auVar154._8_4_ = fVar274 * fVar274 + fVar213 * fVar213;
        auVar154._12_4_ = fVar317 * fVar317 + fVar228 * fVar228;
        auVar154._16_4_ = fVar319 * fVar319 + fVar231 * fVar231;
        auVar154._20_4_ = fVar320 * fVar320 + fVar197 * fVar197;
        auVar154._24_4_ = fVar195 * fVar195 + fVar198 * fVar198;
        auVar154._28_4_ = auVar26._28_4_ + auVar28._28_4_;
        auVar26 = vrsqrtps_avx(auVar154);
        fVar248 = auVar26._0_4_;
        fVar268 = auVar26._4_4_;
        auVar39._4_4_ = fVar268 * 1.5;
        auVar39._0_4_ = fVar248 * 1.5;
        fVar275 = auVar26._8_4_;
        auVar39._8_4_ = fVar275 * 1.5;
        fVar229 = auVar26._12_4_;
        auVar39._12_4_ = fVar229 * 1.5;
        fVar232 = auVar26._16_4_;
        auVar39._16_4_ = fVar232 * 1.5;
        fVar234 = auVar26._20_4_;
        auVar39._20_4_ = fVar234 * 1.5;
        fVar196 = auVar26._24_4_;
        auVar39._24_4_ = fVar196 * 1.5;
        auVar39._28_4_ = fVar147;
        auVar40._4_4_ = fVar268 * fVar268 * fVar268 * auVar154._4_4_ * 0.5;
        auVar40._0_4_ = fVar248 * fVar248 * fVar248 * auVar154._0_4_ * 0.5;
        auVar40._8_4_ = fVar275 * fVar275 * fVar275 * auVar154._8_4_ * 0.5;
        auVar40._12_4_ = fVar229 * fVar229 * fVar229 * auVar154._12_4_ * 0.5;
        auVar40._16_4_ = fVar232 * fVar232 * fVar232 * auVar154._16_4_ * 0.5;
        auVar40._20_4_ = fVar234 * fVar234 * fVar234 * auVar154._20_4_ * 0.5;
        auVar40._24_4_ = fVar196 * fVar196 * fVar196 * auVar154._24_4_ * 0.5;
        auVar40._28_4_ = auVar154._28_4_;
        auVar26 = vsubps_avx(auVar39,auVar40);
        fVar248 = auVar26._0_4_;
        fVar268 = auVar26._4_4_;
        fVar275 = auVar26._8_4_;
        fVar229 = auVar26._12_4_;
        fVar232 = auVar26._16_4_;
        fVar234 = auVar26._20_4_;
        fVar196 = auVar26._24_4_;
        fVar214 = (float)local_840._0_4_ * fVar214 * fVar227;
        fVar253 = (float)local_840._4_4_ * fVar253 * fVar254;
        auVar41._4_4_ = fVar253;
        auVar41._0_4_ = fVar214;
        fVar270 = fStack_838 * fVar270 * fVar272;
        auVar41._8_4_ = fVar270;
        fVar276 = fStack_834 * fVar276 * fVar316;
        auVar41._12_4_ = fVar276;
        fVar306 = fStack_830 * fVar306 * fVar318;
        auVar41._16_4_ = fVar306;
        fVar307 = fStack_82c * fVar307 * fVar236;
        auVar41._20_4_ = fVar307;
        fVar173 = fStack_828 * fVar173 * fVar174;
        auVar41._24_4_ = fVar173;
        auVar41._28_4_ = fVar200;
        local_700._4_4_ = auVar348._4_4_ + fVar253;
        local_700._0_4_ = auVar348._0_4_ + fVar214;
        fStack_6f8 = auVar348._8_4_ + fVar270;
        fStack_6f4 = auVar348._12_4_ + fVar276;
        fStack_6f0 = auVar348._16_4_ + fVar306;
        fStack_6ec = auVar348._20_4_ + fVar307;
        fStack_6e8 = auVar348._24_4_ + fVar173;
        fStack_6e4 = auVar348._28_4_ + fVar200;
        fVar214 = (float)local_840._0_4_ * fVar227 * -fVar163;
        fVar253 = (float)local_840._4_4_ * fVar254 * -fVar165;
        auVar42._4_4_ = fVar253;
        auVar42._0_4_ = fVar214;
        fVar270 = fStack_838 * fVar272 * -fVar167;
        auVar42._8_4_ = fVar270;
        fVar276 = fStack_834 * fVar316 * -fVar168;
        auVar42._12_4_ = fVar276;
        fVar306 = fStack_830 * fVar318 * -fVar170;
        auVar42._16_4_ = fVar306;
        fVar307 = fStack_82c * fVar236 * -fVar171;
        auVar42._20_4_ = fVar307;
        fVar173 = fStack_828 * fVar174 * -fVar172;
        auVar42._24_4_ = fVar173;
        auVar42._28_4_ = fVar147;
        local_5e0._4_4_ = fVar253 + auVar313._4_4_;
        local_5e0._0_4_ = fVar214 + auVar313._0_4_;
        fStack_5d8 = fVar270 + auVar313._8_4_;
        fStack_5d4 = fVar276 + auVar313._12_4_;
        fStack_5d0 = fVar306 + auVar313._16_4_;
        fStack_5cc = fVar307 + auVar313._20_4_;
        fStack_5c8 = fVar173 + auVar313._24_4_;
        fStack_5c4 = fVar147 + 0.0;
        fVar214 = fVar227 * 0.0 * (float)local_840._0_4_;
        fVar227 = fVar254 * 0.0 * (float)local_840._4_4_;
        auVar43._4_4_ = fVar227;
        auVar43._0_4_ = fVar214;
        fVar253 = fVar272 * 0.0 * fStack_838;
        auVar43._8_4_ = fVar253;
        fVar254 = fVar316 * 0.0 * fStack_834;
        auVar43._12_4_ = fVar254;
        fVar270 = fVar318 * 0.0 * fStack_830;
        auVar43._16_4_ = fVar270;
        fVar272 = fVar236 * 0.0 * fStack_82c;
        auVar43._20_4_ = fVar272;
        fVar276 = fVar174 * 0.0 * fStack_828;
        auVar43._24_4_ = fVar276;
        auVar43._28_4_ = fVar360;
        auVar131._4_4_ = fVar291;
        auVar131._0_4_ = fVar255;
        auVar131._8_4_ = fVar164;
        auVar131._12_4_ = fVar166;
        auVar131._16_4_ = fStack_5b0;
        auVar131._20_4_ = fStack_5ac;
        auVar131._24_4_ = fStack_5a8;
        auVar131._28_4_ = fStack_5a4;
        auVar284._0_4_ = fVar214 + fVar255;
        auVar284._4_4_ = fVar227 + fVar291;
        auVar284._8_4_ = fVar253 + fVar164;
        auVar284._12_4_ = fVar254 + fVar166;
        auVar284._16_4_ = fVar270 + fStack_5b0;
        auVar284._20_4_ = fVar272 + fStack_5ac;
        auVar284._24_4_ = fVar276 + fStack_5a8;
        auVar284._28_4_ = fVar360 + fStack_5a4;
        fVar214 = auVar263._0_4_ * fVar235 * fVar248;
        fVar227 = auVar263._4_4_ * fVar256 * fVar268;
        auVar44._4_4_ = fVar227;
        auVar44._0_4_ = fVar214;
        fVar235 = auVar263._8_4_ * fVar274 * fVar275;
        auVar44._8_4_ = fVar235;
        fVar253 = auVar263._12_4_ * fVar317 * fVar229;
        auVar44._12_4_ = fVar253;
        fVar254 = auVar263._16_4_ * fVar319 * fVar232;
        auVar44._16_4_ = fVar254;
        fVar256 = auVar263._20_4_ * fVar320 * fVar234;
        auVar44._20_4_ = fVar256;
        fVar270 = auVar263._24_4_ * fVar195 * fVar196;
        auVar44._24_4_ = fVar270;
        auVar44._28_4_ = auVar27._28_4_;
        auVar24 = vsubps_avx(auVar348,auVar41);
        auVar325._0_4_ = auVar241._0_4_ + fVar214;
        auVar325._4_4_ = auVar241._4_4_ + fVar227;
        auVar325._8_4_ = auVar241._8_4_ + fVar235;
        auVar325._12_4_ = auVar241._12_4_ + fVar253;
        auVar325._16_4_ = auVar241._16_4_ + fVar254;
        auVar325._20_4_ = auVar241._20_4_ + fVar256;
        auVar325._24_4_ = auVar241._24_4_ + fVar270;
        auVar325._28_4_ = auVar241._28_4_ + auVar27._28_4_;
        fVar214 = auVar263._0_4_ * fVar248 * -fVar199;
        fVar227 = auVar263._4_4_ * fVar268 * -fVar308;
        auVar45._4_4_ = fVar227;
        auVar45._0_4_ = fVar214;
        fVar235 = auVar263._8_4_ * fVar275 * -fVar213;
        auVar45._8_4_ = fVar235;
        fVar253 = auVar263._12_4_ * fVar229 * -fVar228;
        auVar45._12_4_ = fVar253;
        fVar254 = auVar263._16_4_ * fVar232 * -fVar231;
        auVar45._16_4_ = fVar254;
        fVar256 = auVar263._20_4_ * fVar234 * -fVar197;
        auVar45._20_4_ = fVar256;
        fVar270 = auVar263._24_4_ * fVar196 * -fVar198;
        auVar45._24_4_ = fVar270;
        auVar45._28_4_ = fVar333;
        auVar151 = vsubps_avx(auVar313,auVar42);
        auVar336._0_4_ = fVar214 + auVar219._0_4_;
        auVar336._4_4_ = fVar227 + auVar219._4_4_;
        auVar336._8_4_ = fVar235 + auVar219._8_4_;
        auVar336._12_4_ = fVar253 + auVar219._12_4_;
        auVar336._16_4_ = fVar254 + auVar219._16_4_;
        auVar336._20_4_ = fVar256 + auVar219._20_4_;
        auVar336._24_4_ = fVar270 + auVar219._24_4_;
        auVar336._28_4_ = fVar333 + auVar219._28_4_;
        fVar214 = auVar263._0_4_ * fVar248 * 0.0;
        fVar227 = auVar263._4_4_ * fVar268 * 0.0;
        auVar46._4_4_ = fVar227;
        auVar46._0_4_ = fVar214;
        fVar235 = auVar263._8_4_ * fVar275 * 0.0;
        auVar46._8_4_ = fVar235;
        fVar248 = auVar263._12_4_ * fVar229 * 0.0;
        auVar46._12_4_ = fVar248;
        fVar253 = auVar263._16_4_ * fVar232 * 0.0;
        auVar46._16_4_ = fVar253;
        fVar254 = auVar263._20_4_ * fVar234 * 0.0;
        auVar46._20_4_ = fVar254;
        fVar256 = auVar263._24_4_ * fVar196 * 0.0;
        auVar46._24_4_ = fVar256;
        auVar46._28_4_ = 0x3f000000;
        auVar181 = vsubps_avx(auVar131,auVar43);
        auVar363._0_4_ = fVar214 + (float)local_240._0_4_;
        auVar363._4_4_ = fVar227 + (float)local_240._4_4_;
        auVar363._8_4_ = fVar235 + fStack_238;
        auVar363._12_4_ = fVar248 + fStack_234;
        auVar363._16_4_ = fVar253 + fStack_230;
        auVar363._20_4_ = fVar254 + fStack_22c;
        auVar363._24_4_ = fVar256 + fStack_228;
        auVar363._28_4_ = fStack_224 + 0.5;
        auVar26 = vsubps_avx(auVar241,auVar44);
        auVar27 = vsubps_avx(auVar219,auVar45);
        auVar182 = vsubps_avx(_local_240,auVar46);
        auVar28 = vsubps_avx(auVar336,auVar151);
        auVar30 = vsubps_avx(auVar363,auVar181);
        auVar47._4_4_ = auVar181._4_4_ * auVar28._4_4_;
        auVar47._0_4_ = auVar181._0_4_ * auVar28._0_4_;
        auVar47._8_4_ = auVar181._8_4_ * auVar28._8_4_;
        auVar47._12_4_ = auVar181._12_4_ * auVar28._12_4_;
        auVar47._16_4_ = auVar181._16_4_ * auVar28._16_4_;
        auVar47._20_4_ = auVar181._20_4_ * auVar28._20_4_;
        auVar47._24_4_ = auVar181._24_4_ * auVar28._24_4_;
        auVar47._28_4_ = fVar290;
        auVar48._4_4_ = auVar151._4_4_ * auVar30._4_4_;
        auVar48._0_4_ = auVar151._0_4_ * auVar30._0_4_;
        auVar48._8_4_ = auVar151._8_4_ * auVar30._8_4_;
        auVar48._12_4_ = auVar151._12_4_ * auVar30._12_4_;
        auVar48._16_4_ = auVar151._16_4_ * auVar30._16_4_;
        auVar48._20_4_ = auVar151._20_4_ * auVar30._20_4_;
        auVar48._24_4_ = auVar151._24_4_ * auVar30._24_4_;
        auVar48._28_4_ = auVar219._28_4_;
        auVar31 = vsubps_avx(auVar48,auVar47);
        auVar49._4_4_ = auVar24._4_4_ * auVar30._4_4_;
        auVar49._0_4_ = auVar24._0_4_ * auVar30._0_4_;
        auVar49._8_4_ = auVar24._8_4_ * auVar30._8_4_;
        auVar49._12_4_ = auVar24._12_4_ * auVar30._12_4_;
        auVar49._16_4_ = auVar24._16_4_ * auVar30._16_4_;
        auVar49._20_4_ = auVar24._20_4_ * auVar30._20_4_;
        auVar49._24_4_ = auVar24._24_4_ * auVar30._24_4_;
        auVar49._28_4_ = auVar30._28_4_;
        auVar32 = vsubps_avx(auVar325,auVar24);
        auVar50._4_4_ = auVar181._4_4_ * auVar32._4_4_;
        auVar50._0_4_ = auVar181._0_4_ * auVar32._0_4_;
        auVar50._8_4_ = auVar181._8_4_ * auVar32._8_4_;
        auVar50._12_4_ = auVar181._12_4_ * auVar32._12_4_;
        auVar50._16_4_ = auVar181._16_4_ * auVar32._16_4_;
        auVar50._20_4_ = auVar181._20_4_ * auVar32._20_4_;
        auVar50._24_4_ = auVar181._24_4_ * auVar32._24_4_;
        auVar50._28_4_ = auVar241._28_4_;
        auVar152 = vsubps_avx(auVar50,auVar49);
        auVar51._4_4_ = auVar32._4_4_ * auVar151._4_4_;
        auVar51._0_4_ = auVar32._0_4_ * auVar151._0_4_;
        auVar51._8_4_ = auVar32._8_4_ * auVar151._8_4_;
        auVar51._12_4_ = auVar32._12_4_ * auVar151._12_4_;
        auVar51._16_4_ = auVar32._16_4_ * auVar151._16_4_;
        auVar51._20_4_ = auVar32._20_4_ * auVar151._20_4_;
        auVar51._24_4_ = auVar32._24_4_ * auVar151._24_4_;
        auVar51._28_4_ = auVar30._28_4_;
        auVar52._4_4_ = auVar24._4_4_ * auVar28._4_4_;
        auVar52._0_4_ = auVar24._0_4_ * auVar28._0_4_;
        auVar52._8_4_ = auVar24._8_4_ * auVar28._8_4_;
        auVar52._12_4_ = auVar24._12_4_ * auVar28._12_4_;
        auVar52._16_4_ = auVar24._16_4_ * auVar28._16_4_;
        auVar52._20_4_ = auVar24._20_4_ * auVar28._20_4_;
        auVar52._24_4_ = auVar24._24_4_ * auVar28._24_4_;
        auVar52._28_4_ = auVar28._28_4_;
        auVar28 = vsubps_avx(auVar52,auVar51);
        auVar155._0_4_ = auVar31._0_4_ * 0.0 + auVar28._0_4_ + auVar152._0_4_ * 0.0;
        auVar155._4_4_ = auVar31._4_4_ * 0.0 + auVar28._4_4_ + auVar152._4_4_ * 0.0;
        auVar155._8_4_ = auVar31._8_4_ * 0.0 + auVar28._8_4_ + auVar152._8_4_ * 0.0;
        auVar155._12_4_ = auVar31._12_4_ * 0.0 + auVar28._12_4_ + auVar152._12_4_ * 0.0;
        auVar155._16_4_ = auVar31._16_4_ * 0.0 + auVar28._16_4_ + auVar152._16_4_ * 0.0;
        auVar155._20_4_ = auVar31._20_4_ * 0.0 + auVar28._20_4_ + auVar152._20_4_ * 0.0;
        auVar155._24_4_ = auVar31._24_4_ * 0.0 + auVar28._24_4_ + auVar152._24_4_ * 0.0;
        auVar155._28_4_ = auVar28._28_4_ + auVar28._28_4_ + auVar152._28_4_;
        auVar152 = vcmpps_avx(auVar155,ZEXT432(0) << 0x20,2);
        auVar26 = vblendvps_avx(auVar26,_local_700,auVar152);
        auVar27 = vblendvps_avx(auVar27,_local_5e0,auVar152);
        auVar28 = vblendvps_avx(auVar182,auVar284,auVar152);
        auVar30 = vblendvps_avx(auVar24,auVar325,auVar152);
        auVar31 = vblendvps_avx(auVar151,auVar336,auVar152);
        auVar32 = vblendvps_avx(auVar181,auVar363,auVar152);
        auVar24 = vblendvps_avx(auVar325,auVar24,auVar152);
        auVar151 = vblendvps_avx(auVar336,auVar151,auVar152);
        _local_7a0 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
        auStack_790 = auVar25._16_16_;
        auVar25 = vblendvps_avx(auVar363,auVar181,auVar152);
        auVar24 = vsubps_avx(auVar24,auVar26);
        auVar181 = vsubps_avx(auVar151,auVar27);
        auVar183 = vsubps_avx(auVar25,auVar28);
        auVar25 = vsubps_avx(auVar27,auVar31);
        fVar214 = auVar181._0_4_;
        fVar172 = auVar28._0_4_;
        fVar254 = auVar181._4_4_;
        fVar255 = auVar28._4_4_;
        auVar53._4_4_ = fVar255 * fVar254;
        auVar53._0_4_ = fVar172 * fVar214;
        fVar274 = auVar181._8_4_;
        fVar291 = auVar28._8_4_;
        auVar53._8_4_ = fVar291 * fVar274;
        fVar229 = auVar181._12_4_;
        fVar164 = auVar28._12_4_;
        auVar53._12_4_ = fVar164 * fVar229;
        fVar307 = auVar181._16_4_;
        fVar166 = auVar28._16_4_;
        auVar53._16_4_ = fVar166 * fVar307;
        fVar174 = auVar181._20_4_;
        fVar199 = auVar28._20_4_;
        auVar53._20_4_ = fVar199 * fVar174;
        fVar165 = auVar181._24_4_;
        fVar308 = auVar28._24_4_;
        auVar53._24_4_ = fVar308 * fVar165;
        auVar53._28_4_ = auVar151._28_4_;
        fVar227 = auVar27._0_4_;
        fVar238 = auVar183._0_4_;
        fVar256 = auVar27._4_4_;
        fVar247 = auVar183._4_4_;
        auVar54._4_4_ = fVar247 * fVar256;
        auVar54._0_4_ = fVar238 * fVar227;
        fVar275 = auVar27._8_4_;
        fVar249 = auVar183._8_4_;
        auVar54._8_4_ = fVar249 * fVar275;
        fVar306 = auVar27._12_4_;
        fVar251 = auVar183._12_4_;
        auVar54._12_4_ = fVar251 * fVar306;
        fVar236 = auVar27._16_4_;
        fVar257 = auVar183._16_4_;
        auVar54._16_4_ = fVar257 * fVar236;
        fVar195 = auVar27._20_4_;
        fVar269 = auVar183._20_4_;
        auVar54._20_4_ = fVar269 * fVar195;
        fVar167 = auVar27._24_4_;
        fVar271 = auVar183._24_4_;
        uVar8 = auVar182._28_4_;
        auVar54._24_4_ = fVar271 * fVar167;
        auVar54._28_4_ = uVar8;
        auVar151 = vsubps_avx(auVar54,auVar53);
        fVar235 = auVar26._0_4_;
        fVar268 = auVar26._4_4_;
        auVar55._4_4_ = fVar247 * fVar268;
        auVar55._0_4_ = fVar238 * fVar235;
        fVar276 = auVar26._8_4_;
        auVar55._8_4_ = fVar249 * fVar276;
        fVar318 = auVar26._12_4_;
        auVar55._12_4_ = fVar251 * fVar318;
        fVar320 = auVar26._16_4_;
        auVar55._16_4_ = fVar257 * fVar320;
        fVar196 = auVar26._20_4_;
        auVar55._20_4_ = fVar269 * fVar196;
        fVar168 = auVar26._24_4_;
        auVar55._24_4_ = fVar271 * fVar168;
        auVar55._28_4_ = uVar8;
        fVar248 = auVar24._0_4_;
        fVar270 = auVar24._4_4_;
        auVar56._4_4_ = fVar255 * fVar270;
        auVar56._0_4_ = fVar172 * fVar248;
        fVar316 = auVar24._8_4_;
        auVar56._8_4_ = fVar291 * fVar316;
        fVar319 = auVar24._12_4_;
        auVar56._12_4_ = fVar164 * fVar319;
        fVar234 = auVar24._16_4_;
        auVar56._16_4_ = fVar166 * fVar234;
        fVar147 = auVar24._20_4_;
        auVar56._20_4_ = fVar199 * fVar147;
        fVar170 = auVar24._24_4_;
        auVar56._24_4_ = fVar308 * fVar170;
        auVar56._28_4_ = auVar363._28_4_;
        auVar182 = vsubps_avx(auVar56,auVar55);
        auVar57._4_4_ = fVar256 * fVar270;
        auVar57._0_4_ = fVar227 * fVar248;
        auVar57._8_4_ = fVar275 * fVar316;
        auVar57._12_4_ = fVar306 * fVar319;
        auVar57._16_4_ = fVar236 * fVar234;
        auVar57._20_4_ = fVar195 * fVar147;
        auVar57._24_4_ = fVar167 * fVar170;
        auVar57._28_4_ = uVar8;
        auVar369._0_4_ = fVar235 * fVar214;
        auVar369._4_4_ = fVar268 * fVar254;
        auVar369._8_4_ = fVar276 * fVar274;
        auVar369._12_4_ = fVar318 * fVar229;
        auVar369._16_4_ = fVar320 * fVar307;
        auVar369._20_4_ = fVar196 * fVar174;
        auVar369._24_4_ = fVar168 * fVar165;
        auVar369._28_4_ = 0;
        auVar184 = vsubps_avx(auVar369,auVar57);
        auVar209 = vsubps_avx(auVar28,auVar32);
        fVar253 = auVar184._28_4_ + auVar182._28_4_;
        auVar185._0_4_ = auVar184._0_4_ + auVar182._0_4_ * 0.0 + auVar151._0_4_ * 0.0;
        auVar185._4_4_ = auVar184._4_4_ + auVar182._4_4_ * 0.0 + auVar151._4_4_ * 0.0;
        auVar185._8_4_ = auVar184._8_4_ + auVar182._8_4_ * 0.0 + auVar151._8_4_ * 0.0;
        auVar185._12_4_ = auVar184._12_4_ + auVar182._12_4_ * 0.0 + auVar151._12_4_ * 0.0;
        auVar185._16_4_ = auVar184._16_4_ + auVar182._16_4_ * 0.0 + auVar151._16_4_ * 0.0;
        auVar185._20_4_ = auVar184._20_4_ + auVar182._20_4_ * 0.0 + auVar151._20_4_ * 0.0;
        auVar185._24_4_ = auVar184._24_4_ + auVar182._24_4_ * 0.0 + auVar151._24_4_ * 0.0;
        auVar185._28_4_ = fVar253 + auVar151._28_4_;
        fVar213 = auVar25._0_4_;
        fVar228 = auVar25._4_4_;
        auVar58._4_4_ = fVar228 * auVar32._4_4_;
        auVar58._0_4_ = fVar213 * auVar32._0_4_;
        fVar231 = auVar25._8_4_;
        auVar58._8_4_ = fVar231 * auVar32._8_4_;
        fVar197 = auVar25._12_4_;
        auVar58._12_4_ = fVar197 * auVar32._12_4_;
        fVar198 = auVar25._16_4_;
        auVar58._16_4_ = fVar198 * auVar32._16_4_;
        fVar200 = auVar25._20_4_;
        auVar58._20_4_ = fVar200 * auVar32._20_4_;
        fVar292 = auVar25._24_4_;
        auVar58._24_4_ = fVar292 * auVar32._24_4_;
        auVar58._28_4_ = fVar253;
        fVar253 = auVar209._0_4_;
        fVar272 = auVar209._4_4_;
        auVar59._4_4_ = auVar31._4_4_ * fVar272;
        auVar59._0_4_ = auVar31._0_4_ * fVar253;
        fVar317 = auVar209._8_4_;
        auVar59._8_4_ = auVar31._8_4_ * fVar317;
        fVar232 = auVar209._12_4_;
        auVar59._12_4_ = auVar31._12_4_ * fVar232;
        fVar173 = auVar209._16_4_;
        auVar59._16_4_ = auVar31._16_4_ * fVar173;
        fVar163 = auVar209._20_4_;
        auVar59._20_4_ = auVar31._20_4_ * fVar163;
        fVar171 = auVar209._24_4_;
        auVar59._24_4_ = auVar31._24_4_ * fVar171;
        auVar59._28_4_ = auVar184._28_4_;
        auVar25 = vsubps_avx(auVar59,auVar58);
        auVar182 = vsubps_avx(auVar26,auVar30);
        fVar273 = auVar182._0_4_;
        fVar277 = auVar182._4_4_;
        auVar60._4_4_ = fVar277 * auVar32._4_4_;
        auVar60._0_4_ = fVar273 * auVar32._0_4_;
        fVar288 = auVar182._8_4_;
        auVar60._8_4_ = fVar288 * auVar32._8_4_;
        fVar289 = auVar182._12_4_;
        auVar60._12_4_ = fVar289 * auVar32._12_4_;
        fVar290 = auVar182._16_4_;
        auVar60._16_4_ = fVar290 * auVar32._16_4_;
        fVar293 = auVar182._20_4_;
        auVar60._20_4_ = fVar293 * auVar32._20_4_;
        fVar303 = auVar182._24_4_;
        auVar60._24_4_ = fVar303 * auVar32._24_4_;
        auVar60._28_4_ = auVar32._28_4_;
        auVar61._4_4_ = auVar30._4_4_ * fVar272;
        auVar61._0_4_ = auVar30._0_4_ * fVar253;
        auVar61._8_4_ = auVar30._8_4_ * fVar317;
        auVar61._12_4_ = auVar30._12_4_ * fVar232;
        auVar61._16_4_ = auVar30._16_4_ * fVar173;
        auVar61._20_4_ = auVar30._20_4_ * fVar163;
        auVar61._24_4_ = auVar30._24_4_ * fVar171;
        auVar61._28_4_ = auVar151._28_4_;
        auVar151 = vsubps_avx(auVar60,auVar61);
        auVar62._4_4_ = auVar31._4_4_ * fVar277;
        auVar62._0_4_ = auVar31._0_4_ * fVar273;
        auVar62._8_4_ = auVar31._8_4_ * fVar288;
        auVar62._12_4_ = auVar31._12_4_ * fVar289;
        auVar62._16_4_ = auVar31._16_4_ * fVar290;
        auVar62._20_4_ = auVar31._20_4_ * fVar293;
        auVar62._24_4_ = auVar31._24_4_ * fVar303;
        auVar62._28_4_ = auVar32._28_4_;
        auVar63._4_4_ = auVar30._4_4_ * fVar228;
        auVar63._0_4_ = auVar30._0_4_ * fVar213;
        auVar63._8_4_ = auVar30._8_4_ * fVar231;
        auVar63._12_4_ = auVar30._12_4_ * fVar197;
        auVar63._16_4_ = auVar30._16_4_ * fVar198;
        auVar63._20_4_ = auVar30._20_4_ * fVar200;
        auVar63._24_4_ = auVar30._24_4_ * fVar292;
        auVar63._28_4_ = auVar30._28_4_;
        auVar30 = vsubps_avx(auVar63,auVar62);
        auVar346 = ZEXT864(0) << 0x20;
        auVar243._0_4_ = auVar25._0_4_ * 0.0 + auVar30._0_4_ + auVar151._0_4_ * 0.0;
        auVar243._4_4_ = auVar25._4_4_ * 0.0 + auVar30._4_4_ + auVar151._4_4_ * 0.0;
        auVar243._8_4_ = auVar25._8_4_ * 0.0 + auVar30._8_4_ + auVar151._8_4_ * 0.0;
        auVar243._12_4_ = auVar25._12_4_ * 0.0 + auVar30._12_4_ + auVar151._12_4_ * 0.0;
        auVar243._16_4_ = auVar25._16_4_ * 0.0 + auVar30._16_4_ + auVar151._16_4_ * 0.0;
        auVar243._20_4_ = auVar25._20_4_ * 0.0 + auVar30._20_4_ + auVar151._20_4_ * 0.0;
        auVar243._24_4_ = auVar25._24_4_ * 0.0 + auVar30._24_4_ + auVar151._24_4_ * 0.0;
        auVar243._28_4_ = auVar30._28_4_ + auVar30._28_4_ + auVar151._28_4_;
        auVar25 = vmaxps_avx(auVar185,auVar243);
        auVar25 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,2);
        auVar240 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
        auVar240 = vpand_avx(auVar240,_local_7a0);
        auVar204 = vpmovsxwd_avx(auVar240);
        auVar169 = vpunpckhwd_avx(auVar240,auVar240);
        auVar221._16_16_ = auVar169;
        auVar221._0_16_ = auVar204;
        if ((((((((auVar221 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar221 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar221 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar221 >> 0x7f,0) == '\0') &&
              (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar169 >> 0x3f,0) == '\0') &&
            (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar169[0xf]) {
LAB_0118e7e8:
          auVar315 = ZEXT3264(auVar312);
          auVar302 = ZEXT3264(auVar150);
          auVar162 = ZEXT3264(CONCAT824(uStack_528,
                                        CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
          auVar224 = ZEXT3264(auVar221);
        }
        else {
          auVar64._4_4_ = fVar272 * fVar254;
          auVar64._0_4_ = fVar253 * fVar214;
          auVar64._8_4_ = fVar317 * fVar274;
          auVar64._12_4_ = fVar232 * fVar229;
          auVar64._16_4_ = fVar173 * fVar307;
          auVar64._20_4_ = fVar163 * fVar174;
          auVar64._24_4_ = fVar171 * fVar165;
          auVar64._28_4_ = auVar169._12_4_;
          auVar349._0_4_ = fVar213 * fVar238;
          auVar349._4_4_ = fVar228 * fVar247;
          auVar349._8_4_ = fVar231 * fVar249;
          auVar349._12_4_ = fVar197 * fVar251;
          auVar349._16_4_ = fVar198 * fVar257;
          auVar349._20_4_ = fVar200 * fVar269;
          auVar349._24_4_ = fVar292 * fVar271;
          auVar349._28_4_ = 0;
          auVar25 = vsubps_avx(auVar349,auVar64);
          auVar65._4_4_ = fVar277 * fVar247;
          auVar65._0_4_ = fVar273 * fVar238;
          auVar65._8_4_ = fVar288 * fVar249;
          auVar65._12_4_ = fVar289 * fVar251;
          auVar65._16_4_ = fVar290 * fVar257;
          auVar65._20_4_ = fVar293 * fVar269;
          auVar65._24_4_ = fVar303 * fVar271;
          auVar65._28_4_ = auVar183._28_4_;
          auVar66._4_4_ = fVar272 * fVar270;
          auVar66._0_4_ = fVar253 * fVar248;
          auVar66._8_4_ = fVar317 * fVar316;
          auVar66._12_4_ = fVar232 * fVar319;
          auVar66._16_4_ = fVar173 * fVar234;
          auVar66._20_4_ = fVar163 * fVar147;
          auVar66._24_4_ = fVar171 * fVar170;
          auVar66._28_4_ = auVar209._28_4_;
          auVar31 = vsubps_avx(auVar66,auVar65);
          auVar67._4_4_ = fVar228 * fVar270;
          auVar67._0_4_ = fVar213 * fVar248;
          auVar67._8_4_ = fVar231 * fVar316;
          auVar67._12_4_ = fVar197 * fVar319;
          auVar67._16_4_ = fVar198 * fVar234;
          auVar67._20_4_ = fVar200 * fVar147;
          auVar67._24_4_ = fVar292 * fVar170;
          auVar67._28_4_ = auVar185._28_4_;
          auVar68._4_4_ = fVar277 * fVar254;
          auVar68._0_4_ = fVar273 * fVar214;
          auVar68._8_4_ = fVar288 * fVar274;
          auVar68._12_4_ = fVar289 * fVar229;
          auVar68._16_4_ = fVar290 * fVar307;
          auVar68._20_4_ = fVar293 * fVar174;
          auVar68._24_4_ = fVar303 * fVar165;
          auVar68._28_4_ = auVar181._28_4_;
          auVar32 = vsubps_avx(auVar68,auVar67);
          auVar301._0_4_ = auVar25._0_4_ * 0.0 + auVar32._0_4_ + auVar31._0_4_ * 0.0;
          auVar301._4_4_ = auVar25._4_4_ * 0.0 + auVar32._4_4_ + auVar31._4_4_ * 0.0;
          auVar301._8_4_ = auVar25._8_4_ * 0.0 + auVar32._8_4_ + auVar31._8_4_ * 0.0;
          auVar301._12_4_ = auVar25._12_4_ * 0.0 + auVar32._12_4_ + auVar31._12_4_ * 0.0;
          auVar301._16_4_ = auVar25._16_4_ * 0.0 + auVar32._16_4_ + auVar31._16_4_ * 0.0;
          auVar301._20_4_ = auVar25._20_4_ * 0.0 + auVar32._20_4_ + auVar31._20_4_ * 0.0;
          auVar301._24_4_ = auVar25._24_4_ * 0.0 + auVar32._24_4_ + auVar31._24_4_ * 0.0;
          auVar301._28_4_ = auVar181._28_4_ + auVar32._28_4_ + auVar185._28_4_;
          auVar30 = vrcpps_avx(auVar301);
          fVar214 = auVar30._0_4_;
          fVar248 = auVar30._4_4_;
          auVar69._4_4_ = auVar301._4_4_ * fVar248;
          auVar69._0_4_ = auVar301._0_4_ * fVar214;
          fVar253 = auVar30._8_4_;
          auVar69._8_4_ = auVar301._8_4_ * fVar253;
          fVar254 = auVar30._12_4_;
          auVar69._12_4_ = auVar301._12_4_ * fVar254;
          fVar270 = auVar30._16_4_;
          auVar69._16_4_ = auVar301._16_4_ * fVar270;
          fVar272 = auVar30._20_4_;
          auVar69._20_4_ = auVar301._20_4_ * fVar272;
          fVar274 = auVar30._24_4_;
          auVar69._24_4_ = auVar301._24_4_ * fVar274;
          auVar69._28_4_ = auVar209._28_4_;
          auVar350._8_4_ = 0x3f800000;
          auVar350._0_8_ = &DAT_3f8000003f800000;
          auVar350._12_4_ = 0x3f800000;
          auVar350._16_4_ = 0x3f800000;
          auVar350._20_4_ = 0x3f800000;
          auVar350._24_4_ = 0x3f800000;
          auVar350._28_4_ = 0x3f800000;
          auVar151 = vsubps_avx(auVar350,auVar69);
          fVar214 = auVar151._0_4_ * fVar214 + fVar214;
          fVar248 = auVar151._4_4_ * fVar248 + fVar248;
          fVar253 = auVar151._8_4_ * fVar253 + fVar253;
          fVar254 = auVar151._12_4_ * fVar254 + fVar254;
          fVar270 = auVar151._16_4_ * fVar270 + fVar270;
          fVar272 = auVar151._20_4_ * fVar272 + fVar272;
          fVar274 = auVar151._24_4_ * fVar274 + fVar274;
          auVar70._4_4_ =
               (auVar25._4_4_ * fVar268 + auVar31._4_4_ * fVar256 + auVar32._4_4_ * fVar255) *
               fVar248;
          auVar70._0_4_ =
               (auVar25._0_4_ * fVar235 + auVar31._0_4_ * fVar227 + auVar32._0_4_ * fVar172) *
               fVar214;
          auVar70._8_4_ =
               (auVar25._8_4_ * fVar276 + auVar31._8_4_ * fVar275 + auVar32._8_4_ * fVar291) *
               fVar253;
          auVar70._12_4_ =
               (auVar25._12_4_ * fVar318 + auVar31._12_4_ * fVar306 + auVar32._12_4_ * fVar164) *
               fVar254;
          auVar70._16_4_ =
               (auVar25._16_4_ * fVar320 + auVar31._16_4_ * fVar236 + auVar32._16_4_ * fVar166) *
               fVar270;
          auVar70._20_4_ =
               (auVar25._20_4_ * fVar196 + auVar31._20_4_ * fVar195 + auVar32._20_4_ * fVar199) *
               fVar272;
          auVar70._24_4_ =
               (auVar25._24_4_ * fVar168 + auVar31._24_4_ * fVar167 + auVar32._24_4_ * fVar308) *
               fVar274;
          auVar70._28_4_ = auVar26._28_4_ + auVar24._28_4_ + auVar28._28_4_;
          auVar204 = vpermilps_avx(ZEXT416(uVar142),0);
          auVar222._16_16_ = auVar204;
          auVar222._0_16_ = auVar204;
          auVar25 = vcmpps_avx(auVar222,auVar70,2);
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar264._4_4_ = uVar8;
          auVar264._0_4_ = uVar8;
          auVar264._8_4_ = uVar8;
          auVar264._12_4_ = uVar8;
          auVar264._16_4_ = uVar8;
          auVar264._20_4_ = uVar8;
          auVar264._24_4_ = uVar8;
          auVar264._28_4_ = uVar8;
          auVar28 = vcmpps_avx(auVar70,auVar264,2);
          auVar25 = vandps_avx(auVar28,auVar25);
          auVar204 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
          auVar240 = vpand_avx(auVar240,auVar204);
          auVar204 = vpmovsxwd_avx(auVar240);
          auVar169 = vpshufd_avx(auVar240,0xee);
          auVar169 = vpmovsxwd_avx(auVar169);
          auVar221._16_16_ = auVar169;
          auVar221._0_16_ = auVar204;
          if ((((((((auVar221 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar221 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar221 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar221 >> 0x7f,0) == '\0') &&
                (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar169 >> 0x3f,0) == '\0') &&
              (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar169[0xf]) goto LAB_0118e7e8;
          auVar25 = vcmpps_avx(ZEXT832(0) << 0x20,auVar301,4);
          auVar204 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
          auVar240 = vpand_avx(auVar240,auVar204);
          auVar204 = vpmovsxwd_avx(auVar240);
          auVar240 = vpunpckhwd_avx(auVar240,auVar240);
          auVar224 = ZEXT1664(auVar240);
          auVar285._16_16_ = auVar240;
          auVar285._0_16_ = auVar204;
          auVar162 = ZEXT3264(CONCAT824(uStack_528,
                                        CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
          auVar302 = ZEXT3264(auVar150);
          auVar315 = ZEXT3264(auVar312);
          if ((((((((auVar285 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar285 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar285 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar285 >> 0x7f,0) != '\0') ||
                (auVar285 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar240 >> 0x3f,0) != '\0') ||
              (auVar285 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar240[0xf] < '\0') {
            auVar223._0_4_ = auVar185._0_4_ * fVar214;
            auVar223._4_4_ = auVar185._4_4_ * fVar248;
            auVar223._8_4_ = auVar185._8_4_ * fVar253;
            auVar223._12_4_ = auVar185._12_4_ * fVar254;
            auVar223._16_4_ = auVar185._16_4_ * fVar270;
            auVar223._20_4_ = auVar185._20_4_ * fVar272;
            auVar223._24_4_ = auVar185._24_4_ * fVar274;
            auVar223._28_4_ = 0;
            auVar71._4_4_ = auVar243._4_4_ * fVar248;
            auVar71._0_4_ = auVar243._0_4_ * fVar214;
            auVar71._8_4_ = auVar243._8_4_ * fVar253;
            auVar71._12_4_ = auVar243._12_4_ * fVar254;
            auVar71._16_4_ = auVar243._16_4_ * fVar270;
            auVar71._20_4_ = auVar243._20_4_ * fVar272;
            auVar71._24_4_ = auVar243._24_4_ * fVar274;
            auVar71._28_4_ = auVar151._28_4_ + auVar30._28_4_;
            auVar265._8_4_ = 0x3f800000;
            auVar265._0_8_ = &DAT_3f8000003f800000;
            auVar265._12_4_ = 0x3f800000;
            auVar265._16_4_ = 0x3f800000;
            auVar265._20_4_ = 0x3f800000;
            auVar265._24_4_ = 0x3f800000;
            auVar265._28_4_ = 0x3f800000;
            auVar150 = vsubps_avx(auVar265,auVar223);
            auVar150 = vblendvps_avx(auVar150,auVar223,auVar152);
            auVar302 = ZEXT3264(auVar150);
            auVar150 = vsubps_avx(auVar265,auVar71);
            auVar224 = ZEXT3264(auVar150);
            _local_280 = vblendvps_avx(auVar150,auVar71,auVar152);
            auVar162 = ZEXT3264(auVar285);
            auVar315 = ZEXT3264(auVar70);
          }
        }
        auVar150 = auVar162._0_32_;
        if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar150 >> 0x7f,0) != '\0') ||
              (auVar162 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar150 >> 0xbf,0) != '\0') ||
            (auVar162 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar162[0x1f] < '\0') {
          auVar312 = vsubps_avx(auVar263,_local_840);
          local_660 = auVar302._0_32_;
          local_840._0_4_ = (float)local_840._0_4_ + auVar312._0_4_ * auVar302._0_4_;
          local_840._4_4_ = (float)local_840._4_4_ + auVar312._4_4_ * auVar302._4_4_;
          fStack_838 = fStack_838 + auVar312._8_4_ * auVar302._8_4_;
          fStack_834 = fStack_834 + auVar312._12_4_ * auVar302._12_4_;
          fStack_830 = fStack_830 + auVar312._16_4_ * auVar302._16_4_;
          fStack_82c = fStack_82c + auVar312._20_4_ * auVar302._20_4_;
          fStack_828 = fStack_828 + auVar312._24_4_ * auVar302._24_4_;
          fStack_824 = fStack_824 + auVar312._28_4_;
          fVar214 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar72._4_4_ = ((float)local_840._4_4_ + (float)local_840._4_4_) * fVar214;
          auVar72._0_4_ = ((float)local_840._0_4_ + (float)local_840._0_4_) * fVar214;
          auVar72._8_4_ = (fStack_838 + fStack_838) * fVar214;
          auVar72._12_4_ = (fStack_834 + fStack_834) * fVar214;
          auVar72._16_4_ = (fStack_830 + fStack_830) * fVar214;
          auVar72._20_4_ = (fStack_82c + fStack_82c) * fVar214;
          auVar72._24_4_ = (fStack_828 + fStack_828) * fVar214;
          auVar72._28_4_ = fStack_824 + fStack_824;
          local_680 = auVar315._0_32_;
          auVar312 = vcmpps_avx(local_680,auVar72,6);
          auVar25 = auVar150 & auVar312;
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0x7f,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar25 >> 0xbf,0) != '\0') ||
              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar25[0x1f] < '\0') {
            local_300 = vandps_avx(auVar312,auVar150);
            local_280._0_4_ = (float)local_280._0_4_ + (float)local_280._0_4_ + -1.0;
            local_280._4_4_ = (float)local_280._4_4_ + (float)local_280._4_4_ + -1.0;
            uStack_278._0_4_ = (float)uStack_278 + (float)uStack_278 + -1.0;
            uStack_278._4_4_ = uStack_278._4_4_ + uStack_278._4_4_ + -1.0;
            uStack_270._0_4_ = (float)uStack_270 + (float)uStack_270 + -1.0;
            uStack_270._4_4_ = uStack_270._4_4_ + uStack_270._4_4_ + -1.0;
            uStack_268._0_4_ = (float)uStack_268 + (float)uStack_268 + -1.0;
            uStack_268._4_4_ = uStack_268._4_4_ + uStack_268._4_4_ + -1.0;
            local_3c0 = local_660;
            auVar139 = _local_280;
            auVar150 = _local_280;
            local_3a0 = (float)local_280._0_4_;
            fStack_39c = (float)local_280._4_4_;
            fStack_398 = (float)uStack_278;
            fStack_394 = uStack_278._4_4_;
            fStack_390 = (float)uStack_270;
            fStack_38c = uStack_270._4_4_;
            fStack_388 = (float)uStack_268;
            fStack_384 = uStack_268._4_4_;
            local_380 = local_680;
            local_360 = 0;
            local_35c = uVar19;
            local_350 = local_880;
            uStack_348 = uStack_878;
            local_340 = (float)local_800._0_4_;
            fStack_33c = (float)local_800._4_4_;
            fStack_338 = fStack_7f8;
            fStack_334 = fStack_7f4;
            local_330 = local_630;
            uStack_328 = local_630._8_8_;
            local_320 = local_640;
            uStack_318 = local_640._8_8_;
            _local_280 = auVar150;
            if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              auVar202._0_4_ = 1.0 / (float)(int)uVar19;
              auVar202._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar240 = vshufps_avx(auVar202,auVar202,0);
              local_2e0[0] = auVar240._0_4_ * (auVar302._0_4_ + 0.0);
              local_2e0[1] = auVar240._4_4_ * (auVar302._4_4_ + 1.0);
              local_2e0[2] = auVar240._8_4_ * (auVar302._8_4_ + 2.0);
              local_2e0[3] = auVar240._12_4_ * (auVar302._12_4_ + 3.0);
              fStack_2d0 = auVar240._0_4_ * (auVar302._16_4_ + 4.0);
              fStack_2cc = auVar240._4_4_ * (auVar302._20_4_ + 5.0);
              fStack_2c8 = auVar240._8_4_ * (auVar302._24_4_ + 6.0);
              fStack_2c4 = auVar302._28_4_ + 7.0;
              uStack_270 = auVar139._16_8_;
              uStack_268 = auVar150._24_8_;
              local_2c0 = local_280;
              uStack_2b8 = uStack_278;
              uStack_2b0 = uStack_270;
              uStack_2a8 = uStack_268;
              local_2a0 = local_680;
              auVar186._8_4_ = 0x7f800000;
              auVar186._0_8_ = 0x7f8000007f800000;
              auVar186._12_4_ = 0x7f800000;
              auVar186._16_4_ = 0x7f800000;
              auVar186._20_4_ = 0x7f800000;
              auVar186._24_4_ = 0x7f800000;
              auVar186._28_4_ = 0x7f800000;
              auVar150 = vblendvps_avx(auVar186,local_680,local_300);
              auVar312 = vshufps_avx(auVar150,auVar150,0xb1);
              auVar312 = vminps_avx(auVar150,auVar312);
              auVar25 = vshufpd_avx(auVar312,auVar312,5);
              auVar312 = vminps_avx(auVar312,auVar25);
              auVar25 = vperm2f128_avx(auVar312,auVar312,1);
              auVar312 = vminps_avx(auVar312,auVar25);
              auVar312 = vcmpps_avx(auVar150,auVar312,0);
              auVar25 = local_300 & auVar312;
              auVar150 = local_300;
              if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar25 >> 0x7f,0) != '\0') ||
                    (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0xbf,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar25[0x1f] < '\0') {
                auVar150 = vandps_avx(auVar312,local_300);
              }
              uVar141 = vmovmskps_avx(auVar150);
              uVar23 = 0;
              if (uVar141 != 0) {
                for (; (uVar141 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar144 = (ulong)uVar23;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar214 = local_2e0[uVar144];
                uVar8 = *(undefined4 *)((long)&local_2c0 + uVar144 * 4);
                fVar235 = 1.0 - fVar214;
                fVar227 = fVar214 * fVar235 + fVar214 * fVar235;
                auVar240 = ZEXT416((uint)(fVar214 * fVar214 * 3.0));
                auVar240 = vshufps_avx(auVar240,auVar240,0);
                auVar204 = ZEXT416((uint)((fVar227 - fVar214 * fVar214) * 3.0));
                auVar204 = vshufps_avx(auVar204,auVar204,0);
                auVar169 = ZEXT416((uint)((fVar235 * fVar235 - fVar227) * 3.0));
                auVar169 = vshufps_avx(auVar169,auVar169,0);
                auVar206 = ZEXT416((uint)(fVar235 * fVar235 * -3.0));
                auVar206 = vshufps_avx(auVar206,auVar206,0);
                auVar203._0_4_ =
                     auVar206._0_4_ * fVar225 +
                     (float)local_800._0_4_ * auVar169._0_4_ +
                     (float)local_640._0_4_ * auVar240._0_4_ +
                     (float)local_630._0_4_ * auVar204._0_4_;
                auVar203._4_4_ =
                     auVar206._4_4_ * fVar226 +
                     (float)local_800._4_4_ * auVar169._4_4_ +
                     (float)local_640._4_4_ * auVar240._4_4_ +
                     (float)local_630._4_4_ * auVar204._4_4_;
                auVar203._8_4_ =
                     auVar206._8_4_ * fVar230 +
                     fStack_7f8 * auVar169._8_4_ +
                     (float)uStack_638 * auVar240._8_4_ + (float)uStack_628 * auVar204._8_4_;
                auVar203._12_4_ =
                     auVar206._12_4_ * fVar233 +
                     fStack_7f4 * auVar169._12_4_ +
                     uStack_638._4_4_ * auVar240._12_4_ + uStack_628._4_4_ * auVar204._12_4_;
                auVar224 = ZEXT464(*(uint *)(local_2a0 + uVar144 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_2a0 + uVar144 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar203._0_4_;
                uVar20 = vextractps_avx(auVar203,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar20;
                uVar20 = vextractps_avx(auVar203,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar20;
                *(float *)(ray + k * 4 + 0xf0) = fVar214;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
                *(uint *)(ray + k * 4 + 0x110) = uVar18;
                *(uint *)(ray + k * 4 + 0x120) = uVar140;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                _local_760 = vshufps_avx(ZEXT416(uVar140),ZEXT416(uVar140),0);
                auStack_750 = auVar263._16_16_;
                _local_6c0 = vshufps_avx(ZEXT416(uVar18),ZEXT416(uVar18),0);
                auStack_6b0 = auVar26._16_16_;
                _auStack_7b0 = auVar27._16_16_;
                _local_7c0 = _local_800;
                _auStack_6d0 = auVar241._16_16_;
                _local_6e0 = _local_630;
                _auStack_590 = auVar219._16_16_;
                _local_5a0 = _local_640;
                local_5c0 = (float)*(undefined8 *)*local_768;
                fStack_5bc = (float)((ulong)*(undefined8 *)*local_768 >> 0x20);
                fStack_5b8 = (float)*(undefined8 *)(*local_768 + 8);
                fStack_5b4 = (float)((ulong)*(undefined8 *)(*local_768 + 8) >> 0x20);
                local_580 = local_300;
                _local_200 = auVar29;
                do {
                  local_7a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_420 = local_2e0[uVar144];
                  uVar8 = *(undefined4 *)((long)&local_2c0 + uVar144 * 4);
                  auVar179._4_4_ = uVar8;
                  auVar179._0_4_ = uVar8;
                  auVar179._8_4_ = uVar8;
                  auVar179._12_4_ = uVar8;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar144 * 4);
                  fVar227 = 1.0 - local_420;
                  fVar214 = local_420 * fVar227 + local_420 * fVar227;
                  auVar240 = ZEXT416((uint)(local_420 * local_420 * 3.0));
                  auVar240 = vshufps_avx(auVar240,auVar240,0);
                  auVar204 = ZEXT416((uint)((fVar214 - local_420 * local_420) * 3.0));
                  auVar204 = vshufps_avx(auVar204,auVar204,0);
                  auVar169 = ZEXT416((uint)((fVar227 * fVar227 - fVar214) * 3.0));
                  auVar169 = vshufps_avx(auVar169,auVar169,0);
                  local_7f0.context = context->user;
                  auVar206 = ZEXT416((uint)(fVar227 * fVar227 * -3.0));
                  auVar206 = vshufps_avx(auVar206,auVar206,0);
                  auVar208._0_4_ =
                       auVar206._0_4_ * fVar225 +
                       auVar169._0_4_ * (float)local_7c0._0_4_ +
                       auVar240._0_4_ * (float)local_5a0._0_4_ +
                       auVar204._0_4_ * (float)local_6e0._0_4_;
                  auVar208._4_4_ =
                       auVar206._4_4_ * fVar226 +
                       auVar169._4_4_ * (float)local_7c0._4_4_ +
                       auVar240._4_4_ * (float)local_5a0._4_4_ +
                       auVar204._4_4_ * (float)local_6e0._4_4_;
                  auVar208._8_4_ =
                       auVar206._8_4_ * fVar230 +
                       auVar169._8_4_ * (float)uStack_7b8 +
                       auVar240._8_4_ * fStack_598 + auVar204._8_4_ * fStack_6d8;
                  auVar208._12_4_ =
                       auVar206._12_4_ * fVar233 +
                       auVar169._12_4_ * uStack_7b8._4_4_ +
                       auVar240._12_4_ * fStack_594 + auVar204._12_4_ * fStack_6d4;
                  auVar240 = vshufps_avx(auVar208,auVar208,0);
                  local_450[0] = (RTCHitN)auVar240[0];
                  local_450[1] = (RTCHitN)auVar240[1];
                  local_450[2] = (RTCHitN)auVar240[2];
                  local_450[3] = (RTCHitN)auVar240[3];
                  local_450[4] = (RTCHitN)auVar240[4];
                  local_450[5] = (RTCHitN)auVar240[5];
                  local_450[6] = (RTCHitN)auVar240[6];
                  local_450[7] = (RTCHitN)auVar240[7];
                  local_450[8] = (RTCHitN)auVar240[8];
                  local_450[9] = (RTCHitN)auVar240[9];
                  local_450[10] = (RTCHitN)auVar240[10];
                  local_450[0xb] = (RTCHitN)auVar240[0xb];
                  local_450[0xc] = (RTCHitN)auVar240[0xc];
                  local_450[0xd] = (RTCHitN)auVar240[0xd];
                  local_450[0xe] = (RTCHitN)auVar240[0xe];
                  local_450[0xf] = (RTCHitN)auVar240[0xf];
                  local_440 = vshufps_avx(auVar208,auVar208,0x55);
                  auVar224 = ZEXT1664(local_440);
                  local_430 = vshufps_avx(auVar208,auVar208,0xaa);
                  fStack_41c = local_420;
                  fStack_418 = local_420;
                  fStack_414 = local_420;
                  local_410 = auVar179;
                  local_400 = local_6c0;
                  uStack_3f8 = uStack_6b8;
                  local_3f0 = local_760;
                  uStack_3e8 = uStack_758;
                  vcmpps_avx(auVar346._0_32_,auVar346._0_32_,0xf);
                  uStack_3dc = (local_7f0.context)->instID[0];
                  local_3e0 = uStack_3dc;
                  uStack_3d8 = uStack_3dc;
                  uStack_3d4 = uStack_3dc;
                  uStack_3d0 = (local_7f0.context)->instPrimID[0];
                  uStack_3cc = uStack_3d0;
                  uStack_3c8 = uStack_3d0;
                  uStack_3c4 = uStack_3d0;
                  local_810 = CONCAT44(fStack_5bc,local_5c0);
                  uStack_808 = CONCAT44(fStack_5b4,fStack_5b8);
                  local_7f0.valid = (int *)&local_810;
                  local_7f0.geometryUserPtr = pGVar21->userPtr;
                  local_7f0.hit = local_450;
                  local_7f0.N = 4;
                  local_7f0.ray = (RTCRayN *)ray;
                  if (pGVar21->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar224 = ZEXT1664(local_440);
                    (*pGVar21->intersectionFilterN)(&local_7f0);
                    auVar302._8_56_ = extraout_var;
                    auVar302._0_8_ = extraout_XMM1_Qa;
                    auVar179 = auVar302._0_16_;
                    auVar315 = ZEXT3264(local_680);
                    auVar302 = ZEXT3264(local_660);
                    auVar346 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar129._8_8_ = uStack_808;
                  auVar129._0_8_ = local_810;
                  if (auVar129 == (undefined1  [16])0x0) {
                    auVar240 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar204 = vpcmpeqd_avx(auVar179,auVar179);
                    auVar240 = auVar240 ^ auVar204;
                  }
                  else {
                    p_Var22 = context->args->filter;
                    auVar240 = vpcmpeqd_avx(auVar224._0_16_,auVar224._0_16_);
                    auVar224 = ZEXT1664(auVar240);
                    if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var22)(&local_7f0);
                      auVar315 = ZEXT3264(local_680);
                      auVar302 = ZEXT3264(local_660);
                      auVar240 = vpcmpeqd_avx(auVar240,auVar240);
                      auVar224 = ZEXT1664(auVar240);
                      auVar346 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar130._8_8_ = uStack_808;
                    auVar130._0_8_ = local_810;
                    auVar204 = vpcmpeqd_avx(auVar130,_DAT_01feba10);
                    auVar240 = auVar204 ^ auVar224._0_16_;
                    if (auVar130 != (undefined1  [16])0x0) {
                      auVar204 = auVar204 ^ auVar224._0_16_;
                      auVar169 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])local_7f0.hit);
                      *(undefined1 (*) [16])(local_7f0.ray + 0xc0) = auVar169;
                      auVar169 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x10));
                      *(undefined1 (*) [16])(local_7f0.ray + 0xd0) = auVar169;
                      auVar169 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x20));
                      *(undefined1 (*) [16])(local_7f0.ray + 0xe0) = auVar169;
                      auVar169 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x30));
                      *(undefined1 (*) [16])(local_7f0.ray + 0xf0) = auVar169;
                      auVar169 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x40));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x100) = auVar169;
                      auVar169 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x50));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x110) = auVar169;
                      auVar169 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x60));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x120) = auVar169;
                      auVar169 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x70));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x130) = auVar169;
                      auVar204 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x80));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x140) = auVar204;
                    }
                  }
                  auVar180._8_8_ = 0x100000001;
                  auVar180._0_8_ = 0x100000001;
                  if ((auVar180 & auVar240) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_7a0._0_4_;
                  }
                  *(undefined4 *)(local_580 + uVar144 * 4) = 0;
                  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar161._4_4_ = uVar8;
                  auVar161._0_4_ = uVar8;
                  auVar161._8_4_ = uVar8;
                  auVar161._12_4_ = uVar8;
                  auVar161._16_4_ = uVar8;
                  auVar161._20_4_ = uVar8;
                  auVar161._24_4_ = uVar8;
                  auVar161._28_4_ = uVar8;
                  auVar312 = vcmpps_avx(auVar315._0_32_,auVar161,2);
                  auVar150 = vandps_avx(auVar312,local_580);
                  local_580 = local_580 & auVar312;
                  bVar122 = (local_580 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar123 = (local_580 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar121 = (local_580 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar120 = SUB321(local_580 >> 0x7f,0) != '\0';
                  bVar119 = (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar118 = SUB321(local_580 >> 0xbf,0) != '\0';
                  bVar117 = (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar116 = local_580[0x1f] < '\0';
                  if (((((((bVar122 || bVar123) || bVar121) || bVar120) || bVar119) || bVar118) ||
                      bVar117) || bVar116) {
                    auVar194._8_4_ = 0x7f800000;
                    auVar194._0_8_ = 0x7f8000007f800000;
                    auVar194._12_4_ = 0x7f800000;
                    auVar194._16_4_ = 0x7f800000;
                    auVar194._20_4_ = 0x7f800000;
                    auVar194._24_4_ = 0x7f800000;
                    auVar194._28_4_ = 0x7f800000;
                    auVar312 = vblendvps_avx(auVar194,auVar315._0_32_,auVar150);
                    auVar25 = vshufps_avx(auVar312,auVar312,0xb1);
                    auVar25 = vminps_avx(auVar312,auVar25);
                    auVar26 = vshufpd_avx(auVar25,auVar25,5);
                    auVar25 = vminps_avx(auVar25,auVar26);
                    auVar26 = vperm2f128_avx(auVar25,auVar25,1);
                    auVar224 = ZEXT3264(auVar26);
                    auVar25 = vminps_avx(auVar25,auVar26);
                    auVar25 = vcmpps_avx(auVar312,auVar25,0);
                    auVar26 = auVar150 & auVar25;
                    auVar312 = auVar150;
                    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar26 >> 0x7f,0) != '\0') ||
                          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar26 >> 0xbf,0) != '\0') ||
                        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar26[0x1f] < '\0') {
                      auVar312 = vandps_avx(auVar25,auVar150);
                    }
                    uVar141 = vmovmskps_avx(auVar312);
                    uVar23 = 0;
                    if (uVar141 != 0) {
                      for (; (uVar141 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                      }
                    }
                    uVar144 = (ulong)uVar23;
                  }
                  local_580 = auVar150;
                } while (((((((bVar122 || bVar123) || bVar121) || bVar120) || bVar119) || bVar118)
                         || bVar117) || bVar116);
              }
            }
          }
          fVar368 = (float)local_720._0_4_;
          fVar372 = (float)local_720._4_4_;
          fVar373 = fStack_718;
          fVar374 = fStack_714;
          fVar237 = fStack_710;
          fVar246 = fStack_70c;
          fVar250 = fStack_708;
          fVar252 = fStack_704;
        }
      }
      auVar346 = ZEXT3264(local_600);
      if (8 < (int)uVar19) {
        auVar240 = vpshufd_avx(ZEXT416(uVar19),0);
        local_520 = auVar240._0_4_;
        fStack_51c = auVar240._4_4_;
        fStack_518 = auVar240._8_4_;
        fStack_514 = auVar240._12_4_;
        auVar240 = vshufps_avx(local_740._0_16_,local_740._0_16_,0);
        register0x00001210 = auVar240;
        _local_240 = auVar240;
        auVar240 = vpermilps_avx(ZEXT416(uVar142),0);
        local_260._16_16_ = auVar240;
        local_260._0_16_ = auVar240;
        auVar149._0_4_ = 1.0 / (float)local_4c0._0_4_;
        auVar149._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar240 = vshufps_avx(auVar149,auVar149,0);
        _fStack_4b0 = auVar240;
        _local_4c0 = auVar240;
        local_190 = vshufps_avx(ZEXT416(uVar140),ZEXT416(uVar140),0);
        local_1a0 = vshufps_avx(ZEXT416(uVar18),ZEXT416(uVar18),0);
        auVar162 = ZEXT1664(local_1a0);
        lVar145 = 8;
        local_660 = auVar302._0_32_;
        local_680 = auVar315._0_32_;
        do {
          pauVar2 = (undefined1 (*) [28])(bezier_basis0 + lVar145 * 4 + lVar143);
          fVar214 = *(float *)*pauVar2;
          fVar227 = *(float *)(*pauVar2 + 4);
          fVar235 = *(float *)(*pauVar2 + 8);
          fVar248 = *(float *)(*pauVar2 + 0xc);
          fVar253 = *(float *)(*pauVar2 + 0x10);
          fVar254 = *(float *)(*pauVar2 + 0x14);
          fVar256 = *(float *)(*pauVar2 + 0x18);
          auVar136 = *pauVar2;
          pauVar3 = (undefined1 (*) [28])(lVar143 + 0x2227768 + lVar145 * 4);
          fVar268 = *(float *)*pauVar3;
          fVar270 = *(float *)(*pauVar3 + 4);
          fVar272 = *(float *)(*pauVar3 + 8);
          fVar274 = *(float *)(*pauVar3 + 0xc);
          fVar275 = *(float *)(*pauVar3 + 0x10);
          fVar276 = *(float *)(*pauVar3 + 0x14);
          fVar316 = *(float *)(*pauVar3 + 0x18);
          auVar135 = *pauVar3;
          pauVar3 = (undefined1 (*) [28])(lVar143 + 0x2227bec + lVar145 * 4);
          fVar317 = *(float *)*pauVar3;
          fVar229 = *(float *)(*pauVar3 + 4);
          fVar306 = *(float *)(*pauVar3 + 8);
          fVar318 = *(float *)(*pauVar3 + 0xc);
          fVar319 = *(float *)(*pauVar3 + 0x10);
          fVar232 = *(float *)(*pauVar3 + 0x14);
          fVar307 = *(float *)(*pauVar3 + 0x18);
          auVar134 = *pauVar3;
          pfVar4 = (float *)(lVar143 + 0x2228070 + lVar145 * 4);
          local_5c0 = *pfVar4;
          fStack_5bc = pfVar4[1];
          fStack_5b8 = pfVar4[2];
          fStack_5b4 = pfVar4[3];
          fStack_5b0 = pfVar4[4];
          fStack_5ac = pfVar4[5];
          fStack_5a8 = pfVar4[6];
          fStack_5a4 = pfVar4[7];
          fVar236 = auVar224._28_4_;
          fVar164 = auVar346._0_4_;
          fVar166 = auVar346._4_4_;
          fVar199 = auVar346._8_4_;
          fVar308 = auVar346._12_4_;
          fVar213 = auVar346._16_4_;
          fVar228 = auVar346._20_4_;
          fVar231 = auVar346._24_4_;
          fVar172 = fVar236 + fVar236 + auVar162._28_4_;
          auVar370._0_4_ =
               (float)local_c0._0_4_ * fVar214 +
               (float)local_120._0_4_ * fVar268 +
               (float)local_500._0_4_ * fVar317 + (float)local_4a0._0_4_ * local_5c0;
          auVar370._4_4_ =
               (float)local_c0._4_4_ * fVar227 +
               (float)local_120._4_4_ * fVar270 +
               (float)local_500._4_4_ * fVar229 + (float)local_4a0._4_4_ * fStack_5bc;
          auVar370._8_4_ =
               fStack_b8 * fVar235 +
               fStack_118 * fVar272 + fStack_4f8 * fVar306 + fStack_498 * fStack_5b8;
          auVar370._12_4_ =
               fStack_b4 * fVar248 +
               fStack_114 * fVar274 + fStack_4f4 * fVar318 + fStack_494 * fStack_5b4;
          auVar370._16_4_ =
               fStack_b0 * fVar253 +
               fStack_110 * fVar275 + fStack_4f0 * fVar319 + fStack_490 * fStack_5b0;
          auVar370._20_4_ =
               fStack_ac * fVar254 +
               fStack_10c * fVar276 + fStack_4ec * fVar232 + fStack_48c * fStack_5ac;
          auVar370._24_4_ =
               fStack_a8 * fVar256 +
               fStack_108 * fVar316 + fStack_4e8 * fVar307 + fStack_488 * fStack_5a8;
          auVar370._28_4_ = fVar236 + fStack_5a4 + fVar172;
          local_740._0_4_ =
               (float)local_220._0_4_ * fVar268 + fVar164 * fVar317 + fVar368 * local_5c0 +
               (float)local_1e0._0_4_ * fVar214;
          local_740._4_4_ =
               (float)local_220._4_4_ * fVar270 + fVar166 * fVar229 + fVar372 * fStack_5bc +
               (float)local_1e0._4_4_ * fVar227;
          local_740._8_4_ =
               fStack_218 * fVar272 + fVar199 * fVar306 + fVar373 * fStack_5b8 +
               fStack_1d8 * fVar235;
          local_740._12_4_ =
               fStack_214 * fVar274 + fVar308 * fVar318 + fVar374 * fStack_5b4 +
               fStack_1d4 * fVar248;
          local_740._16_4_ =
               fStack_210 * fVar275 + fVar213 * fVar319 + fVar237 * fStack_5b0 +
               fStack_1d0 * fVar253;
          local_740._20_4_ =
               fStack_20c * fVar276 + fVar228 * fVar232 + fVar246 * fStack_5ac +
               fStack_1cc * fVar254;
          local_740._24_4_ =
               fStack_208 * fVar316 + fVar231 * fVar307 + fVar250 * fStack_5a8 +
               fStack_1c8 * fVar256;
          local_740._28_4_ = fVar236 + fVar236 + fVar252 + fVar172;
          fVar147 = fVar214 * (float)local_160._0_4_ +
                    (float)local_a0._0_4_ * fVar268 +
                    fVar317 * (float)local_1c0._0_4_ + local_5c0 * (float)local_140._0_4_;
          fVar163 = fVar227 * (float)local_160._4_4_ +
                    (float)local_a0._4_4_ * fVar270 +
                    fVar229 * (float)local_1c0._4_4_ + fStack_5bc * (float)local_140._4_4_;
          fVar165 = fVar235 * fStack_158 +
                    fStack_98 * fVar272 + fVar306 * fStack_1b8 + fStack_5b8 * fStack_138;
          fVar167 = fVar248 * fStack_154 +
                    fStack_94 * fVar274 + fVar318 * fStack_1b4 + fStack_5b4 * fStack_134;
          fVar168 = fVar253 * fStack_150 +
                    fStack_90 * fVar275 + fVar319 * fStack_1b0 + fStack_5b0 * fStack_130;
          fVar170 = fVar254 * fStack_14c +
                    fStack_8c * fVar276 + fVar232 * fStack_1ac + fStack_5ac * fStack_12c;
          fVar171 = fVar256 * fStack_148 +
                    fStack_88 * fVar316 + fVar307 * fStack_1a8 + fStack_5a8 * fStack_128;
          fVar172 = fVar172 + fVar236 + fVar236 + fStack_5a4;
          pfVar4 = (float *)(bezier_basis1 + lVar145 * 4 + lVar143);
          fVar274 = *pfVar4;
          fVar275 = pfVar4[1];
          fVar276 = pfVar4[2];
          fVar316 = pfVar4[3];
          fVar317 = pfVar4[4];
          fVar229 = pfVar4[5];
          fVar306 = pfVar4[6];
          pauVar3 = (undefined1 (*) [28])(lVar143 + 0x2229b88 + lVar145 * 4);
          fVar227 = *(float *)*pauVar3;
          fVar268 = *(float *)(*pauVar3 + 4);
          fVar272 = *(float *)(*pauVar3 + 8);
          fVar318 = *(float *)(*pauVar3 + 0xc);
          fVar319 = *(float *)(*pauVar3 + 0x10);
          fVar232 = *(float *)(*pauVar3 + 0x14);
          fVar307 = *(float *)(*pauVar3 + 0x18);
          auVar138 = *pauVar3;
          auVar150 = *(undefined1 (*) [32])(lVar143 + 0x222a00c + lVar145 * 4);
          auVar162 = ZEXT3264(auVar150);
          pauVar3 = (undefined1 (*) [28])(lVar143 + 0x222a490 + lVar145 * 4);
          fVar236 = *(float *)*pauVar3;
          fVar320 = *(float *)(*pauVar3 + 4);
          fVar234 = *(float *)(*pauVar3 + 8);
          fVar173 = *(float *)(*pauVar3 + 0xc);
          fVar174 = *(float *)(*pauVar3 + 0x10);
          fVar195 = *(float *)(*pauVar3 + 0x14);
          fVar196 = *(float *)(*pauVar3 + 0x18);
          auVar137 = *pauVar3;
          fVar214 = auVar150._0_4_;
          fVar235 = auVar150._4_4_;
          fVar248 = auVar150._8_4_;
          fVar253 = auVar150._12_4_;
          fVar254 = auVar150._16_4_;
          fVar256 = auVar150._20_4_;
          fVar270 = auVar150._24_4_;
          fVar291 = fVar252 + *(float *)pauVar3[1];
          fVar255 = fVar252 + fVar252 + fStack_484;
          auVar126._4_4_ = fVar163;
          auVar126._0_4_ = fVar147;
          auVar126._8_4_ = fVar165;
          auVar126._12_4_ = fVar167;
          auVar126._16_4_ = fVar168;
          auVar126._20_4_ = fVar170;
          auVar126._24_4_ = fVar171;
          auVar126._28_4_ = fVar172;
          auVar286._0_4_ =
               (float)local_c0._0_4_ * fVar274 +
               (float)local_120._0_4_ * fVar227 +
               (float)local_500._0_4_ * fVar214 + (float)local_4a0._0_4_ * fVar236;
          auVar286._4_4_ =
               (float)local_c0._4_4_ * fVar275 +
               (float)local_120._4_4_ * fVar268 +
               (float)local_500._4_4_ * fVar235 + (float)local_4a0._4_4_ * fVar320;
          auVar286._8_4_ =
               fStack_b8 * fVar276 +
               fStack_118 * fVar272 + fStack_4f8 * fVar248 + fStack_498 * fVar234;
          auVar286._12_4_ =
               fStack_b4 * fVar316 +
               fStack_114 * fVar318 + fStack_4f4 * fVar253 + fStack_494 * fVar173;
          auVar286._16_4_ =
               fStack_b0 * fVar317 +
               fStack_110 * fVar319 + fStack_4f0 * fVar254 + fStack_490 * fVar174;
          auVar286._20_4_ =
               fStack_ac * fVar229 +
               fStack_10c * fVar232 + fStack_4ec * fVar256 + fStack_48c * fVar195;
          auVar286._24_4_ =
               fStack_a8 * fVar306 +
               fStack_108 * fVar307 + fStack_4e8 * fVar270 + fStack_488 * fVar196;
          auVar286._28_4_ = fVar291 + fVar255;
          auVar266._0_4_ =
               fVar274 * (float)local_1e0._0_4_ +
               fVar227 * (float)local_220._0_4_ + fVar164 * fVar214 + fVar368 * fVar236;
          auVar266._4_4_ =
               fVar275 * (float)local_1e0._4_4_ +
               fVar268 * (float)local_220._4_4_ + fVar166 * fVar235 + fVar372 * fVar320;
          auVar266._8_4_ =
               fVar276 * fStack_1d8 + fVar272 * fStack_218 + fVar199 * fVar248 + fVar373 * fVar234;
          auVar266._12_4_ =
               fVar316 * fStack_1d4 + fVar318 * fStack_214 + fVar308 * fVar253 + fVar374 * fVar173;
          auVar266._16_4_ =
               fVar317 * fStack_1d0 + fVar319 * fStack_210 + fVar213 * fVar254 + fVar237 * fVar174;
          auVar266._20_4_ =
               fVar229 * fStack_1cc + fVar232 * fStack_20c + fVar228 * fVar256 + fVar246 * fVar195;
          auVar266._24_4_ =
               fVar306 * fStack_1c8 + fVar307 * fStack_208 + fVar231 * fVar270 + fVar250 * fVar196;
          auVar266._28_4_ = fVar255 + fVar252 + fVar252 + *(float *)pauVar2[1];
          auVar187._0_4_ =
               (float)local_a0._0_4_ * fVar227 +
               fVar214 * (float)local_1c0._0_4_ + fVar236 * (float)local_140._0_4_ +
               fVar274 * (float)local_160._0_4_;
          auVar187._4_4_ =
               (float)local_a0._4_4_ * fVar268 +
               fVar235 * (float)local_1c0._4_4_ + fVar320 * (float)local_140._4_4_ +
               fVar275 * (float)local_160._4_4_;
          auVar187._8_4_ =
               fStack_98 * fVar272 + fVar248 * fStack_1b8 + fVar234 * fStack_138 +
               fVar276 * fStack_158;
          auVar187._12_4_ =
               fStack_94 * fVar318 + fVar253 * fStack_1b4 + fVar173 * fStack_134 +
               fVar316 * fStack_154;
          auVar187._16_4_ =
               fStack_90 * fVar319 + fVar254 * fStack_1b0 + fVar174 * fStack_130 +
               fVar317 * fStack_150;
          auVar187._20_4_ =
               fStack_8c * fVar232 + fVar256 * fStack_1ac + fVar195 * fStack_12c +
               fVar229 * fStack_14c;
          auVar187._24_4_ =
               fStack_88 * fVar307 + fVar270 * fStack_1a8 + fVar196 * fStack_128 +
               fVar306 * fStack_148;
          auVar187._28_4_ = fVar252 + fVar291 + fVar255;
          auVar25 = vsubps_avx(auVar286,auVar370);
          auVar26 = vsubps_avx(auVar266,local_740);
          fVar318 = auVar25._0_4_;
          fVar319 = auVar25._4_4_;
          auVar73._4_4_ = fVar319 * local_740._4_4_;
          auVar73._0_4_ = fVar318 * (float)local_740._0_4_;
          fVar232 = auVar25._8_4_;
          auVar73._8_4_ = fVar232 * local_740._8_4_;
          fVar307 = auVar25._12_4_;
          auVar73._12_4_ = fVar307 * local_740._12_4_;
          fVar236 = auVar25._16_4_;
          auVar73._16_4_ = fVar236 * local_740._16_4_;
          fVar320 = auVar25._20_4_;
          auVar73._20_4_ = fVar320 * local_740._20_4_;
          fVar234 = auVar25._24_4_;
          auVar73._24_4_ = fVar234 * local_740._24_4_;
          auVar73._28_4_ = fVar255;
          fVar227 = auVar26._0_4_;
          fVar237 = auVar26._4_4_;
          auVar74._4_4_ = auVar370._4_4_ * fVar237;
          auVar74._0_4_ = auVar370._0_4_ * fVar227;
          fVar246 = auVar26._8_4_;
          auVar74._8_4_ = auVar370._8_4_ * fVar246;
          fVar250 = auVar26._12_4_;
          auVar74._12_4_ = auVar370._12_4_ * fVar250;
          fVar252 = auVar26._16_4_;
          auVar74._16_4_ = auVar370._16_4_ * fVar252;
          fVar268 = auVar26._20_4_;
          auVar74._20_4_ = auVar370._20_4_ * fVar268;
          fVar272 = auVar26._24_4_;
          auVar74._24_4_ = auVar370._24_4_ * fVar272;
          auVar74._28_4_ = auVar266._28_4_;
          auVar27 = vsubps_avx(auVar73,auVar74);
          auVar312 = vmaxps_avx(auVar126,auVar187);
          auVar75._4_4_ = auVar312._4_4_ * auVar312._4_4_ * (fVar319 * fVar319 + fVar237 * fVar237);
          auVar75._0_4_ = auVar312._0_4_ * auVar312._0_4_ * (fVar318 * fVar318 + fVar227 * fVar227);
          auVar75._8_4_ = auVar312._8_4_ * auVar312._8_4_ * (fVar232 * fVar232 + fVar246 * fVar246);
          auVar75._12_4_ =
               auVar312._12_4_ * auVar312._12_4_ * (fVar307 * fVar307 + fVar250 * fVar250);
          auVar75._16_4_ =
               auVar312._16_4_ * auVar312._16_4_ * (fVar236 * fVar236 + fVar252 * fVar252);
          auVar75._20_4_ =
               auVar312._20_4_ * auVar312._20_4_ * (fVar320 * fVar320 + fVar268 * fVar268);
          auVar75._24_4_ =
               auVar312._24_4_ * auVar312._24_4_ * (fVar234 * fVar234 + fVar272 * fVar272);
          auVar75._28_4_ = auVar286._28_4_ + auVar266._28_4_;
          auVar76._4_4_ = auVar27._4_4_ * auVar27._4_4_;
          auVar76._0_4_ = auVar27._0_4_ * auVar27._0_4_;
          auVar76._8_4_ = auVar27._8_4_ * auVar27._8_4_;
          auVar76._12_4_ = auVar27._12_4_ * auVar27._12_4_;
          auVar76._16_4_ = auVar27._16_4_ * auVar27._16_4_;
          auVar76._20_4_ = auVar27._20_4_ * auVar27._20_4_;
          auVar76._24_4_ = auVar27._24_4_ * auVar27._24_4_;
          auVar76._28_4_ = auVar27._28_4_;
          auVar312 = vcmpps_avx(auVar76,auVar75,2);
          auVar224 = ZEXT3264(auVar312);
          local_360 = (uint)lVar145;
          auVar204 = vpshufd_avx(ZEXT416(local_360),0);
          auVar240 = vpor_avx(auVar204,_DAT_01ff0cf0);
          auVar204 = vpor_avx(auVar204,_DAT_02020ea0);
          auVar132._4_4_ = fStack_51c;
          auVar132._0_4_ = local_520;
          auVar132._8_4_ = fStack_518;
          auVar132._12_4_ = fStack_514;
          auVar240 = vpcmpgtd_avx(auVar132,auVar240);
          auVar204 = vpcmpgtd_avx(auVar132,auVar204);
          register0x00001250 = auVar204;
          _local_200 = auVar240;
          auVar27 = _local_200 & auVar312;
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0x7f,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar27 >> 0xbf,0) == '\0') &&
              (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar27[0x1f]) {
            auVar346 = ZEXT3264(auVar346._0_32_);
          }
          else {
            local_700._0_4_ = auVar138._0_4_;
            local_700._4_4_ = auVar138._4_4_;
            fStack_6f8 = auVar138._8_4_;
            fStack_6f4 = auVar138._12_4_;
            fStack_6f0 = auVar138._16_4_;
            fStack_6ec = auVar138._20_4_;
            fStack_6e8 = auVar138._24_4_;
            local_5e0._0_4_ = auVar137._0_4_;
            local_5e0._4_4_ = auVar137._4_4_;
            fStack_5d8 = auVar137._8_4_;
            fStack_5d4 = auVar137._12_4_;
            fStack_5d0 = auVar137._16_4_;
            fStack_5cc = auVar137._20_4_;
            fStack_5c8 = auVar137._24_4_;
            local_5e0._0_4_ =
                 fVar274 * (float)local_620._0_4_ +
                 (float)local_480._0_4_ * (float)local_700._0_4_ +
                 (float)local_e0._0_4_ * fVar214 + (float)local_6a0._0_4_ * (float)local_5e0._0_4_;
            local_5e0._4_4_ =
                 fVar275 * (float)local_620._4_4_ +
                 (float)local_480._4_4_ * (float)local_700._4_4_ +
                 (float)local_e0._4_4_ * fVar235 + (float)local_6a0._4_4_ * (float)local_5e0._4_4_;
            fStack_5d8 = fVar276 * fStack_618 +
                         fStack_478 * fStack_6f8 + fStack_d8 * fVar248 + fStack_698 * fStack_5d8;
            fStack_5d4 = fVar316 * fStack_614 +
                         fStack_474 * fStack_6f4 + fStack_d4 * fVar253 + fStack_694 * fStack_5d4;
            fStack_5d0 = fVar317 * fStack_610 +
                         fStack_470 * fStack_6f0 + fStack_d0 * fVar254 + fStack_690 * fStack_5d0;
            fStack_5cc = fVar229 * fStack_60c +
                         fStack_46c * fStack_6ec + fStack_cc * fVar256 + fStack_68c * fStack_5cc;
            fStack_5c8 = fVar306 * fStack_608 +
                         fStack_468 * fStack_6e8 + fStack_c8 * fVar270 + fStack_688 * fStack_5c8;
            fStack_5c4 = pfVar4[7] + auVar150._28_4_ + auVar204._12_4_ + 0.0;
            local_6e0._0_4_ = auVar135._0_4_;
            local_6e0._4_4_ = auVar135._4_4_;
            fStack_6d8 = auVar135._8_4_;
            fStack_6d4 = auVar135._12_4_;
            auStack_6d0._0_4_ = auVar135._16_4_;
            auStack_6d0._4_4_ = auVar135._20_4_;
            fStack_6c8 = auVar135._24_4_;
            local_5a0._0_4_ = auVar134._0_4_;
            local_5a0._4_4_ = auVar134._4_4_;
            fStack_598 = auVar134._8_4_;
            fStack_594 = auVar134._12_4_;
            auStack_590._0_4_ = auVar134._16_4_;
            auStack_590._4_4_ = auVar134._20_4_;
            fStack_588 = auVar134._24_4_;
            fVar174 = (float)local_e0._0_4_ * (float)local_5a0._0_4_;
            fVar195 = (float)local_e0._4_4_ * (float)local_5a0._4_4_;
            fVar196 = fStack_d8 * fStack_598;
            fVar255 = fStack_d4 * fStack_594;
            fVar291 = fStack_d0 * (float)auStack_590._0_4_;
            fVar197 = fStack_cc * (float)auStack_590._4_4_;
            fVar198 = fStack_c8 * fStack_588;
            pfVar4 = (float *)(lVar143 + 0x2228dfc + lVar145 * 4);
            fVar214 = *pfVar4;
            fVar227 = pfVar4[1];
            fVar235 = pfVar4[2];
            fVar237 = pfVar4[3];
            fVar246 = pfVar4[4];
            fVar248 = pfVar4[5];
            fVar250 = pfVar4[6];
            pfVar5 = (float *)(lVar143 + 0x2229280 + lVar145 * 4);
            fVar252 = *pfVar5;
            fVar253 = pfVar5[1];
            fVar254 = pfVar5[2];
            fVar256 = pfVar5[3];
            fVar268 = pfVar5[4];
            fVar270 = pfVar5[5];
            fVar272 = pfVar5[6];
            pfVar6 = (float *)(lVar143 + 0x2228978 + lVar145 * 4);
            fVar274 = *pfVar6;
            fVar275 = pfVar6[1];
            fVar276 = pfVar6[2];
            fVar316 = pfVar6[3];
            fVar317 = pfVar6[4];
            fVar229 = pfVar6[5];
            fVar306 = pfVar6[6];
            fVar173 = pfVar4[7] + pfVar5[7];
            fVar200 = pfVar5[7] + fVar172 + 0.0;
            fVar292 = fVar172 + auVar346._28_4_ + fVar172 + 0.0;
            pfVar4 = (float *)(lVar143 + 0x22284f4 + lVar145 * 4);
            fVar318 = *pfVar4;
            fVar319 = pfVar4[1];
            fVar232 = pfVar4[2];
            fVar307 = pfVar4[3];
            fVar236 = pfVar4[4];
            fVar320 = pfVar4[5];
            fVar234 = pfVar4[6];
            local_5a0._4_4_ =
                 (float)local_c0._4_4_ * fVar319 +
                 (float)local_120._4_4_ * fVar275 +
                 (float)local_500._4_4_ * fVar227 + (float)local_4a0._4_4_ * fVar253;
            local_5a0._0_4_ =
                 (float)local_c0._0_4_ * fVar318 +
                 (float)local_120._0_4_ * fVar274 +
                 (float)local_500._0_4_ * fVar214 + (float)local_4a0._0_4_ * fVar252;
            fStack_598 = fStack_b8 * fVar232 +
                         fStack_118 * fVar276 + fStack_4f8 * fVar235 + fStack_498 * fVar254;
            fStack_594 = fStack_b4 * fVar307 +
                         fStack_114 * fVar316 + fStack_4f4 * fVar237 + fStack_494 * fVar256;
            auStack_590._0_4_ =
                 fStack_b0 * fVar236 +
                 fStack_110 * fVar317 + fStack_4f0 * fVar246 + fStack_490 * fVar268;
            auStack_590._4_4_ =
                 fStack_ac * fVar320 +
                 fStack_10c * fVar229 + fStack_4ec * fVar248 + fStack_48c * fVar270;
            fStack_588 = fStack_a8 * fVar234 +
                         fStack_108 * fVar306 + fStack_4e8 * fVar250 + fStack_488 * fVar272;
            fStack_584 = fVar173 + fVar200;
            auVar188._0_4_ =
                 fVar318 * (float)local_1e0._0_4_ +
                 fVar164 * fVar214 + (float)local_720._0_4_ * fVar252 +
                 fVar274 * (float)local_220._0_4_;
            auVar188._4_4_ =
                 fVar319 * (float)local_1e0._4_4_ +
                 fVar166 * fVar227 + (float)local_720._4_4_ * fVar253 +
                 fVar275 * (float)local_220._4_4_;
            auVar188._8_4_ =
                 fVar232 * fStack_1d8 +
                 fVar199 * fVar235 + fStack_718 * fVar254 + fVar276 * fStack_218;
            auVar188._12_4_ =
                 fVar307 * fStack_1d4 +
                 fVar308 * fVar237 + fStack_714 * fVar256 + fVar316 * fStack_214;
            auVar188._16_4_ =
                 fVar236 * fStack_1d0 +
                 fVar213 * fVar246 + fStack_710 * fVar268 + fVar317 * fStack_210;
            auVar188._20_4_ =
                 fVar320 * fStack_1cc +
                 fVar228 * fVar248 + fStack_70c * fVar270 + fVar229 * fStack_20c;
            auVar188._24_4_ =
                 fVar234 * fStack_1c8 +
                 fVar231 * fVar250 + fStack_708 * fVar272 + fVar306 * fStack_208;
            auVar188._28_4_ = fVar200 + fVar292;
            auVar356._0_4_ =
                 fVar274 * (float)local_480._0_4_ +
                 (float)local_e0._0_4_ * fVar214 + (float)local_6a0._0_4_ * fVar252 +
                 fVar318 * (float)local_620._0_4_;
            auVar356._4_4_ =
                 fVar275 * (float)local_480._4_4_ +
                 (float)local_e0._4_4_ * fVar227 + (float)local_6a0._4_4_ * fVar253 +
                 fVar319 * (float)local_620._4_4_;
            auVar356._8_4_ =
                 fVar276 * fStack_478 + fStack_d8 * fVar235 + fStack_698 * fVar254 +
                 fVar232 * fStack_618;
            auVar356._12_4_ =
                 fVar316 * fStack_474 + fStack_d4 * fVar237 + fStack_694 * fVar256 +
                 fVar307 * fStack_614;
            auVar356._16_4_ =
                 fVar317 * fStack_470 + fStack_d0 * fVar246 + fStack_690 * fVar268 +
                 fVar236 * fStack_610;
            auVar356._20_4_ =
                 fVar229 * fStack_46c + fStack_cc * fVar248 + fStack_68c * fVar270 +
                 fVar320 * fStack_60c;
            auVar356._24_4_ =
                 fVar306 * fStack_468 + fStack_c8 * fVar250 + fStack_688 * fVar272 +
                 fVar234 * fStack_608;
            auVar356._28_4_ = pfVar6[7] + fVar173 + fVar292;
            pfVar4 = (float *)(lVar143 + 0x222b21c + lVar145 * 4);
            fVar214 = *pfVar4;
            fVar227 = pfVar4[1];
            fVar235 = pfVar4[2];
            fVar237 = pfVar4[3];
            fVar246 = pfVar4[4];
            fVar248 = pfVar4[5];
            fVar250 = pfVar4[6];
            pfVar5 = (float *)(lVar143 + 0x222b6a0 + lVar145 * 4);
            fVar252 = *pfVar5;
            fVar253 = pfVar5[1];
            fVar254 = pfVar5[2];
            fVar256 = pfVar5[3];
            fVar268 = pfVar5[4];
            fVar270 = pfVar5[5];
            fVar272 = pfVar5[6];
            pfVar6 = (float *)(lVar143 + 0x222ad98 + lVar145 * 4);
            fVar274 = *pfVar6;
            fVar275 = pfVar6[1];
            fVar276 = pfVar6[2];
            fVar316 = pfVar6[3];
            fVar317 = pfVar6[4];
            fVar229 = pfVar6[5];
            fVar306 = pfVar6[6];
            pfVar7 = (float *)(lVar143 + 0x222a914 + lVar145 * 4);
            fVar318 = *pfVar7;
            fVar319 = pfVar7[1];
            fVar232 = pfVar7[2];
            fVar307 = pfVar7[3];
            fVar236 = pfVar7[4];
            fVar320 = pfVar7[5];
            fVar234 = pfVar7[6];
            auVar326._0_4_ =
                 (float)local_c0._0_4_ * fVar318 +
                 (float)local_120._0_4_ * fVar274 +
                 (float)local_500._0_4_ * fVar214 + (float)local_4a0._0_4_ * fVar252;
            auVar326._4_4_ =
                 (float)local_c0._4_4_ * fVar319 +
                 (float)local_120._4_4_ * fVar275 +
                 (float)local_500._4_4_ * fVar227 + (float)local_4a0._4_4_ * fVar253;
            auVar326._8_4_ =
                 fStack_b8 * fVar232 +
                 fStack_118 * fVar276 + fStack_4f8 * fVar235 + fStack_498 * fVar254;
            auVar326._12_4_ =
                 fStack_b4 * fVar307 +
                 fStack_114 * fVar316 + fStack_4f4 * fVar237 + fStack_494 * fVar256;
            auVar326._16_4_ =
                 fStack_b0 * fVar236 +
                 fStack_110 * fVar317 + fStack_4f0 * fVar246 + fStack_490 * fVar268;
            auVar326._20_4_ =
                 fStack_ac * fVar320 +
                 fStack_10c * fVar229 + fStack_4ec * fVar248 + fStack_48c * fVar270;
            auVar326._24_4_ =
                 fStack_a8 * fVar234 +
                 fStack_108 * fVar306 + fStack_4e8 * fVar250 + fStack_488 * fVar272;
            auVar326._28_4_ = fStack_a4 + fStack_a4 + fStack_484 + fStack_a4;
            auVar351._0_4_ =
                 fVar318 * (float)local_1e0._0_4_ +
                 fVar274 * (float)local_220._0_4_ +
                 fVar164 * fVar214 + (float)local_720._0_4_ * fVar252;
            auVar351._4_4_ =
                 fVar319 * (float)local_1e0._4_4_ +
                 fVar275 * (float)local_220._4_4_ +
                 fVar166 * fVar227 + (float)local_720._4_4_ * fVar253;
            auVar351._8_4_ =
                 fVar232 * fStack_1d8 +
                 fVar276 * fStack_218 + fVar199 * fVar235 + fStack_718 * fVar254;
            auVar351._12_4_ =
                 fVar307 * fStack_1d4 +
                 fVar316 * fStack_214 + fVar308 * fVar237 + fStack_714 * fVar256;
            auVar351._16_4_ =
                 fVar236 * fStack_1d0 +
                 fVar317 * fStack_210 + fVar213 * fVar246 + fStack_710 * fVar268;
            auVar351._20_4_ =
                 fVar320 * fStack_1cc +
                 fVar229 * fStack_20c + fVar228 * fVar248 + fStack_70c * fVar270;
            auVar351._24_4_ =
                 fVar234 * fStack_1c8 +
                 fVar306 * fStack_208 + fVar231 * fVar250 + fStack_708 * fVar272;
            auVar351._28_4_ = fStack_a4 + fStack_a4 + fStack_704 + fStack_a4;
            auVar267._8_4_ = 0x7fffffff;
            auVar267._0_8_ = 0x7fffffff7fffffff;
            auVar267._12_4_ = 0x7fffffff;
            auVar267._16_4_ = 0x7fffffff;
            auVar267._20_4_ = 0x7fffffff;
            auVar267._24_4_ = 0x7fffffff;
            auVar267._28_4_ = 0x7fffffff;
            auVar150 = vandps_avx(_local_5a0,auVar267);
            auVar27 = vandps_avx(auVar188,auVar267);
            auVar27 = vmaxps_avx(auVar150,auVar27);
            auVar150 = vandps_avx(auVar356,auVar267);
            auVar27 = vmaxps_avx(auVar27,auVar150);
            auVar27 = vcmpps_avx(auVar27,_local_240,1);
            auVar28 = vblendvps_avx(_local_5a0,auVar25,auVar27);
            auVar157._0_4_ =
                 fVar318 * (float)local_620._0_4_ +
                 fVar274 * (float)local_480._0_4_ +
                 fVar252 * (float)local_6a0._0_4_ + (float)local_e0._0_4_ * fVar214;
            auVar157._4_4_ =
                 fVar319 * (float)local_620._4_4_ +
                 fVar275 * (float)local_480._4_4_ +
                 fVar253 * (float)local_6a0._4_4_ + (float)local_e0._4_4_ * fVar227;
            auVar157._8_4_ =
                 fVar232 * fStack_618 +
                 fVar276 * fStack_478 + fVar254 * fStack_698 + fStack_d8 * fVar235;
            auVar157._12_4_ =
                 fVar307 * fStack_614 +
                 fVar316 * fStack_474 + fVar256 * fStack_694 + fStack_d4 * fVar237;
            auVar157._16_4_ =
                 fVar236 * fStack_610 +
                 fVar317 * fStack_470 + fVar268 * fStack_690 + fStack_d0 * fVar246;
            auVar157._20_4_ =
                 fVar320 * fStack_60c +
                 fVar229 * fStack_46c + fVar270 * fStack_68c + fStack_cc * fVar248;
            auVar157._24_4_ =
                 fVar234 * fStack_608 +
                 fVar306 * fStack_468 + fVar272 * fStack_688 + fStack_c8 * fVar250;
            auVar157._28_4_ = auVar150._28_4_ + pfVar6[7] + pfVar5[7] + pfVar4[7];
            auVar29 = vblendvps_avx(auVar188,auVar26,auVar27);
            auVar150 = vandps_avx(auVar326,auVar267);
            auVar27 = vandps_avx(auVar351,auVar267);
            auVar30 = vmaxps_avx(auVar150,auVar27);
            auVar150 = vandps_avx(auVar157,auVar267);
            auVar150 = vmaxps_avx(auVar30,auVar150);
            local_7c0._0_4_ = auVar136._0_4_;
            local_7c0._4_4_ = auVar136._4_4_;
            uStack_7b8._0_4_ = auVar136._8_4_;
            uStack_7b8._4_4_ = auVar136._12_4_;
            auStack_7b0._0_4_ = auVar136._16_4_;
            auStack_7b0._4_4_ = auVar136._20_4_;
            fStack_7a8 = auVar136._24_4_;
            auVar27 = vcmpps_avx(auVar150,_local_240,1);
            auVar150 = vblendvps_avx(auVar326,auVar25,auVar27);
            auVar158._0_4_ =
                 (float)local_620._0_4_ * (float)local_7c0._0_4_ +
                 (float)local_480._0_4_ * (float)local_6e0._0_4_ +
                 fVar174 + (float)local_6a0._0_4_ * local_5c0;
            auVar158._4_4_ =
                 (float)local_620._4_4_ * (float)local_7c0._4_4_ +
                 (float)local_480._4_4_ * (float)local_6e0._4_4_ +
                 fVar195 + (float)local_6a0._4_4_ * fStack_5bc;
            auVar158._8_4_ =
                 fStack_618 * (float)uStack_7b8 +
                 fStack_478 * fStack_6d8 + fVar196 + fStack_698 * fStack_5b8;
            auVar158._12_4_ =
                 fStack_614 * uStack_7b8._4_4_ +
                 fStack_474 * fStack_6d4 + fVar255 + fStack_694 * fStack_5b4;
            auVar158._16_4_ =
                 fStack_610 * (float)auStack_7b0._0_4_ +
                 fStack_470 * (float)auStack_6d0._0_4_ + fVar291 + fStack_690 * fStack_5b0;
            auVar158._20_4_ =
                 fStack_60c * (float)auStack_7b0._4_4_ +
                 fStack_46c * (float)auStack_6d0._4_4_ + fVar197 + fStack_68c * fStack_5ac;
            auVar158._24_4_ =
                 fStack_608 * fStack_7a8 +
                 fStack_468 * fStack_6c8 + fVar198 + fStack_688 * fStack_5a8;
            auVar158._28_4_ = auVar30._28_4_ + fStack_5c4 + auVar204._12_4_ + 0.0;
            auVar26 = vblendvps_avx(auVar351,auVar26,auVar27);
            fVar166 = auVar28._0_4_;
            fVar199 = auVar28._4_4_;
            fVar308 = auVar28._8_4_;
            fVar213 = auVar28._12_4_;
            fVar228 = auVar28._16_4_;
            fVar231 = auVar28._20_4_;
            fVar197 = auVar28._24_4_;
            fVar198 = auVar28._28_4_;
            fVar274 = auVar150._0_4_;
            fVar276 = auVar150._4_4_;
            fVar317 = auVar150._8_4_;
            fVar306 = auVar150._12_4_;
            fVar319 = auVar150._16_4_;
            fVar307 = auVar150._20_4_;
            fVar320 = auVar150._24_4_;
            fVar214 = auVar29._0_4_;
            fVar235 = auVar29._4_4_;
            fVar246 = auVar29._8_4_;
            fVar250 = auVar29._12_4_;
            fVar253 = auVar29._16_4_;
            fVar256 = auVar29._20_4_;
            fVar270 = auVar29._24_4_;
            auVar337._0_4_ = fVar214 * fVar214 + fVar166 * fVar166;
            auVar337._4_4_ = fVar235 * fVar235 + fVar199 * fVar199;
            auVar337._8_4_ = fVar246 * fVar246 + fVar308 * fVar308;
            auVar337._12_4_ = fVar250 * fVar250 + fVar213 * fVar213;
            auVar337._16_4_ = fVar253 * fVar253 + fVar228 * fVar228;
            auVar337._20_4_ = fVar256 * fVar256 + fVar231 * fVar231;
            auVar337._24_4_ = fVar270 * fVar270 + fVar197 * fVar197;
            auVar337._28_4_ = auVar25._28_4_ + fStack_a4;
            auVar25 = vrsqrtps_avx(auVar337);
            fVar227 = auVar25._0_4_;
            fVar237 = auVar25._4_4_;
            auVar77._4_4_ = fVar237 * 1.5;
            auVar77._0_4_ = fVar227 * 1.5;
            fVar248 = auVar25._8_4_;
            auVar77._8_4_ = fVar248 * 1.5;
            fVar252 = auVar25._12_4_;
            auVar77._12_4_ = fVar252 * 1.5;
            fVar254 = auVar25._16_4_;
            auVar77._16_4_ = fVar254 * 1.5;
            fVar268 = auVar25._20_4_;
            auVar77._20_4_ = fVar268 * 1.5;
            fVar272 = auVar25._24_4_;
            auVar77._24_4_ = fVar272 * 1.5;
            auVar77._28_4_ = auVar351._28_4_;
            auVar78._4_4_ = fVar237 * fVar237 * fVar237 * auVar337._4_4_ * 0.5;
            auVar78._0_4_ = fVar227 * fVar227 * fVar227 * auVar337._0_4_ * 0.5;
            auVar78._8_4_ = fVar248 * fVar248 * fVar248 * auVar337._8_4_ * 0.5;
            auVar78._12_4_ = fVar252 * fVar252 * fVar252 * auVar337._12_4_ * 0.5;
            auVar78._16_4_ = fVar254 * fVar254 * fVar254 * auVar337._16_4_ * 0.5;
            auVar78._20_4_ = fVar268 * fVar268 * fVar268 * auVar337._20_4_ * 0.5;
            auVar78._24_4_ = fVar272 * fVar272 * fVar272 * auVar337._24_4_ * 0.5;
            auVar78._28_4_ = auVar337._28_4_;
            auVar27 = vsubps_avx(auVar77,auVar78);
            fVar173 = auVar27._0_4_;
            fVar174 = auVar27._4_4_;
            fVar195 = auVar27._8_4_;
            fVar196 = auVar27._12_4_;
            fVar255 = auVar27._16_4_;
            fVar291 = auVar27._20_4_;
            fVar164 = auVar27._24_4_;
            fVar227 = auVar26._0_4_;
            fVar237 = auVar26._4_4_;
            fVar248 = auVar26._8_4_;
            fVar252 = auVar26._12_4_;
            fVar254 = auVar26._16_4_;
            fVar268 = auVar26._20_4_;
            fVar272 = auVar26._24_4_;
            auVar314._0_4_ = fVar227 * fVar227 + fVar274 * fVar274;
            auVar314._4_4_ = fVar237 * fVar237 + fVar276 * fVar276;
            auVar314._8_4_ = fVar248 * fVar248 + fVar317 * fVar317;
            auVar314._12_4_ = fVar252 * fVar252 + fVar306 * fVar306;
            auVar314._16_4_ = fVar254 * fVar254 + fVar319 * fVar319;
            auVar314._20_4_ = fVar268 * fVar268 + fVar307 * fVar307;
            auVar314._24_4_ = fVar272 * fVar272 + fVar320 * fVar320;
            auVar314._28_4_ = auVar25._28_4_ + auVar150._28_4_;
            auVar150 = vrsqrtps_avx(auVar314);
            fVar275 = auVar150._0_4_;
            fVar316 = auVar150._4_4_;
            auVar79._4_4_ = fVar316 * 1.5;
            auVar79._0_4_ = fVar275 * 1.5;
            fVar229 = auVar150._8_4_;
            auVar79._8_4_ = fVar229 * 1.5;
            fVar318 = auVar150._12_4_;
            auVar79._12_4_ = fVar318 * 1.5;
            fVar232 = auVar150._16_4_;
            auVar79._16_4_ = fVar232 * 1.5;
            fVar236 = auVar150._20_4_;
            auVar79._20_4_ = fVar236 * 1.5;
            fVar234 = auVar150._24_4_;
            auVar79._24_4_ = fVar234 * 1.5;
            auVar79._28_4_ = auVar351._28_4_;
            auVar80._4_4_ = fVar316 * fVar316 * fVar316 * auVar314._4_4_ * 0.5;
            auVar80._0_4_ = fVar275 * fVar275 * fVar275 * auVar314._0_4_ * 0.5;
            auVar80._8_4_ = fVar229 * fVar229 * fVar229 * auVar314._8_4_ * 0.5;
            auVar80._12_4_ = fVar318 * fVar318 * fVar318 * auVar314._12_4_ * 0.5;
            auVar80._16_4_ = fVar232 * fVar232 * fVar232 * auVar314._16_4_ * 0.5;
            auVar80._20_4_ = fVar236 * fVar236 * fVar236 * auVar314._20_4_ * 0.5;
            auVar80._24_4_ = fVar234 * fVar234 * fVar234 * auVar314._24_4_ * 0.5;
            auVar80._28_4_ = auVar314._28_4_;
            auVar25 = vsubps_avx(auVar79,auVar80);
            fVar275 = auVar25._0_4_;
            fVar316 = auVar25._4_4_;
            fVar229 = auVar25._8_4_;
            fVar318 = auVar25._12_4_;
            fVar232 = auVar25._16_4_;
            fVar236 = auVar25._20_4_;
            fVar234 = auVar25._24_4_;
            fVar214 = fVar147 * fVar173 * fVar214;
            fVar235 = fVar163 * fVar174 * fVar235;
            auVar81._4_4_ = fVar235;
            auVar81._0_4_ = fVar214;
            fVar246 = fVar165 * fVar195 * fVar246;
            auVar81._8_4_ = fVar246;
            fVar250 = fVar167 * fVar196 * fVar250;
            auVar81._12_4_ = fVar250;
            fVar253 = fVar168 * fVar255 * fVar253;
            auVar81._16_4_ = fVar253;
            fVar256 = fVar170 * fVar291 * fVar256;
            auVar81._20_4_ = fVar256;
            fVar270 = fVar171 * fVar164 * fVar270;
            auVar81._24_4_ = fVar270;
            auVar81._28_4_ = auVar150._28_4_;
            local_7c0._4_4_ = fVar235 + auVar370._4_4_;
            local_7c0._0_4_ = fVar214 + auVar370._0_4_;
            uStack_7b8._0_4_ = fVar246 + auVar370._8_4_;
            uStack_7b8._4_4_ = fVar250 + auVar370._12_4_;
            auStack_7b0._0_4_ = fVar253 + auVar370._16_4_;
            auStack_7b0._4_4_ = fVar256 + auVar370._20_4_;
            fStack_7a8 = fVar270 + auVar370._24_4_;
            fStack_7a4 = auVar150._28_4_ + auVar370._28_4_;
            fVar214 = fVar147 * fVar173 * -fVar166;
            fVar235 = fVar163 * fVar174 * -fVar199;
            auVar82._4_4_ = fVar235;
            auVar82._0_4_ = fVar214;
            fVar246 = fVar165 * fVar195 * -fVar308;
            auVar82._8_4_ = fVar246;
            fVar250 = fVar167 * fVar196 * -fVar213;
            auVar82._12_4_ = fVar250;
            fVar253 = fVar168 * fVar255 * -fVar228;
            auVar82._16_4_ = fVar253;
            fVar256 = fVar170 * fVar291 * -fVar231;
            auVar82._20_4_ = fVar256;
            fVar270 = fVar171 * fVar164 * -fVar197;
            auVar82._24_4_ = fVar270;
            auVar82._28_4_ = -fVar198;
            local_6e0._4_4_ = local_740._4_4_ + fVar235;
            local_6e0._0_4_ = (float)local_740._0_4_ + fVar214;
            fStack_6d8 = local_740._8_4_ + fVar246;
            fStack_6d4 = local_740._12_4_ + fVar250;
            auStack_6d0._0_4_ = local_740._16_4_ + fVar253;
            auStack_6d0._4_4_ = local_740._20_4_ + fVar256;
            fStack_6c8 = local_740._24_4_ + fVar270;
            fStack_6c4 = local_740._28_4_ + -fVar198;
            fVar214 = fVar173 * 0.0 * fVar147;
            fVar235 = fVar174 * 0.0 * fVar163;
            auVar83._4_4_ = fVar235;
            auVar83._0_4_ = fVar214;
            fVar246 = fVar195 * 0.0 * fVar165;
            auVar83._8_4_ = fVar246;
            fVar250 = fVar196 * 0.0 * fVar167;
            auVar83._12_4_ = fVar250;
            fVar253 = fVar255 * 0.0 * fVar168;
            auVar83._16_4_ = fVar253;
            fVar256 = fVar291 * 0.0 * fVar170;
            auVar83._20_4_ = fVar256;
            fVar270 = fVar164 * 0.0 * fVar171;
            auVar83._24_4_ = fVar270;
            auVar83._28_4_ = fVar198;
            auVar30 = vsubps_avx(auVar370,auVar81);
            auVar371._0_4_ = fVar214 + auVar158._0_4_;
            auVar371._4_4_ = fVar235 + auVar158._4_4_;
            auVar371._8_4_ = fVar246 + auVar158._8_4_;
            auVar371._12_4_ = fVar250 + auVar158._12_4_;
            auVar371._16_4_ = fVar253 + auVar158._16_4_;
            auVar371._20_4_ = fVar256 + auVar158._20_4_;
            auVar371._24_4_ = fVar270 + auVar158._24_4_;
            auVar371._28_4_ = fVar198 + auVar158._28_4_;
            fVar214 = auVar187._0_4_ * fVar275 * fVar227;
            fVar227 = auVar187._4_4_ * fVar316 * fVar237;
            auVar84._4_4_ = fVar227;
            auVar84._0_4_ = fVar214;
            fVar235 = auVar187._8_4_ * fVar229 * fVar248;
            auVar84._8_4_ = fVar235;
            fVar237 = auVar187._12_4_ * fVar318 * fVar252;
            auVar84._12_4_ = fVar237;
            fVar246 = auVar187._16_4_ * fVar232 * fVar254;
            auVar84._16_4_ = fVar246;
            fVar248 = auVar187._20_4_ * fVar236 * fVar268;
            auVar84._20_4_ = fVar248;
            fVar250 = auVar187._24_4_ * fVar234 * fVar272;
            auVar84._24_4_ = fVar250;
            auVar84._28_4_ = fVar172;
            auVar151 = vsubps_avx(local_740,auVar82);
            auVar357._0_4_ = auVar286._0_4_ + fVar214;
            auVar357._4_4_ = auVar286._4_4_ + fVar227;
            auVar357._8_4_ = auVar286._8_4_ + fVar235;
            auVar357._12_4_ = auVar286._12_4_ + fVar237;
            auVar357._16_4_ = auVar286._16_4_ + fVar246;
            auVar357._20_4_ = auVar286._20_4_ + fVar248;
            auVar357._24_4_ = auVar286._24_4_ + fVar250;
            auVar357._28_4_ = auVar286._28_4_ + fVar172;
            fVar214 = fVar275 * -fVar274 * auVar187._0_4_;
            fVar227 = fVar316 * -fVar276 * auVar187._4_4_;
            auVar85._4_4_ = fVar227;
            auVar85._0_4_ = fVar214;
            fVar235 = fVar229 * -fVar317 * auVar187._8_4_;
            auVar85._8_4_ = fVar235;
            fVar237 = fVar318 * -fVar306 * auVar187._12_4_;
            auVar85._12_4_ = fVar237;
            fVar246 = fVar232 * -fVar319 * auVar187._16_4_;
            auVar85._16_4_ = fVar246;
            fVar248 = fVar236 * -fVar307 * auVar187._20_4_;
            auVar85._20_4_ = fVar248;
            fVar250 = fVar234 * -fVar320 * auVar187._24_4_;
            auVar85._24_4_ = fVar250;
            auVar85._28_4_ = auVar370._28_4_;
            auVar152 = vsubps_avx(auVar158,auVar83);
            auVar244._0_4_ = auVar266._0_4_ + fVar214;
            auVar244._4_4_ = auVar266._4_4_ + fVar227;
            auVar244._8_4_ = auVar266._8_4_ + fVar235;
            auVar244._12_4_ = auVar266._12_4_ + fVar237;
            auVar244._16_4_ = auVar266._16_4_ + fVar246;
            auVar244._20_4_ = auVar266._20_4_ + fVar248;
            auVar244._24_4_ = auVar266._24_4_ + fVar250;
            auVar244._28_4_ = auVar266._28_4_ + auVar370._28_4_;
            fVar214 = fVar275 * 0.0 * auVar187._0_4_;
            fVar227 = fVar316 * 0.0 * auVar187._4_4_;
            auVar86._4_4_ = fVar227;
            auVar86._0_4_ = fVar214;
            fVar235 = fVar229 * 0.0 * auVar187._8_4_;
            auVar86._8_4_ = fVar235;
            fVar237 = fVar318 * 0.0 * auVar187._12_4_;
            auVar86._12_4_ = fVar237;
            fVar246 = fVar232 * 0.0 * auVar187._16_4_;
            auVar86._16_4_ = fVar246;
            fVar248 = fVar236 * 0.0 * auVar187._20_4_;
            auVar86._20_4_ = fVar248;
            fVar250 = fVar234 * 0.0 * auVar187._24_4_;
            auVar86._24_4_ = fVar250;
            auVar86._28_4_ = auVar158._28_4_;
            auVar150 = vsubps_avx(auVar286,auVar84);
            auVar327._0_4_ = (float)local_5e0._0_4_ + fVar214;
            auVar327._4_4_ = (float)local_5e0._4_4_ + fVar227;
            auVar327._8_4_ = fStack_5d8 + fVar235;
            auVar327._12_4_ = fStack_5d4 + fVar237;
            auVar327._16_4_ = fStack_5d0 + fVar246;
            auVar327._20_4_ = fStack_5cc + fVar248;
            auVar327._24_4_ = fStack_5c8 + fVar250;
            auVar327._28_4_ = fStack_5c4 + auVar158._28_4_;
            auVar26 = vsubps_avx(auVar266,auVar85);
            auVar27 = vsubps_avx(_local_5e0,auVar86);
            auVar28 = vsubps_avx(auVar244,auVar151);
            auVar29 = vsubps_avx(auVar327,auVar152);
            auVar87._4_4_ = auVar152._4_4_ * auVar28._4_4_;
            auVar87._0_4_ = auVar152._0_4_ * auVar28._0_4_;
            auVar87._8_4_ = auVar152._8_4_ * auVar28._8_4_;
            auVar87._12_4_ = auVar152._12_4_ * auVar28._12_4_;
            auVar87._16_4_ = auVar152._16_4_ * auVar28._16_4_;
            auVar87._20_4_ = auVar152._20_4_ * auVar28._20_4_;
            auVar87._24_4_ = auVar152._24_4_ * auVar28._24_4_;
            auVar87._28_4_ = auVar351._28_4_;
            auVar88._4_4_ = auVar151._4_4_ * auVar29._4_4_;
            auVar88._0_4_ = auVar151._0_4_ * auVar29._0_4_;
            auVar88._8_4_ = auVar151._8_4_ * auVar29._8_4_;
            auVar88._12_4_ = auVar151._12_4_ * auVar29._12_4_;
            auVar88._16_4_ = auVar151._16_4_ * auVar29._16_4_;
            auVar88._20_4_ = auVar151._20_4_ * auVar29._20_4_;
            auVar88._24_4_ = auVar151._24_4_ * auVar29._24_4_;
            auVar88._28_4_ = fStack_5c4;
            auVar31 = vsubps_avx(auVar88,auVar87);
            auVar89._4_4_ = auVar30._4_4_ * auVar29._4_4_;
            auVar89._0_4_ = auVar30._0_4_ * auVar29._0_4_;
            auVar89._8_4_ = auVar30._8_4_ * auVar29._8_4_;
            auVar89._12_4_ = auVar30._12_4_ * auVar29._12_4_;
            auVar89._16_4_ = auVar30._16_4_ * auVar29._16_4_;
            auVar89._20_4_ = auVar30._20_4_ * auVar29._20_4_;
            auVar89._24_4_ = auVar30._24_4_ * auVar29._24_4_;
            auVar89._28_4_ = auVar29._28_4_;
            auVar29 = vsubps_avx(auVar357,auVar30);
            auVar90._4_4_ = auVar152._4_4_ * auVar29._4_4_;
            auVar90._0_4_ = auVar152._0_4_ * auVar29._0_4_;
            auVar90._8_4_ = auVar152._8_4_ * auVar29._8_4_;
            auVar90._12_4_ = auVar152._12_4_ * auVar29._12_4_;
            auVar90._16_4_ = auVar152._16_4_ * auVar29._16_4_;
            auVar90._20_4_ = auVar152._20_4_ * auVar29._20_4_;
            auVar90._24_4_ = auVar152._24_4_ * auVar29._24_4_;
            auVar90._28_4_ = auVar25._28_4_;
            auVar32 = vsubps_avx(auVar90,auVar89);
            auVar91._4_4_ = auVar151._4_4_ * auVar29._4_4_;
            auVar91._0_4_ = auVar151._0_4_ * auVar29._0_4_;
            auVar91._8_4_ = auVar151._8_4_ * auVar29._8_4_;
            auVar91._12_4_ = auVar151._12_4_ * auVar29._12_4_;
            auVar91._16_4_ = auVar151._16_4_ * auVar29._16_4_;
            auVar91._20_4_ = auVar151._20_4_ * auVar29._20_4_;
            auVar91._24_4_ = auVar151._24_4_ * auVar29._24_4_;
            auVar91._28_4_ = auVar25._28_4_;
            auVar92._4_4_ = auVar30._4_4_ * auVar28._4_4_;
            auVar92._0_4_ = auVar30._0_4_ * auVar28._0_4_;
            auVar92._8_4_ = auVar30._8_4_ * auVar28._8_4_;
            auVar92._12_4_ = auVar30._12_4_ * auVar28._12_4_;
            auVar92._16_4_ = auVar30._16_4_ * auVar28._16_4_;
            auVar92._20_4_ = auVar30._20_4_ * auVar28._20_4_;
            auVar92._24_4_ = auVar30._24_4_ * auVar28._24_4_;
            auVar92._28_4_ = auVar28._28_4_;
            auVar25 = vsubps_avx(auVar92,auVar91);
            auVar189._0_4_ = auVar31._0_4_ * 0.0 + auVar25._0_4_ + auVar32._0_4_ * 0.0;
            auVar189._4_4_ = auVar31._4_4_ * 0.0 + auVar25._4_4_ + auVar32._4_4_ * 0.0;
            auVar189._8_4_ = auVar31._8_4_ * 0.0 + auVar25._8_4_ + auVar32._8_4_ * 0.0;
            auVar189._12_4_ = auVar31._12_4_ * 0.0 + auVar25._12_4_ + auVar32._12_4_ * 0.0;
            auVar189._16_4_ = auVar31._16_4_ * 0.0 + auVar25._16_4_ + auVar32._16_4_ * 0.0;
            auVar189._20_4_ = auVar31._20_4_ * 0.0 + auVar25._20_4_ + auVar32._20_4_ * 0.0;
            auVar189._24_4_ = auVar31._24_4_ * 0.0 + auVar25._24_4_ + auVar32._24_4_ * 0.0;
            auVar189._28_4_ = auVar31._28_4_ + auVar25._28_4_ + auVar32._28_4_;
            auVar24 = vcmpps_avx(auVar189,ZEXT832(0) << 0x20,2);
            auVar150 = vblendvps_avx(auVar150,_local_7c0,auVar24);
            auVar224 = ZEXT3264(auVar150);
            auVar25 = vblendvps_avx(auVar26,_local_6e0,auVar24);
            auVar26 = vblendvps_avx(auVar27,auVar371,auVar24);
            auVar27 = vblendvps_avx(auVar30,auVar357,auVar24);
            auVar28 = vblendvps_avx(auVar151,auVar244,auVar24);
            auVar29 = vblendvps_avx(auVar152,auVar327,auVar24);
            auVar30 = vblendvps_avx(auVar357,auVar30,auVar24);
            auVar31 = vblendvps_avx(auVar244,auVar151,auVar24);
            auVar32 = vblendvps_avx(auVar327,auVar152,auVar24);
            local_740 = vandps_avx(_local_200,auVar312);
            auVar30 = vsubps_avx(auVar30,auVar150);
            auVar181 = vsubps_avx(auVar31,auVar25);
            auVar32 = vsubps_avx(auVar32,auVar26);
            auVar182 = vsubps_avx(auVar25,auVar28);
            auVar240 = auVar182._0_16_;
            fVar214 = auVar181._0_4_;
            fVar238 = auVar26._0_4_;
            fVar252 = auVar181._4_4_;
            fVar247 = auVar26._4_4_;
            auVar93._4_4_ = fVar247 * fVar252;
            auVar93._0_4_ = fVar238 * fVar214;
            fVar274 = auVar181._8_4_;
            fVar249 = auVar26._8_4_;
            auVar93._8_4_ = fVar249 * fVar274;
            fVar318 = auVar181._12_4_;
            fVar251 = auVar26._12_4_;
            auVar93._12_4_ = fVar251 * fVar318;
            fVar173 = auVar181._16_4_;
            fVar257 = auVar26._16_4_;
            auVar93._16_4_ = fVar257 * fVar173;
            fVar166 = auVar181._20_4_;
            fVar269 = auVar26._20_4_;
            auVar93._20_4_ = fVar269 * fVar166;
            fVar198 = auVar181._24_4_;
            fVar271 = auVar26._24_4_;
            auVar93._24_4_ = fVar271 * fVar198;
            auVar93._28_4_ = auVar31._28_4_;
            fVar227 = auVar25._0_4_;
            fVar273 = auVar32._0_4_;
            fVar253 = auVar25._4_4_;
            fVar277 = auVar32._4_4_;
            auVar94._4_4_ = fVar277 * fVar253;
            auVar94._0_4_ = fVar273 * fVar227;
            fVar275 = auVar25._8_4_;
            fVar288 = auVar32._8_4_;
            auVar94._8_4_ = fVar288 * fVar275;
            fVar319 = auVar25._12_4_;
            fVar289 = auVar32._12_4_;
            auVar94._12_4_ = fVar289 * fVar319;
            fVar174 = auVar25._16_4_;
            fVar290 = auVar32._16_4_;
            auVar94._16_4_ = fVar290 * fVar174;
            fVar199 = auVar25._20_4_;
            fVar293 = auVar32._20_4_;
            auVar94._20_4_ = fVar293 * fVar199;
            fVar200 = auVar25._24_4_;
            fVar303 = auVar32._24_4_;
            uVar8 = auVar151._28_4_;
            auVar94._24_4_ = fVar303 * fVar200;
            auVar94._28_4_ = uVar8;
            auVar31 = vsubps_avx(auVar94,auVar93);
            fVar235 = auVar150._0_4_;
            fVar254 = auVar150._4_4_;
            auVar95._4_4_ = fVar277 * fVar254;
            auVar95._0_4_ = fVar273 * fVar235;
            fVar276 = auVar150._8_4_;
            auVar95._8_4_ = fVar288 * fVar276;
            fVar232 = auVar150._12_4_;
            auVar95._12_4_ = fVar289 * fVar232;
            fVar195 = auVar150._16_4_;
            auVar95._16_4_ = fVar290 * fVar195;
            fVar308 = auVar150._20_4_;
            auVar95._20_4_ = fVar293 * fVar308;
            fVar292 = auVar150._24_4_;
            auVar95._24_4_ = fVar303 * fVar292;
            auVar95._28_4_ = uVar8;
            fVar237 = auVar30._0_4_;
            fVar256 = auVar30._4_4_;
            auVar96._4_4_ = fVar247 * fVar256;
            auVar96._0_4_ = fVar238 * fVar237;
            fVar316 = auVar30._8_4_;
            auVar96._8_4_ = fVar249 * fVar316;
            fVar307 = auVar30._12_4_;
            auVar96._12_4_ = fVar251 * fVar307;
            fVar196 = auVar30._16_4_;
            auVar96._16_4_ = fVar257 * fVar196;
            fVar213 = auVar30._20_4_;
            auVar96._20_4_ = fVar269 * fVar213;
            fVar368 = auVar30._24_4_;
            auVar96._24_4_ = fVar271 * fVar368;
            auVar96._28_4_ = auVar357._28_4_;
            auVar151 = vsubps_avx(auVar96,auVar95);
            auVar97._4_4_ = fVar253 * fVar256;
            auVar97._0_4_ = fVar227 * fVar237;
            auVar97._8_4_ = fVar275 * fVar316;
            auVar97._12_4_ = fVar319 * fVar307;
            auVar97._16_4_ = fVar174 * fVar196;
            auVar97._20_4_ = fVar199 * fVar213;
            auVar97._24_4_ = fVar200 * fVar368;
            auVar97._28_4_ = uVar8;
            auVar98._4_4_ = fVar254 * fVar252;
            auVar98._0_4_ = fVar235 * fVar214;
            auVar98._8_4_ = fVar276 * fVar274;
            auVar98._12_4_ = fVar232 * fVar318;
            auVar98._16_4_ = fVar195 * fVar173;
            auVar98._20_4_ = fVar308 * fVar166;
            auVar98._24_4_ = fVar292 * fVar198;
            auVar98._28_4_ = auVar152._28_4_;
            auVar152 = vsubps_avx(auVar98,auVar97);
            auVar183 = vsubps_avx(auVar26,auVar29);
            fVar248 = auVar152._28_4_ + auVar151._28_4_;
            auVar338._0_4_ = auVar152._0_4_ + auVar151._0_4_ * 0.0 + auVar31._0_4_ * 0.0;
            auVar338._4_4_ = auVar152._4_4_ + auVar151._4_4_ * 0.0 + auVar31._4_4_ * 0.0;
            auVar338._8_4_ = auVar152._8_4_ + auVar151._8_4_ * 0.0 + auVar31._8_4_ * 0.0;
            auVar338._12_4_ = auVar152._12_4_ + auVar151._12_4_ * 0.0 + auVar31._12_4_ * 0.0;
            auVar338._16_4_ = auVar152._16_4_ + auVar151._16_4_ * 0.0 + auVar31._16_4_ * 0.0;
            auVar338._20_4_ = auVar152._20_4_ + auVar151._20_4_ * 0.0 + auVar31._20_4_ * 0.0;
            auVar338._24_4_ = auVar152._24_4_ + auVar151._24_4_ * 0.0 + auVar31._24_4_ * 0.0;
            auVar338._28_4_ = fVar248 + auVar31._28_4_;
            fVar246 = auVar182._0_4_;
            fVar268 = auVar182._4_4_;
            auVar99._4_4_ = auVar29._4_4_ * fVar268;
            auVar99._0_4_ = auVar29._0_4_ * fVar246;
            fVar317 = auVar182._8_4_;
            auVar99._8_4_ = auVar29._8_4_ * fVar317;
            fVar236 = auVar182._12_4_;
            auVar99._12_4_ = auVar29._12_4_ * fVar236;
            fVar255 = auVar182._16_4_;
            auVar99._16_4_ = auVar29._16_4_ * fVar255;
            fVar228 = auVar182._20_4_;
            auVar99._20_4_ = auVar29._20_4_ * fVar228;
            fVar372 = auVar182._24_4_;
            auVar99._24_4_ = auVar29._24_4_ * fVar372;
            auVar99._28_4_ = fVar248;
            fVar248 = auVar183._0_4_;
            fVar270 = auVar183._4_4_;
            auVar100._4_4_ = auVar28._4_4_ * fVar270;
            auVar100._0_4_ = auVar28._0_4_ * fVar248;
            fVar229 = auVar183._8_4_;
            auVar100._8_4_ = auVar28._8_4_ * fVar229;
            fVar320 = auVar183._12_4_;
            auVar100._12_4_ = auVar28._12_4_ * fVar320;
            fVar291 = auVar183._16_4_;
            auVar100._16_4_ = auVar28._16_4_ * fVar291;
            fVar231 = auVar183._20_4_;
            auVar100._20_4_ = auVar28._20_4_ * fVar231;
            fVar373 = auVar183._24_4_;
            auVar100._24_4_ = auVar28._24_4_ * fVar373;
            auVar100._28_4_ = auVar152._28_4_;
            auVar151 = vsubps_avx(auVar100,auVar99);
            auVar152 = vsubps_avx(auVar150,auVar27);
            fVar250 = auVar152._0_4_;
            fVar272 = auVar152._4_4_;
            auVar101._4_4_ = auVar29._4_4_ * fVar272;
            auVar101._0_4_ = auVar29._0_4_ * fVar250;
            fVar306 = auVar152._8_4_;
            auVar101._8_4_ = auVar29._8_4_ * fVar306;
            fVar234 = auVar152._12_4_;
            auVar101._12_4_ = auVar29._12_4_ * fVar234;
            fVar164 = auVar152._16_4_;
            auVar101._16_4_ = auVar29._16_4_ * fVar164;
            fVar197 = auVar152._20_4_;
            auVar101._20_4_ = auVar29._20_4_ * fVar197;
            fVar374 = auVar152._24_4_;
            auVar101._24_4_ = auVar29._24_4_ * fVar374;
            auVar101._28_4_ = auVar29._28_4_;
            auVar102._4_4_ = fVar270 * auVar27._4_4_;
            auVar102._0_4_ = fVar248 * auVar27._0_4_;
            auVar102._8_4_ = fVar229 * auVar27._8_4_;
            auVar102._12_4_ = fVar320 * auVar27._12_4_;
            auVar102._16_4_ = fVar291 * auVar27._16_4_;
            auVar102._20_4_ = fVar231 * auVar27._20_4_;
            auVar102._24_4_ = fVar373 * auVar27._24_4_;
            auVar102._28_4_ = auVar31._28_4_;
            auVar29 = vsubps_avx(auVar101,auVar102);
            auVar103._4_4_ = auVar28._4_4_ * fVar272;
            auVar103._0_4_ = auVar28._0_4_ * fVar250;
            auVar103._8_4_ = auVar28._8_4_ * fVar306;
            auVar103._12_4_ = auVar28._12_4_ * fVar234;
            auVar103._16_4_ = auVar28._16_4_ * fVar164;
            auVar103._20_4_ = auVar28._20_4_ * fVar197;
            auVar103._24_4_ = auVar28._24_4_ * fVar374;
            auVar103._28_4_ = auVar28._28_4_;
            auVar104._4_4_ = fVar268 * auVar27._4_4_;
            auVar104._0_4_ = fVar246 * auVar27._0_4_;
            auVar104._8_4_ = fVar317 * auVar27._8_4_;
            auVar104._12_4_ = fVar236 * auVar27._12_4_;
            auVar104._16_4_ = fVar255 * auVar27._16_4_;
            auVar104._20_4_ = fVar228 * auVar27._20_4_;
            auVar104._24_4_ = fVar372 * auVar27._24_4_;
            auVar104._28_4_ = auVar27._28_4_;
            auVar27 = vsubps_avx(auVar104,auVar103);
            auVar159._0_4_ = auVar151._0_4_ * 0.0 + auVar27._0_4_ + auVar29._0_4_ * 0.0;
            auVar159._4_4_ = auVar151._4_4_ * 0.0 + auVar27._4_4_ + auVar29._4_4_ * 0.0;
            auVar159._8_4_ = auVar151._8_4_ * 0.0 + auVar27._8_4_ + auVar29._8_4_ * 0.0;
            auVar159._12_4_ = auVar151._12_4_ * 0.0 + auVar27._12_4_ + auVar29._12_4_ * 0.0;
            auVar159._16_4_ = auVar151._16_4_ * 0.0 + auVar27._16_4_ + auVar29._16_4_ * 0.0;
            auVar159._20_4_ = auVar151._20_4_ * 0.0 + auVar27._20_4_ + auVar29._20_4_ * 0.0;
            auVar159._24_4_ = auVar151._24_4_ * 0.0 + auVar27._24_4_ + auVar29._24_4_ * 0.0;
            auVar159._28_4_ = auVar29._28_4_ + auVar27._28_4_ + auVar29._28_4_;
            auVar162 = ZEXT3264(auVar159);
            auVar27 = vmaxps_avx(auVar338,auVar159);
            auVar27 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,2);
            auVar28 = local_740 & auVar27;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar28 >> 0x7f,0) == '\0') &&
                  (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0xbf,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar28[0x1f]) {
LAB_0118e2d4:
              auVar191._8_8_ = uStack_538;
              auVar191._0_8_ = local_540;
              auVar191._16_8_ = uStack_530;
              auVar191._24_8_ = uStack_528;
              auVar240 = vpcmpeqd_avx(auVar240,auVar240);
              auVar302 = ZEXT1664(auVar240);
              auVar364._4_4_ = fVar163;
              auVar364._0_4_ = fVar147;
              auVar364._8_4_ = fVar165;
              auVar364._12_4_ = fVar167;
              auVar364._16_4_ = fVar168;
              auVar364._20_4_ = fVar170;
              auVar364._24_4_ = fVar171;
              auVar364._28_4_ = fVar172;
            }
            else {
              auVar28 = vandps_avx(auVar27,local_740);
              auVar105._4_4_ = fVar270 * fVar252;
              auVar105._0_4_ = fVar248 * fVar214;
              auVar105._8_4_ = fVar229 * fVar274;
              auVar105._12_4_ = fVar320 * fVar318;
              auVar105._16_4_ = fVar291 * fVar173;
              auVar105._20_4_ = fVar231 * fVar166;
              auVar105._24_4_ = fVar373 * fVar198;
              auVar105._28_4_ = local_740._28_4_;
              auVar106._4_4_ = fVar268 * fVar277;
              auVar106._0_4_ = fVar246 * fVar273;
              auVar106._8_4_ = fVar317 * fVar288;
              auVar106._12_4_ = fVar236 * fVar289;
              auVar106._16_4_ = fVar255 * fVar290;
              auVar106._20_4_ = fVar228 * fVar293;
              auVar106._24_4_ = fVar372 * fVar303;
              auVar106._28_4_ = auVar27._28_4_;
              auVar29 = vsubps_avx(auVar106,auVar105);
              auVar107._4_4_ = fVar272 * fVar277;
              auVar107._0_4_ = fVar250 * fVar273;
              auVar107._8_4_ = fVar306 * fVar288;
              auVar107._12_4_ = fVar234 * fVar289;
              auVar107._16_4_ = fVar164 * fVar290;
              auVar107._20_4_ = fVar197 * fVar293;
              auVar107._24_4_ = fVar374 * fVar303;
              auVar107._28_4_ = auVar32._28_4_;
              auVar108._4_4_ = fVar270 * fVar256;
              auVar108._0_4_ = fVar248 * fVar237;
              auVar108._8_4_ = fVar229 * fVar316;
              auVar108._12_4_ = fVar320 * fVar307;
              auVar108._16_4_ = fVar291 * fVar196;
              auVar108._20_4_ = fVar231 * fVar213;
              auVar108._24_4_ = fVar373 * fVar368;
              auVar108._28_4_ = auVar183._28_4_;
              auVar31 = vsubps_avx(auVar108,auVar107);
              auVar109._4_4_ = fVar268 * fVar256;
              auVar109._0_4_ = fVar246 * fVar237;
              auVar109._8_4_ = fVar317 * fVar316;
              auVar109._12_4_ = fVar236 * fVar307;
              auVar109._16_4_ = fVar255 * fVar196;
              auVar109._20_4_ = fVar228 * fVar213;
              auVar109._24_4_ = fVar372 * fVar368;
              auVar109._28_4_ = auVar30._28_4_;
              auVar110._4_4_ = fVar272 * fVar252;
              auVar110._0_4_ = fVar250 * fVar214;
              auVar110._8_4_ = fVar306 * fVar274;
              auVar110._12_4_ = fVar234 * fVar318;
              auVar110._16_4_ = fVar164 * fVar173;
              auVar110._20_4_ = fVar197 * fVar166;
              auVar110._24_4_ = fVar374 * fVar198;
              auVar110._28_4_ = auVar181._28_4_;
              auVar32 = vsubps_avx(auVar110,auVar109);
              auVar240 = auVar32._0_16_;
              auVar190._0_4_ = auVar29._0_4_ * 0.0 + auVar32._0_4_ + auVar31._0_4_ * 0.0;
              auVar190._4_4_ = auVar29._4_4_ * 0.0 + auVar32._4_4_ + auVar31._4_4_ * 0.0;
              auVar190._8_4_ = auVar29._8_4_ * 0.0 + auVar32._8_4_ + auVar31._8_4_ * 0.0;
              auVar190._12_4_ = auVar29._12_4_ * 0.0 + auVar32._12_4_ + auVar31._12_4_ * 0.0;
              auVar190._16_4_ = auVar29._16_4_ * 0.0 + auVar32._16_4_ + auVar31._16_4_ * 0.0;
              auVar190._20_4_ = auVar29._20_4_ * 0.0 + auVar32._20_4_ + auVar31._20_4_ * 0.0;
              auVar190._24_4_ = auVar29._24_4_ * 0.0 + auVar32._24_4_ + auVar31._24_4_ * 0.0;
              auVar190._28_4_ = auVar181._28_4_ + auVar32._28_4_ + auVar30._28_4_;
              auVar27 = vrcpps_avx(auVar190);
              fVar214 = auVar27._0_4_;
              fVar237 = auVar27._4_4_;
              auVar111._4_4_ = auVar190._4_4_ * fVar237;
              auVar111._0_4_ = auVar190._0_4_ * fVar214;
              fVar246 = auVar27._8_4_;
              auVar111._8_4_ = auVar190._8_4_ * fVar246;
              fVar248 = auVar27._12_4_;
              auVar111._12_4_ = auVar190._12_4_ * fVar248;
              fVar250 = auVar27._16_4_;
              auVar111._16_4_ = auVar190._16_4_ * fVar250;
              fVar252 = auVar27._20_4_;
              auVar111._20_4_ = auVar190._20_4_ * fVar252;
              fVar256 = auVar27._24_4_;
              auVar111._24_4_ = auVar190._24_4_ * fVar256;
              auVar111._28_4_ = auVar183._28_4_;
              auVar352._8_4_ = 0x3f800000;
              auVar352._0_8_ = &DAT_3f8000003f800000;
              auVar352._12_4_ = 0x3f800000;
              auVar352._16_4_ = 0x3f800000;
              auVar352._20_4_ = 0x3f800000;
              auVar352._24_4_ = 0x3f800000;
              auVar352._28_4_ = 0x3f800000;
              auVar27 = vsubps_avx(auVar352,auVar111);
              fVar214 = auVar27._0_4_ * fVar214 + fVar214;
              fVar237 = auVar27._4_4_ * fVar237 + fVar237;
              fVar246 = auVar27._8_4_ * fVar246 + fVar246;
              fVar248 = auVar27._12_4_ * fVar248 + fVar248;
              fVar250 = auVar27._16_4_ * fVar250 + fVar250;
              fVar252 = auVar27._20_4_ * fVar252 + fVar252;
              fVar256 = auVar27._24_4_ * fVar256 + fVar256;
              auVar112._4_4_ =
                   (fVar254 * auVar29._4_4_ + auVar31._4_4_ * fVar253 + auVar32._4_4_ * fVar247) *
                   fVar237;
              auVar112._0_4_ =
                   (fVar235 * auVar29._0_4_ + auVar31._0_4_ * fVar227 + auVar32._0_4_ * fVar238) *
                   fVar214;
              auVar112._8_4_ =
                   (fVar276 * auVar29._8_4_ + auVar31._8_4_ * fVar275 + auVar32._8_4_ * fVar249) *
                   fVar246;
              auVar112._12_4_ =
                   (fVar232 * auVar29._12_4_ + auVar31._12_4_ * fVar319 + auVar32._12_4_ * fVar251)
                   * fVar248;
              auVar112._16_4_ =
                   (fVar195 * auVar29._16_4_ + auVar31._16_4_ * fVar174 + auVar32._16_4_ * fVar257)
                   * fVar250;
              auVar112._20_4_ =
                   (fVar308 * auVar29._20_4_ + auVar31._20_4_ * fVar199 + auVar32._20_4_ * fVar269)
                   * fVar252;
              auVar112._24_4_ =
                   (fVar292 * auVar29._24_4_ + auVar31._24_4_ * fVar200 + auVar32._24_4_ * fVar271)
                   * fVar256;
              auVar112._28_4_ = auVar150._28_4_ + auVar25._28_4_ + auVar26._28_4_;
              auVar224 = ZEXT3264(auVar112);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar245._4_4_ = uVar8;
              auVar245._0_4_ = uVar8;
              auVar245._8_4_ = uVar8;
              auVar245._12_4_ = uVar8;
              auVar245._16_4_ = uVar8;
              auVar245._20_4_ = uVar8;
              auVar245._24_4_ = uVar8;
              auVar245._28_4_ = uVar8;
              auVar150 = vcmpps_avx(local_260,auVar112,2);
              auVar25 = vcmpps_avx(auVar112,auVar245,2);
              auVar150 = vandps_avx(auVar150,auVar25);
              auVar26 = auVar28 & auVar150;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar26 >> 0x7f,0) == '\0') &&
                    (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar26 >> 0xbf,0) == '\0') &&
                  (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar26[0x1f]) goto LAB_0118e2d4;
              auVar150 = vandps_avx(auVar28,auVar150);
              auVar26 = vcmpps_avx(ZEXT832(0) << 0x20,auVar190,4);
              auVar27 = auVar150 & auVar26;
              auVar191._8_8_ = uStack_538;
              auVar191._0_8_ = local_540;
              auVar191._16_8_ = uStack_530;
              auVar191._24_8_ = uStack_528;
              auVar240 = vpcmpeqd_avx(auVar240,auVar240);
              auVar302 = ZEXT1664(auVar240);
              auVar364._4_4_ = fVar163;
              auVar364._0_4_ = fVar147;
              auVar364._8_4_ = fVar165;
              auVar364._12_4_ = fVar167;
              auVar364._16_4_ = fVar168;
              auVar364._20_4_ = fVar170;
              auVar364._24_4_ = fVar171;
              auVar364._28_4_ = fVar172;
              if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0x7f,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0xbf,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar27[0x1f] < '\0') {
                auVar191 = vandps_avx(auVar26,auVar150);
                auVar113._4_4_ = auVar338._4_4_ * fVar237;
                auVar113._0_4_ = auVar338._0_4_ * fVar214;
                auVar113._8_4_ = auVar338._8_4_ * fVar246;
                auVar113._12_4_ = auVar338._12_4_ * fVar248;
                auVar113._16_4_ = auVar338._16_4_ * fVar250;
                auVar113._20_4_ = auVar338._20_4_ * fVar252;
                auVar113._24_4_ = auVar338._24_4_ * fVar256;
                auVar113._28_4_ = auVar25._28_4_;
                auVar114._4_4_ = auVar159._4_4_ * fVar237;
                auVar114._0_4_ = auVar159._0_4_ * fVar214;
                auVar114._8_4_ = auVar159._8_4_ * fVar246;
                auVar114._12_4_ = auVar159._12_4_ * fVar248;
                auVar114._16_4_ = auVar159._16_4_ * fVar250;
                auVar114._20_4_ = auVar159._20_4_ * fVar252;
                auVar114._24_4_ = auVar159._24_4_ * fVar256;
                auVar114._28_4_ = auVar159._28_4_;
                auVar287._8_4_ = 0x3f800000;
                auVar287._0_8_ = &DAT_3f8000003f800000;
                auVar287._12_4_ = 0x3f800000;
                auVar287._16_4_ = 0x3f800000;
                auVar287._20_4_ = 0x3f800000;
                auVar287._24_4_ = 0x3f800000;
                auVar287._28_4_ = 0x3f800000;
                auVar150 = vsubps_avx(auVar287,auVar113);
                local_100 = vblendvps_avx(auVar150,auVar113,auVar24);
                auVar150 = vsubps_avx(auVar287,auVar114);
                _local_180 = vblendvps_avx(auVar150,auVar114,auVar24);
                auVar162 = ZEXT3264(_local_180);
                local_4e0 = auVar112;
              }
            }
            auVar346 = ZEXT3264(local_600);
            if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar191 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar191 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar191 >> 0x7f,0) != '\0') ||
                  (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar191 >> 0xbf,0) != '\0') ||
                (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar191[0x1f] < '\0') {
              auVar150 = vsubps_avx(auVar187,auVar364);
              auVar224 = ZEXT3264(local_100);
              fVar227 = auVar364._0_4_ + auVar150._0_4_ * local_100._0_4_;
              fVar235 = auVar364._4_4_ + auVar150._4_4_ * local_100._4_4_;
              fVar237 = auVar364._8_4_ + auVar150._8_4_ * local_100._8_4_;
              fVar246 = auVar364._12_4_ + auVar150._12_4_ * local_100._12_4_;
              fVar248 = auVar364._16_4_ + auVar150._16_4_ * local_100._16_4_;
              fVar250 = auVar364._20_4_ + auVar150._20_4_ * local_100._20_4_;
              fVar252 = auVar364._24_4_ + auVar150._24_4_ * local_100._24_4_;
              fVar253 = auVar364._28_4_ + auVar150._28_4_;
              fVar214 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar115._4_4_ = (fVar235 + fVar235) * fVar214;
              auVar115._0_4_ = (fVar227 + fVar227) * fVar214;
              auVar115._8_4_ = (fVar237 + fVar237) * fVar214;
              auVar115._12_4_ = (fVar246 + fVar246) * fVar214;
              auVar115._16_4_ = (fVar248 + fVar248) * fVar214;
              auVar115._20_4_ = (fVar250 + fVar250) * fVar214;
              auVar115._24_4_ = (fVar252 + fVar252) * fVar214;
              auVar115._28_4_ = fVar253 + fVar253;
              auVar150 = vcmpps_avx(local_4e0,auVar115,6);
              auVar162 = ZEXT3264(auVar150);
              auVar25 = auVar191 & auVar150;
              if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar25 >> 0x7f,0) != '\0') ||
                    (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0xbf,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar25[0x1f] < '\0') {
                local_300 = vandps_avx(auVar150,auVar191);
                auVar162 = ZEXT3264(local_300);
                local_3a0 = (float)local_180._0_4_ + (float)local_180._0_4_ + -1.0;
                fStack_39c = (float)local_180._4_4_ + (float)local_180._4_4_ + -1.0;
                fStack_398 = fStack_178 + fStack_178 + -1.0;
                fStack_394 = fStack_174 + fStack_174 + -1.0;
                fStack_390 = fStack_170 + fStack_170 + -1.0;
                fStack_38c = fStack_16c + fStack_16c + -1.0;
                fStack_388 = fStack_168 + fStack_168 + -1.0;
                fStack_384 = fStack_164 + fStack_164 + -1.0;
                local_3c0 = local_100;
                local_380 = local_4e0;
                local_35c = uVar19;
                local_340 = (float)local_800._0_4_;
                fStack_33c = (float)local_800._4_4_;
                fStack_338 = fStack_7f8;
                fStack_334 = fStack_7f4;
                local_330 = local_630;
                uStack_328 = uStack_628;
                local_320 = local_640;
                uStack_318 = uStack_638;
                pGVar21 = (context->scene->geometries).items[uVar140].ptr;
                local_180._4_4_ = fStack_39c;
                local_180._0_4_ = local_3a0;
                fStack_178 = fStack_398;
                fStack_174 = fStack_394;
                fStack_170 = fStack_390;
                fStack_16c = fStack_38c;
                fStack_168 = fStack_388;
                fStack_164 = fStack_384;
                if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar240 = vshufps_avx(ZEXT416((uint)(float)(int)local_360),
                                         ZEXT416((uint)(float)(int)local_360),0);
                  local_2e0[0] = (auVar240._0_4_ + local_100._0_4_ + 0.0) * (float)local_4c0._0_4_;
                  local_2e0[1] = (auVar240._4_4_ + local_100._4_4_ + 1.0) * (float)local_4c0._4_4_;
                  local_2e0[2] = (auVar240._8_4_ + local_100._8_4_ + 2.0) * fStack_4b8;
                  local_2e0[3] = (auVar240._12_4_ + local_100._12_4_ + 3.0) * fStack_4b4;
                  fStack_2d0 = (auVar240._0_4_ + local_100._16_4_ + 4.0) * fStack_4b0;
                  fStack_2cc = (auVar240._4_4_ + local_100._20_4_ + 5.0) * fStack_4ac;
                  fStack_2c8 = (auVar240._8_4_ + local_100._24_4_ + 6.0) * fStack_4a8;
                  fStack_2c4 = auVar240._12_4_ + local_100._28_4_ + 7.0;
                  local_2c0 = CONCAT44(fStack_39c,local_3a0);
                  uStack_2b8 = CONCAT44(fStack_394,fStack_398);
                  uStack_2b0 = CONCAT44(fStack_38c,fStack_390);
                  uStack_2a8 = CONCAT44(fStack_384,fStack_388);
                  local_2a0 = local_4e0;
                  auVar192._8_4_ = 0x7f800000;
                  auVar192._0_8_ = 0x7f8000007f800000;
                  auVar192._12_4_ = 0x7f800000;
                  auVar192._16_4_ = 0x7f800000;
                  auVar192._20_4_ = 0x7f800000;
                  auVar192._24_4_ = 0x7f800000;
                  auVar192._28_4_ = 0x7f800000;
                  auVar150 = vblendvps_avx(auVar192,local_4e0,local_300);
                  auVar25 = vshufps_avx(auVar150,auVar150,0xb1);
                  auVar25 = vminps_avx(auVar150,auVar25);
                  auVar26 = vshufpd_avx(auVar25,auVar25,5);
                  auVar25 = vminps_avx(auVar25,auVar26);
                  auVar26 = vperm2f128_avx(auVar25,auVar25,1);
                  auVar25 = vminps_avx(auVar25,auVar26);
                  auVar25 = vcmpps_avx(auVar150,auVar25,0);
                  auVar26 = local_300 & auVar25;
                  auVar150 = local_300;
                  if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar26 >> 0x7f,0) != '\0') ||
                        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0xbf,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar26[0x1f] < '\0') {
                    auVar150 = vandps_avx(auVar25,local_300);
                  }
                  uVar142 = vmovmskps_avx(auVar150);
                  local_860 = 0;
                  if (uVar142 != 0) {
                    for (; (uVar142 >> local_860 & 1) == 0; local_860 = local_860 + 1) {
                    }
                  }
                  uVar144 = (ulong)local_860;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar214 = local_2e0[uVar144];
                    auVar162 = ZEXT464((uint)fVar214);
                    uVar8 = *(undefined4 *)((long)&local_2c0 + uVar144 * 4);
                    fVar235 = 1.0 - fVar214;
                    fVar227 = fVar214 * fVar235 + fVar214 * fVar235;
                    auVar240 = ZEXT416((uint)(fVar214 * fVar214 * 3.0));
                    auVar240 = vshufps_avx(auVar240,auVar240,0);
                    auVar204 = ZEXT416((uint)((fVar227 - fVar214 * fVar214) * 3.0));
                    auVar204 = vshufps_avx(auVar204,auVar204,0);
                    auVar169 = ZEXT416((uint)((fVar235 * fVar235 - fVar227) * 3.0));
                    auVar169 = vshufps_avx(auVar169,auVar169,0);
                    auVar206 = ZEXT416((uint)(fVar235 * fVar235 * -3.0));
                    auVar206 = vshufps_avx(auVar206,auVar206,0);
                    auVar205._0_4_ =
                         fVar225 * auVar206._0_4_ +
                         (float)local_800._0_4_ * auVar169._0_4_ +
                         auVar240._0_4_ * (float)local_640._0_4_ +
                         auVar204._0_4_ * (float)local_630._0_4_;
                    auVar205._4_4_ =
                         fVar226 * auVar206._4_4_ +
                         (float)local_800._4_4_ * auVar169._4_4_ +
                         auVar240._4_4_ * (float)local_640._4_4_ +
                         auVar204._4_4_ * (float)local_630._4_4_;
                    auVar205._8_4_ =
                         fVar230 * auVar206._8_4_ +
                         fStack_7f8 * auVar169._8_4_ +
                         auVar240._8_4_ * (float)uStack_638 + auVar204._8_4_ * (float)uStack_628;
                    auVar205._12_4_ =
                         fVar233 * auVar206._12_4_ +
                         fStack_7f4 * auVar169._12_4_ +
                         auVar240._12_4_ * uStack_638._4_4_ + auVar204._12_4_ * uStack_628._4_4_;
                    auVar224 = ZEXT464(*(uint *)(local_2a0 + uVar144 * 4));
                    *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_2a0 + uVar144 * 4);
                    *(float *)(ray + k * 4 + 0xc0) = auVar205._0_4_;
                    uVar20 = vextractps_avx(auVar205,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar20;
                    uVar20 = vextractps_avx(auVar205,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar20;
                    *(float *)(ray + k * 4 + 0xf0) = fVar214;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
                    *(uint *)(ray + k * 4 + 0x110) = uVar18;
                    *(uint *)(ray + k * 4 + 0x120) = uVar140;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    auStack_790 = auVar370._16_16_;
                    _local_7a0 = _local_800;
                    auStack_750 = auVar286._16_16_;
                    _local_760 = _local_630;
                    auStack_6b0 = auVar266._16_16_;
                    _local_6c0 = _local_640;
                    _local_7c0 = *local_768;
                    auVar315 = ZEXT1664(ZEXT816(0) << 0x40);
                    _local_700 = auVar312;
                    local_580 = local_300;
                    local_350 = local_880;
                    uStack_348 = uStack_878;
                    do {
                      local_740._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      uVar144 = (ulong)local_860;
                      local_420 = local_2e0[uVar144];
                      local_410._4_4_ = *(undefined4 *)((long)&local_2c0 + uVar144 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar144 * 4)
                      ;
                      fVar227 = 1.0 - local_420;
                      fVar214 = local_420 * fVar227 + local_420 * fVar227;
                      auVar240 = ZEXT416((uint)(local_420 * local_420 * 3.0));
                      auVar240 = vshufps_avx(auVar240,auVar240,0);
                      auVar204 = ZEXT416((uint)((fVar214 - local_420 * local_420) * 3.0));
                      auVar204 = vshufps_avx(auVar204,auVar204,0);
                      auVar169 = ZEXT416((uint)((fVar227 * fVar227 - fVar214) * 3.0));
                      auVar169 = vshufps_avx(auVar169,auVar169,0);
                      local_7f0.context = context->user;
                      auVar206 = ZEXT416((uint)(fVar227 * fVar227 * -3.0));
                      auVar206 = vshufps_avx(auVar206,auVar206,0);
                      auVar207._0_4_ =
                           fVar225 * auVar206._0_4_ +
                           auVar169._0_4_ * (float)local_7a0._0_4_ +
                           auVar240._0_4_ * (float)local_6c0._0_4_ +
                           auVar204._0_4_ * (float)local_760._0_4_;
                      auVar207._4_4_ =
                           fVar226 * auVar206._4_4_ +
                           auVar169._4_4_ * (float)local_7a0._4_4_ +
                           auVar240._4_4_ * (float)local_6c0._4_4_ +
                           auVar204._4_4_ * (float)local_760._4_4_;
                      auVar207._8_4_ =
                           fVar230 * auVar206._8_4_ +
                           auVar169._8_4_ * fStack_798 +
                           auVar240._8_4_ * (float)uStack_6b8 + auVar204._8_4_ * (float)uStack_758;
                      auVar207._12_4_ =
                           fVar233 * auVar206._12_4_ +
                           auVar169._12_4_ * fStack_794 +
                           auVar240._12_4_ * uStack_6b8._4_4_ + auVar204._12_4_ * uStack_758._4_4_;
                      auVar240 = vshufps_avx(auVar207,auVar207,0);
                      local_450[0] = (RTCHitN)auVar240[0];
                      local_450[1] = (RTCHitN)auVar240[1];
                      local_450[2] = (RTCHitN)auVar240[2];
                      local_450[3] = (RTCHitN)auVar240[3];
                      local_450[4] = (RTCHitN)auVar240[4];
                      local_450[5] = (RTCHitN)auVar240[5];
                      local_450[6] = (RTCHitN)auVar240[6];
                      local_450[7] = (RTCHitN)auVar240[7];
                      local_450[8] = (RTCHitN)auVar240[8];
                      local_450[9] = (RTCHitN)auVar240[9];
                      local_450[10] = (RTCHitN)auVar240[10];
                      local_450[0xb] = (RTCHitN)auVar240[0xb];
                      local_450[0xc] = (RTCHitN)auVar240[0xc];
                      local_450[0xd] = (RTCHitN)auVar240[0xd];
                      local_450[0xe] = (RTCHitN)auVar240[0xe];
                      local_450[0xf] = (RTCHitN)auVar240[0xf];
                      local_440 = vshufps_avx(auVar207,auVar207,0x55);
                      local_430 = vshufps_avx(auVar207,auVar207,0xaa);
                      fStack_41c = local_420;
                      fStack_418 = local_420;
                      fStack_414 = local_420;
                      local_410._0_4_ = local_410._4_4_;
                      local_410._8_4_ = local_410._4_4_;
                      local_410._12_4_ = local_410._4_4_;
                      local_400 = local_1a0._0_8_;
                      uStack_3f8 = local_1a0._8_8_;
                      local_3f0 = local_190._0_8_;
                      uStack_3e8 = local_190._8_8_;
                      vcmpps_avx(auVar315._0_32_,auVar315._0_32_,0xf);
                      uStack_3dc = (local_7f0.context)->instID[0];
                      local_3e0 = uStack_3dc;
                      uStack_3d8 = uStack_3dc;
                      uStack_3d4 = uStack_3dc;
                      uStack_3d0 = (local_7f0.context)->instPrimID[0];
                      uStack_3cc = uStack_3d0;
                      uStack_3c8 = uStack_3d0;
                      uStack_3c4 = uStack_3d0;
                      local_810 = local_7c0;
                      uStack_808 = uStack_7b8;
                      local_7f0.valid = (int *)&local_810;
                      local_7f0.geometryUserPtr = pGVar21->userPtr;
                      local_7f0.hit = local_450;
                      local_7f0.N = 4;
                      local_7f0.ray = (RTCRayN *)ray;
                      if (pGVar21->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar240 = auVar302._0_16_;
                        (*pGVar21->intersectionFilterN)(&local_7f0);
                        auVar346 = ZEXT3264(local_600);
                        auVar240 = vpcmpeqd_avx(auVar240,auVar240);
                        auVar302 = ZEXT1664(auVar240);
                        auVar315 = ZEXT1664(ZEXT816(0) << 0x40);
                      }
                      auVar127._8_8_ = uStack_808;
                      auVar127._0_8_ = local_810;
                      auVar240 = auVar302._0_16_;
                      if (auVar127 == (undefined1  [16])0x0) {
                        auVar204 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar240 = auVar240 ^ auVar204;
                        auVar224 = ZEXT3264(local_4e0);
                      }
                      else {
                        p_Var22 = context->args->filter;
                        if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var22)(&local_7f0);
                          auVar346 = ZEXT3264(local_600);
                          auVar240 = vpcmpeqd_avx(auVar240,auVar240);
                          auVar302 = ZEXT1664(auVar240);
                          auVar315 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        auVar128._8_8_ = uStack_808;
                        auVar128._0_8_ = local_810;
                        auVar204 = vpcmpeqd_avx(auVar128,_DAT_01feba10);
                        auVar240 = auVar302._0_16_ ^ auVar204;
                        auVar224 = ZEXT3264(local_4e0);
                        if (auVar128 != (undefined1  [16])0x0) {
                          auVar204 = auVar302._0_16_ ^ auVar204;
                          auVar169 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])local_7f0.hit);
                          *(undefined1 (*) [16])(local_7f0.ray + 0xc0) = auVar169;
                          auVar169 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x10));
                          *(undefined1 (*) [16])(local_7f0.ray + 0xd0) = auVar169;
                          auVar169 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x20));
                          *(undefined1 (*) [16])(local_7f0.ray + 0xe0) = auVar169;
                          auVar169 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x30));
                          *(undefined1 (*) [16])(local_7f0.ray + 0xf0) = auVar169;
                          auVar169 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x40));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x100) = auVar169;
                          auVar169 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x50));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x110) = auVar169;
                          auVar169 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x60));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x120) = auVar169;
                          auVar169 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x70));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x130) = auVar169;
                          auVar204 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x80));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x140) = auVar204;
                        }
                      }
                      auVar178._8_8_ = 0x100000001;
                      auVar178._0_8_ = 0x100000001;
                      if ((auVar178 & auVar240) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_740._0_4_;
                      }
                      *(undefined4 *)(local_580 + (ulong)local_860 * 4) = 0;
                      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar160._4_4_ = uVar8;
                      auVar160._0_4_ = uVar8;
                      auVar160._8_4_ = uVar8;
                      auVar160._12_4_ = uVar8;
                      auVar160._16_4_ = uVar8;
                      auVar160._20_4_ = uVar8;
                      auVar160._24_4_ = uVar8;
                      auVar160._28_4_ = uVar8;
                      auVar312 = vcmpps_avx(auVar224._0_32_,auVar160,2);
                      auVar150 = vandps_avx(auVar312,local_580);
                      auVar162 = ZEXT3264(auVar150);
                      local_580 = local_580 & auVar312;
                      bVar122 = (local_580 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar123 = (local_580 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar121 = (local_580 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar120 = SUB321(local_580 >> 0x7f,0) != '\0';
                      bVar119 = (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar118 = SUB321(local_580 >> 0xbf,0) != '\0';
                      bVar117 = (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar116 = local_580[0x1f] < '\0';
                      if (((((((bVar122 || bVar123) || bVar121) || bVar120) || bVar119) || bVar118)
                          || bVar117) || bVar116) {
                        auVar193._8_4_ = 0x7f800000;
                        auVar193._0_8_ = 0x7f8000007f800000;
                        auVar193._12_4_ = 0x7f800000;
                        auVar193._16_4_ = 0x7f800000;
                        auVar193._20_4_ = 0x7f800000;
                        auVar193._24_4_ = 0x7f800000;
                        auVar193._28_4_ = 0x7f800000;
                        auVar312 = vblendvps_avx(auVar193,auVar224._0_32_,auVar150);
                        auVar25 = vshufps_avx(auVar312,auVar312,0xb1);
                        auVar25 = vminps_avx(auVar312,auVar25);
                        auVar26 = vshufpd_avx(auVar25,auVar25,5);
                        auVar25 = vminps_avx(auVar25,auVar26);
                        auVar26 = vperm2f128_avx(auVar25,auVar25,1);
                        auVar224 = ZEXT3264(auVar26);
                        auVar25 = vminps_avx(auVar25,auVar26);
                        auVar312 = vcmpps_avx(auVar312,auVar25,0);
                        auVar25 = auVar150 & auVar312;
                        if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar25 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar25 >> 0x7f,0) != '\0') ||
                              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar25 >> 0xbf,0) != '\0') ||
                            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar25[0x1f] < '\0') {
                          auVar312 = vandps_avx(auVar312,auVar150);
                          auVar162 = ZEXT3264(auVar312);
                        }
                        uVar142 = vmovmskps_avx(auVar162._0_32_);
                        local_860 = 0;
                        if (uVar142 != 0) {
                          for (; (uVar142 >> local_860 & 1) == 0; local_860 = local_860 + 1) {
                          }
                        }
                      }
                      local_580 = auVar150;
                    } while (((((((bVar122 || bVar123) || bVar121) || bVar120) || bVar119) ||
                              bVar118) || bVar117) || bVar116);
                  }
                }
              }
            }
          }
          lVar145 = lVar145 + 8;
          auVar302 = ZEXT3264(local_660);
          auVar315 = ZEXT3264(local_680);
          fVar368 = (float)local_720._0_4_;
          fVar372 = (float)local_720._4_4_;
          fVar373 = fStack_718;
          fVar374 = fStack_714;
          fVar237 = fStack_710;
          fVar246 = fStack_70c;
          fVar250 = fStack_708;
          fVar252 = fStack_704;
        } while ((int)lVar145 < (int)uVar19);
      }
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar156._4_4_ = uVar8;
      auVar156._0_4_ = uVar8;
      auVar156._8_4_ = uVar8;
      auVar156._12_4_ = uVar8;
      auVar156._16_4_ = uVar8;
      auVar156._20_4_ = uVar8;
      auVar156._24_4_ = uVar8;
      auVar156._28_4_ = uVar8;
      auVar150 = vcmpps_avx(local_80,auVar156,2);
      uVar140 = vmovmskps_avx(auVar150);
      uVar140 = (uint)uVar146 & uVar140;
    } while (uVar140 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }